

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer pMVar9;
  Mat *this_00;
  _func_int *p_Var10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  void *pvVar79;
  int iVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  undefined1 (*pauVar84) [32];
  undefined1 (*pauVar85) [16];
  __m256 *pafVar86;
  undefined1 (*pauVar87) [32];
  undefined1 (*pauVar88) [16];
  undefined1 (*pauVar89) [32];
  undefined1 (*pauVar90) [16];
  void *pvVar91;
  float *pfVar92;
  float *pfVar93;
  int iVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  void *pvVar98;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  ulong uVar102;
  undefined8 *puVar103;
  __m256 *pafVar104;
  __m256 *pafVar105;
  size_t sVar106;
  int iVar107;
  long lVar108;
  bool bVar109;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined8 uVar271;
  undefined1 auVar195 [32];
  undefined8 uVar268;
  undefined1 auVar110 [16];
  undefined8 uVar269;
  undefined8 uVar272;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar121 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar167 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar183 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  __m256 afVar252;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar270 [56];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar371 [64];
  undefined1 auVar372 [64];
  undefined1 auVar373 [64];
  undefined1 auVar374 [64];
  undefined1 auVar375 [64];
  undefined1 auVar376 [64];
  undefined1 auVar377 [64];
  undefined1 auVar378 [64];
  undefined1 auVar379 [64];
  undefined1 auVar380 [64];
  undefined1 auVar381 [64];
  undefined1 auVar382 [64];
  undefined1 auVar383 [64];
  undefined1 auVar384 [64];
  undefined1 auVar385 [64];
  undefined1 auVar386 [64];
  undefined1 auVar387 [64];
  undefined1 auVar388 [64];
  undefined1 auVar389 [64];
  undefined1 auVar390 [64];
  undefined1 auVar391 [64];
  undefined1 auVar392 [64];
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  float fVar395;
  float fVar424;
  float fVar425;
  float fVar426;
  undefined1 in_ZMM3 [64];
  undefined1 auVar396 [64];
  undefined1 auVar397 [64];
  undefined1 auVar398 [64];
  undefined1 auVar399 [64];
  undefined1 auVar400 [64];
  undefined1 auVar401 [64];
  undefined1 auVar402 [64];
  undefined1 auVar403 [64];
  undefined1 auVar404 [64];
  undefined1 auVar405 [64];
  undefined1 auVar406 [64];
  undefined1 auVar407 [64];
  undefined1 auVar408 [64];
  undefined1 auVar409 [64];
  undefined1 auVar410 [64];
  undefined1 auVar411 [64];
  undefined1 auVar412 [64];
  undefined1 auVar413 [64];
  float fVar427;
  undefined1 auVar414 [64];
  undefined1 auVar415 [64];
  undefined1 auVar416 [64];
  undefined1 auVar417 [64];
  undefined1 auVar418 [64];
  undefined1 auVar419 [64];
  undefined1 auVar420 [64];
  undefined1 auVar421 [64];
  undefined1 auVar422 [64];
  undefined1 auVar423 [64];
  __m128 afVar428;
  binary_op_pow_pack8 op;
  Mat m;
  __m256 _p;
  __m256 *local_158;
  ulong local_150;
  binary_op_pow_pack8 local_139;
  ulong local_138;
  void *local_130;
  ulong local_128;
  Mat *local_120;
  int local_114;
  size_t local_110;
  int local_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  undefined8 uStack_f0;
  float fStack_e8;
  float fStack_e4;
  Allocator *local_e0;
  uint local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  size_t local_c0;
  pointer local_a0;
  ulong local_98;
  size_t local_90;
  bool local_81;
  __m256 local_80;
  size_t local_60;
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = pMVar9 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar80 = pMVar9->elempack;
  uVar101 = pMVar9[1].elempack;
  uVar4 = local_128._4_4_;
  local_120 = this_00;
  local_114 = iVar80;
  local_a0 = pMVar9;
  if (uVar101 == 8 || iVar80 == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3])) {
    case 0:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  pfVar92 = (float *)((long)pvVar98 + lVar95);
                  fVar395 = pfVar92[1];
                  fVar424 = pfVar92[2];
                  fVar425 = pfVar92[3];
                  fVar426 = pfVar92[4];
                  fVar427 = pfVar92[5];
                  fVar15 = pfVar92[6];
                  fVar16 = pfVar92[7];
                  pfVar93 = (float *)((long)pvVar91 + lVar95);
                  fVar72 = pfVar93[1];
                  fVar73 = pfVar93[2];
                  fVar74 = pfVar93[3];
                  fVar75 = pfVar93[4];
                  fVar76 = pfVar93[5];
                  fVar77 = pfVar93[6];
                  fVar78 = pfVar93[7];
                  pfVar2 = (float *)((long)pvVar12 + lVar95);
                  *pfVar2 = *pfVar92 + *pfVar93;
                  pfVar2[1] = fVar395 + fVar72;
                  pfVar2[2] = fVar424 + fVar73;
                  pfVar2[3] = fVar425 + fVar74;
                  pfVar2[4] = fVar426 + fVar75;
                  pfVar2[5] = fVar427 + fVar76;
                  pfVar2[6] = fVar15 + fVar77;
                  pfVar2[7] = fVar16 + fVar78;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              fVar395 = *pMVar1->data;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                fVar427 = pfVar92[4];
                fVar15 = pfVar92[5];
                fVar16 = pfVar92[6];
                fVar72 = pfVar92[7];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 + *pfVar92;
                pfVar93[1] = fVar395 + fVar424;
                pfVar93[2] = fVar395 + fVar425;
                pfVar93[3] = fVar395 + fVar426;
                pfVar93[4] = fVar395 + fVar427;
                pfVar93[5] = fVar395 + fVar15;
                pfVar93[6] = fVar395 + fVar16;
                pfVar93[7] = fVar395 + fVar72;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pfVar92 = (float *)pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    uVar99 = uVar100;
                    do {
                      auVar358._0_4_ = auVar225._0_4_ + *pfVar92;
                      auVar358._4_4_ = auVar225._4_4_ + pfVar92[1];
                      auVar358._8_4_ = auVar225._8_4_ + pfVar92[2];
                      auVar358._12_4_ = auVar225._12_4_ + pfVar92[3];
                      auVar358._16_4_ = auVar225._16_4_ + pfVar92[4];
                      auVar358._20_4_ = auVar225._20_4_ + pfVar92[5];
                      auVar358._24_4_ = auVar225._24_4_ + pfVar92[6];
                      auVar358._28_4_ = auVar225._28_4_ + pfVar92[7];
                      *pauVar84 = auVar358;
                      pfVar92 = pfVar92 + 8;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar353._0_4_ = auVar225._0_4_ + *pfVar92;
                  auVar353._4_4_ = auVar225._4_4_ + pfVar92[1];
                  auVar353._8_4_ = auVar225._8_4_ + pfVar92[2];
                  auVar353._12_4_ = auVar225._12_4_ + pfVar92[3];
                  auVar353._16_4_ = auVar225._16_4_ + pfVar92[4];
                  auVar353._20_4_ = auVar225._20_4_ + pfVar92[5];
                  auVar353._24_4_ = auVar225._24_4_ + pfVar92[6];
                  auVar353._28_4_ = auVar225._28_4_ + pfVar92[7];
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar353;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                fVar427 = pfVar92[4];
                fVar15 = pfVar92[5];
                fVar16 = pfVar92[6];
                fVar72 = pfVar92[7];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 + *pfVar92;
                pfVar93[1] = fVar395 + fVar424;
                pfVar93[2] = fVar395 + fVar425;
                pfVar93[3] = fVar395 + fVar426;
                pfVar93[4] = fVar395 + fVar427;
                pfVar93[5] = fVar395 + fVar15;
                pfVar93[6] = fVar395 + fVar16;
                pfVar93[7] = fVar395 + fVar72;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                fVar427 = pfVar92[4];
                fVar15 = pfVar92[5];
                fVar16 = pfVar92[6];
                fVar72 = pfVar92[7];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 + *pfVar92;
                pfVar93[1] = fVar395 + fVar424;
                pfVar93[2] = fVar395 + fVar425;
                pfVar93[3] = fVar395 + fVar426;
                pfVar93[4] = fVar395 + fVar427;
                pfVar93[5] = fVar395 + fVar15;
                pfVar93[6] = fVar395 + fVar16;
                pfVar93[7] = fVar395 + fVar72;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar395 = *pMVar9->data;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar351._0_4_ = fVar395 + *pfVar92;
                auVar351._4_4_ = fVar395 + pfVar92[1];
                auVar351._8_4_ = fVar395 + pfVar92[2];
                auVar351._12_4_ = fVar395 + pfVar92[3];
                auVar351._16_4_ = fVar395 + pfVar92[4];
                auVar351._20_4_ = fVar395 + pfVar92[5];
                auVar351._24_4_ = fVar395 + pfVar92[6];
                auVar351._28_4_ = fVar395 + pfVar92[7];
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar351;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar89 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar89;
                      uVar99 = uVar100;
                      do {
                        auVar349._0_4_ = auVar225._0_4_ + *pfVar92;
                        auVar349._4_4_ = auVar225._4_4_ + pfVar92[1];
                        auVar349._8_4_ = auVar225._8_4_ + pfVar92[2];
                        auVar349._12_4_ = auVar225._12_4_ + pfVar92[3];
                        auVar349._16_4_ = auVar225._16_4_ + pfVar92[4];
                        auVar349._20_4_ = auVar225._20_4_ + pfVar92[5];
                        auVar349._24_4_ = auVar225._24_4_ + pfVar92[6];
                        auVar349._28_4_ = auVar225._28_4_ + pfVar92[7];
                        *pauVar84 = auVar349;
                        pfVar92 = pfVar92 + 8;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar89 = pauVar89 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar98 + lVar95);
              fVar395 = pfVar92[1];
              fVar424 = pfVar92[2];
              fVar425 = pfVar92[3];
              fVar426 = pfVar92[4];
              fVar427 = pfVar92[5];
              fVar15 = pfVar92[6];
              fVar16 = pfVar92[7];
              pfVar93 = (float *)((long)pvVar91 + lVar95);
              fVar72 = pfVar93[1];
              fVar73 = pfVar93[2];
              fVar74 = pfVar93[3];
              fVar75 = pfVar93[4];
              fVar76 = pfVar93[5];
              fVar77 = pfVar93[6];
              fVar78 = pfVar93[7];
              pfVar2 = (float *)((long)pvVar12 + lVar95);
              *pfVar2 = *pfVar92 + *pfVar93;
              pfVar2[1] = fVar395 + fVar72;
              pfVar2[2] = fVar424 + fVar73;
              pfVar2[3] = fVar425 + fVar74;
              pfVar2[4] = fVar426 + fVar75;
              pfVar2[5] = fVar427 + fVar76;
              pfVar2[6] = fVar15 + fVar77;
              pfVar2[7] = fVar16 + fVar78;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar92 = (float *)pMVar9->data;
              pauVar89 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar81 = uVar82;
                  do {
                    auVar369._0_4_ = auVar225._0_4_ + *pfVar92;
                    auVar369._4_4_ = auVar225._4_4_ + pfVar92[1];
                    auVar369._8_4_ = auVar225._8_4_ + pfVar92[2];
                    auVar369._12_4_ = auVar225._12_4_ + pfVar92[3];
                    auVar369._16_4_ = auVar225._16_4_ + pfVar92[4];
                    auVar369._20_4_ = auVar225._20_4_ + pfVar92[5];
                    auVar369._24_4_ = auVar225._24_4_ + pfVar92[6];
                    auVar369._28_4_ = auVar225._28_4_ + pfVar92[7];
                    *pauVar84 = auVar369;
                    pfVar92 = pfVar92 + 8;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar395 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              fVar424 = pfVar92[1];
              fVar425 = pfVar92[2];
              fVar426 = pfVar92[3];
              fVar427 = pfVar92[4];
              fVar15 = pfVar92[5];
              fVar16 = pfVar92[6];
              fVar72 = pfVar92[7];
              pfVar93 = (float *)((long)*pauVar84 + lVar95);
              *pfVar93 = fVar395 + *pfVar92;
              pfVar93[1] = fVar395 + fVar424;
              pfVar93[2] = fVar395 + fVar425;
              pfVar93[3] = fVar395 + fVar426;
              pfVar93[4] = fVar395 + fVar427;
              pfVar93[5] = fVar395 + fVar15;
              pfVar93[6] = fVar395 + fVar16;
              pfVar93[7] = fVar395 + fVar72;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                    auVar365._0_4_ = auVar225._0_4_ + *pfVar92;
                    auVar365._4_4_ = auVar225._4_4_ + pfVar92[1];
                    auVar365._8_4_ = auVar225._8_4_ + pfVar92[2];
                    auVar365._12_4_ = auVar225._12_4_ + pfVar92[3];
                    auVar365._16_4_ = auVar225._16_4_ + pfVar92[4];
                    auVar365._20_4_ = auVar225._20_4_ + pfVar92[5];
                    auVar365._24_4_ = auVar225._24_4_ + pfVar92[6];
                    auVar365._28_4_ = auVar225._28_4_ + pfVar92[7];
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar365;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar395 = *pMVar1->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar361._0_4_ = fVar395 + *pfVar92;
                  auVar361._4_4_ = fVar395 + pfVar92[1];
                  auVar361._8_4_ = fVar395 + pfVar92[2];
                  auVar361._12_4_ = fVar395 + pfVar92[3];
                  auVar361._16_4_ = fVar395 + pfVar92[4];
                  auVar361._20_4_ = fVar395 + pfVar92[5];
                  auVar361._24_4_ = fVar395 + pfVar92[6];
                  auVar361._28_4_ = fVar395 + pfVar92[7];
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar361;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  do {
                    auVar354._0_4_ = auVar225._0_4_ + *pfVar92;
                    auVar354._4_4_ = auVar225._4_4_ + pfVar92[1];
                    auVar354._8_4_ = auVar225._8_4_ + pfVar92[2];
                    auVar354._12_4_ = auVar225._12_4_ + pfVar92[3];
                    auVar354._16_4_ = auVar225._16_4_ + pfVar92[4];
                    auVar354._20_4_ = auVar225._20_4_ + pfVar92[5];
                    auVar354._24_4_ = auVar225._24_4_ + pfVar92[6];
                    auVar354._28_4_ = auVar225._28_4_ + pfVar92[7];
                    *pauVar84 = auVar354;
                    pfVar92 = pfVar92 + 8;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar346._0_4_ = auVar225._0_4_ + *pfVar92;
                  auVar346._4_4_ = auVar225._4_4_ + pfVar92[1];
                  auVar346._8_4_ = auVar225._8_4_ + pfVar92[2];
                  auVar346._12_4_ = auVar225._12_4_ + pfVar92[3];
                  auVar346._16_4_ = auVar225._16_4_ + pfVar92[4];
                  auVar346._20_4_ = auVar225._20_4_ + pfVar92[5];
                  auVar346._24_4_ = auVar225._24_4_ + pfVar92[6];
                  auVar346._28_4_ = auVar225._28_4_ + pfVar92[7];
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar346;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    fVar395 = *(float *)((long)pvVar91 + lVar95);
                    pfVar92 = (float *)((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                    auVar206._0_4_ = fVar395 + *pfVar92;
                    auVar206._4_4_ = fVar395 + pfVar92[1];
                    auVar206._8_4_ = fVar395 + pfVar92[2];
                    auVar206._12_4_ = fVar395 + pfVar92[3];
                    auVar206._16_4_ = fVar395 + pfVar92[4];
                    auVar206._20_4_ = fVar395 + pfVar92[5];
                    auVar206._24_4_ = fVar395 + pfVar92[6];
                    auVar206._28_4_ = fVar395 + pfVar92[7];
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar206;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      fVar395 = *(float *)((long)pvVar91 + lVar95);
                      pfVar92 = (float *)((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                      auVar245._0_4_ = fVar395 + *pfVar92;
                      auVar245._4_4_ = fVar395 + pfVar92[1];
                      auVar245._8_4_ = fVar395 + pfVar92[2];
                      auVar245._12_4_ = fVar395 + pfVar92[3];
                      auVar245._16_4_ = fVar395 + pfVar92[4];
                      auVar245._20_4_ = fVar395 + pfVar92[5];
                      auVar245._24_4_ = fVar395 + pfVar92[6];
                      auVar245._28_4_ = fVar395 + pfVar92[7];
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar245;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00260dee:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar359._0_4_ = auVar225._0_4_ + *pfVar92;
                          auVar359._4_4_ = auVar225._4_4_ + pfVar92[1];
                          auVar359._8_4_ = auVar225._8_4_ + pfVar92[2];
                          auVar359._12_4_ = auVar225._12_4_ + pfVar92[3];
                          auVar359._16_4_ = auVar225._16_4_ + pfVar92[4];
                          auVar359._20_4_ = auVar225._20_4_ + pfVar92[5];
                          auVar359._24_4_ = auVar225._24_4_ + pfVar92[6];
                          auVar359._28_4_ = auVar225._28_4_ + pfVar92[7];
                          *pauVar84 = auVar359;
                          pfVar92 = pfVar92 + 8;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          pfVar93 = (float *)((long)pvVar98 + lVar95);
                          auVar238._0_4_ = *pfVar92 + *pfVar93;
                          auVar238._4_4_ = pfVar92[1] + pfVar93[1];
                          auVar238._8_4_ = pfVar92[2] + pfVar93[2];
                          auVar238._12_4_ = pfVar92[3] + pfVar93[3];
                          auVar238._16_4_ = pfVar92[4] + pfVar93[4];
                          auVar238._20_4_ = pfVar92[5] + pfVar93[5];
                          auVar238._24_4_ = pfVar92[6] + pfVar93[6];
                          auVar238._28_4_ = pfVar92[7] + pfVar93[7];
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar238;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar368._0_4_ = auVar225._0_4_ + *pfVar92;
                          auVar368._4_4_ = auVar225._4_4_ + pfVar92[1];
                          auVar368._8_4_ = auVar225._8_4_ + pfVar92[2];
                          auVar368._12_4_ = auVar225._12_4_ + pfVar92[3];
                          auVar368._16_4_ = auVar225._16_4_ + pfVar92[4];
                          auVar368._20_4_ = auVar225._20_4_ + pfVar92[5];
                          auVar368._24_4_ = auVar225._24_4_ + pfVar92[6];
                          auVar368._28_4_ = auVar225._28_4_ + pfVar92[7];
                          *pauVar84 = auVar368;
                          pfVar92 = pfVar92 + 8;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar91 + lVar95);
                          pfVar93 = (float *)((long)pvVar12 +
                                             lVar95 + (long)local_130 * local_138 * (long)local_158)
                          ;
                          auVar251._0_4_ = *pfVar92 + *pfVar93;
                          auVar251._4_4_ = pfVar92[1] + pfVar93[1];
                          auVar251._8_4_ = pfVar92[2] + pfVar93[2];
                          auVar251._12_4_ = pfVar92[3] + pfVar93[3];
                          auVar251._16_4_ = pfVar92[4] + pfVar93[4];
                          auVar251._20_4_ = pfVar92[5] + pfVar93[5];
                          auVar251._24_4_ = pfVar92[6] + pfVar93[6];
                          auVar251._28_4_ = pfVar92[7] + pfVar93[7];
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar251;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    pfVar92 = (float *)((long)pvVar91 +
                                       lVar95 + local_110 * local_128 * (long)local_158);
                    pfVar93 = (float *)((long)pvVar12 +
                                       lVar95 + sVar106 * (long)local_130 * (long)local_158);
                    auVar255._0_4_ = *pfVar92 + *pfVar93;
                    auVar255._4_4_ = pfVar92[1] + pfVar93[1];
                    auVar255._8_4_ = pfVar92[2] + pfVar93[2];
                    auVar255._12_4_ = pfVar92[3] + pfVar93[3];
                    auVar255._16_4_ = pfVar92[4] + pfVar93[4];
                    auVar255._20_4_ = pfVar92[5] + pfVar93[5];
                    auVar255._24_4_ = pfVar92[6] + pfVar93[6];
                    auVar255._28_4_ = pfVar92[7] + pfVar93[7];
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar255;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00260dee;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                auVar364._0_4_ = auVar225._0_4_ + *pfVar92;
                auVar364._4_4_ = auVar225._4_4_ + pfVar92[1];
                auVar364._8_4_ = auVar225._8_4_ + pfVar92[2];
                auVar364._12_4_ = auVar225._12_4_ + pfVar92[3];
                auVar364._16_4_ = auVar225._16_4_ + pfVar92[4];
                auVar364._20_4_ = auVar225._20_4_ + pfVar92[5];
                auVar364._24_4_ = auVar225._24_4_ + pfVar92[6];
                auVar364._28_4_ = auVar225._28_4_ + pfVar92[7];
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar364
                ;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                        *(undefined1 (*) [32])((long)pvVar98 + lVar95));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar219._4_4_ = uVar4;
              auVar219._0_4_ = uVar4;
              auVar219._8_4_ = uVar4;
              auVar219._12_4_ = uVar4;
              auVar219._16_4_ = uVar4;
              auVar219._20_4_ = uVar4;
              auVar219._24_4_ = uVar4;
              auVar219._28_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),auVar219);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    uVar99 = uVar100;
                    do {
                      auVar222 = vsubps_avx(auVar225,*pauVar87);
                      *pauVar84 = auVar222;
                      pauVar87 = pauVar87 + 1;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar222 = vsubps_avx(auVar225,*(undefined1 (*) [32])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar218._4_4_ = uVar4;
              auVar218._0_4_ = uVar4;
              auVar218._8_4_ = uVar4;
              auVar218._12_4_ = uVar4;
              auVar218._16_4_ = uVar4;
              auVar218._20_4_ = uVar4;
              auVar218._24_4_ = uVar4;
              auVar218._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vsubps_avx(auVar218,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar214._4_4_ = uVar4;
              auVar214._0_4_ = uVar4;
              auVar214._8_4_ = uVar4;
              auVar214._12_4_ = uVar4;
              auVar214._16_4_ = uVar4;
              auVar214._20_4_ = uVar4;
              auVar214._24_4_ = uVar4;
              auVar214._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vsubps_avx(auVar214,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar199._4_4_ = uVar4;
          auVar199._0_4_ = uVar4;
          auVar199._8_4_ = uVar4;
          auVar199._12_4_ = uVar4;
          auVar199._16_4_ = uVar4;
          auVar199._20_4_ = uVar4;
          auVar199._24_4_ = uVar4;
          auVar199._28_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar225 = vsubps_avx(auVar199,*(undefined1 (*) [32])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar225;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar89 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar87 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar87;
                      uVar99 = uVar100;
                      do {
                        auVar222 = vsubps_avx(auVar225,*pauVar89);
                        *pauVar84 = auVar222;
                        pauVar89 = pauVar89 + 1;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                    *(undefined1 (*) [32])((long)pvVar98 + lVar95));
              *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar89 = (undefined1 (*) [32])pMVar9->data;
              pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar87;
                  uVar81 = uVar82;
                  do {
                    auVar222 = vsubps_avx(*pauVar89,auVar225);
                    *pauVar84 = auVar222;
                    pauVar89 = pauVar89 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar229._4_4_ = uVar4;
            auVar229._0_4_ = uVar4;
            auVar229._8_4_ = uVar4;
            auVar229._12_4_ = uVar4;
            auVar229._16_4_ = uVar4;
            auVar229._20_4_ = uVar4;
            auVar229._24_4_ = uVar4;
            auVar229._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar12 + lVar95),auVar229);
              *(undefined1 (*) [32])((long)*pauVar84 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar222 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),
                                          auVar225);
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar222;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar232._4_4_ = uVar4;
            auVar232._0_4_ = uVar4;
            auVar232._8_4_ = uVar4;
            auVar232._12_4_ = uVar4;
            auVar232._16_4_ = uVar4;
            auVar232._20_4_ = uVar4;
            auVar232._24_4_ = uVar4;
            auVar232._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),
                                        auVar232);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar225;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar87 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  do {
                    auVar222 = vsubps_avx(*pauVar87,auVar225);
                    *pauVar84 = auVar222;
                    pauVar87 = pauVar87 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar222 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82),
                                        auVar225);
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar356._4_4_ = uVar4;
                    auVar356._0_4_ = uVar4;
                    auVar356._8_4_ = uVar4;
                    auVar356._12_4_ = uVar4;
                    auVar356._16_4_ = uVar4;
                    auVar356._20_4_ = uVar4;
                    auVar356._24_4_ = uVar4;
                    auVar356._28_4_ = uVar4;
                    auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82),
                                          auVar356);
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar225;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar246._4_4_ = uVar4;
                      auVar246._0_4_ = uVar4;
                      auVar246._8_4_ = uVar4;
                      auVar246._12_4_ = uVar4;
                      auVar246._16_4_ = uVar4;
                      auVar246._20_4_ = uVar4;
                      auVar246._24_4_ = uVar4;
                      auVar246._28_4_ = uVar4;
                      auVar225 = vsubps_avx(auVar246,*(undefined1 (*) [32])
                                                      ((long)pvVar12 +
                                                      lVar95 * 8 + sVar106 * sVar11 * uVar82));
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar225;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00260f38:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar222 = vsubps_avx(*pauVar89,auVar225);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar98 + lVar95),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ));
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar222 = vsubps_avx(auVar225,*pauVar89);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar95 + (long)local_130 * local_138 *
                                                          (long)local_158),
                                                *(undefined1 (*) [32])((long)pvVar91 + lVar95));
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * (long)local_130 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar91 +
                                           lVar95 + local_110 * local_128 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar225;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00260f38;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar222 = vsubps_avx(auVar225,*(undefined1 (*) [32])
                                                ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82)
                                     );
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar222
                ;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  pfVar92 = (float *)((long)pvVar98 + lVar95);
                  fVar395 = pfVar92[1];
                  fVar424 = pfVar92[2];
                  fVar425 = pfVar92[3];
                  fVar426 = pfVar92[4];
                  fVar427 = pfVar92[5];
                  fVar15 = pfVar92[6];
                  fVar16 = pfVar92[7];
                  pfVar93 = (float *)((long)pvVar91 + lVar95);
                  fVar72 = pfVar93[1];
                  fVar73 = pfVar93[2];
                  fVar74 = pfVar93[3];
                  fVar75 = pfVar93[4];
                  fVar76 = pfVar93[5];
                  fVar77 = pfVar93[6];
                  pfVar2 = (float *)((long)pvVar12 + lVar95);
                  *pfVar2 = *pfVar92 * *pfVar93;
                  pfVar2[1] = fVar395 * fVar72;
                  pfVar2[2] = fVar424 * fVar73;
                  pfVar2[3] = fVar425 * fVar74;
                  pfVar2[4] = fVar426 * fVar75;
                  pfVar2[5] = fVar427 * fVar76;
                  pfVar2[6] = fVar15 * fVar77;
                  pfVar2[7] = fVar16;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              fVar395 = *pMVar1->data;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                auVar380._0_4_ = fVar395 * *pfVar92;
                auVar380._4_4_ = fVar395 * pfVar92[1];
                auVar380._8_4_ = fVar395 * pfVar92[2];
                auVar380._12_4_ = fVar395 * pfVar92[3];
                auVar380._16_4_ = fVar395 * pfVar92[4];
                auVar380._20_4_ = fVar395 * pfVar92[5];
                auVar380._28_36_ = in_ZMM1._28_36_;
                auVar380._24_4_ = fVar395 * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar380._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar380._0_32_;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pfVar92 = (float *)pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    uVar99 = uVar100;
                    do {
                      auVar378._0_4_ = auVar225._0_4_ * *pfVar92;
                      auVar378._4_4_ = auVar225._4_4_ * pfVar92[1];
                      auVar378._8_4_ = auVar225._8_4_ * pfVar92[2];
                      auVar378._12_4_ = auVar225._12_4_ * pfVar92[3];
                      auVar378._16_4_ = auVar225._16_4_ * pfVar92[4];
                      auVar378._20_4_ = auVar225._20_4_ * pfVar92[5];
                      auVar378._28_36_ = in_ZMM1._28_36_;
                      auVar378._24_4_ = auVar225._24_4_ * pfVar92[6];
                      in_ZMM1 = ZEXT3264(auVar378._0_32_);
                      *pauVar84 = auVar378._0_32_;
                      pfVar92 = pfVar92 + 8;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar375._0_4_ = auVar225._0_4_ * *pfVar92;
                  auVar375._4_4_ = auVar225._4_4_ * pfVar92[1];
                  auVar375._8_4_ = auVar225._8_4_ * pfVar92[2];
                  auVar375._12_4_ = auVar225._12_4_ * pfVar92[3];
                  auVar375._16_4_ = auVar225._16_4_ * pfVar92[4];
                  auVar375._20_4_ = auVar225._20_4_ * pfVar92[5];
                  auVar375._28_36_ = in_ZMM1._28_36_;
                  auVar375._24_4_ = auVar225._24_4_ * pfVar92[6];
                  in_ZMM1 = ZEXT3264(auVar375._0_32_);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar375._0_32_;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                auVar379._0_4_ = fVar395 * *pfVar92;
                auVar379._4_4_ = fVar395 * pfVar92[1];
                auVar379._8_4_ = fVar395 * pfVar92[2];
                auVar379._12_4_ = fVar395 * pfVar92[3];
                auVar379._16_4_ = fVar395 * pfVar92[4];
                auVar379._20_4_ = fVar395 * pfVar92[5];
                auVar379._28_36_ = in_ZMM1._28_36_;
                auVar379._24_4_ = fVar395 * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar379._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar379._0_32_;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                auVar377._0_4_ = fVar395 * *pfVar92;
                auVar377._4_4_ = fVar395 * pfVar92[1];
                auVar377._8_4_ = fVar395 * pfVar92[2];
                auVar377._12_4_ = fVar395 * pfVar92[3];
                auVar377._16_4_ = fVar395 * pfVar92[4];
                auVar377._20_4_ = fVar395 * pfVar92[5];
                auVar377._28_36_ = in_ZMM1._28_36_;
                auVar377._24_4_ = fVar395 * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar377._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar377._0_32_;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar395 = *pMVar9->data;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar373._0_4_ = fVar395 * *pfVar92;
                auVar373._4_4_ = fVar395 * pfVar92[1];
                auVar373._8_4_ = fVar395 * pfVar92[2];
                auVar373._12_4_ = fVar395 * pfVar92[3];
                auVar373._16_4_ = fVar395 * pfVar92[4];
                auVar373._20_4_ = fVar395 * pfVar92[5];
                auVar373._28_36_ = in_ZMM1._28_36_;
                auVar373._24_4_ = fVar395 * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar373._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar373._0_32_;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar89 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar89;
                      uVar99 = uVar100;
                      do {
                        auVar372._0_4_ = auVar225._0_4_ * *pfVar92;
                        auVar372._4_4_ = auVar225._4_4_ * pfVar92[1];
                        auVar372._8_4_ = auVar225._8_4_ * pfVar92[2];
                        auVar372._12_4_ = auVar225._12_4_ * pfVar92[3];
                        auVar372._16_4_ = auVar225._16_4_ * pfVar92[4];
                        auVar372._20_4_ = auVar225._20_4_ * pfVar92[5];
                        auVar372._28_36_ = in_ZMM1._28_36_;
                        auVar372._24_4_ = auVar225._24_4_ * pfVar92[6];
                        in_ZMM1 = ZEXT3264(auVar372._0_32_);
                        *pauVar84 = auVar372._0_32_;
                        pfVar92 = pfVar92 + 8;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar89 = pauVar89 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar98 + lVar95);
              fVar395 = pfVar92[1];
              fVar424 = pfVar92[2];
              fVar425 = pfVar92[3];
              fVar426 = pfVar92[4];
              fVar427 = pfVar92[5];
              fVar15 = pfVar92[6];
              fVar16 = pfVar92[7];
              pfVar93 = (float *)((long)pvVar91 + lVar95);
              fVar72 = pfVar93[1];
              fVar73 = pfVar93[2];
              fVar74 = pfVar93[3];
              fVar75 = pfVar93[4];
              fVar76 = pfVar93[5];
              fVar77 = pfVar93[6];
              pfVar2 = (float *)((long)pvVar12 + lVar95);
              *pfVar2 = *pfVar92 * *pfVar93;
              pfVar2[1] = fVar395 * fVar72;
              pfVar2[2] = fVar424 * fVar73;
              pfVar2[3] = fVar425 * fVar74;
              pfVar2[4] = fVar426 * fVar75;
              pfVar2[5] = fVar427 * fVar76;
              pfVar2[6] = fVar15 * fVar77;
              pfVar2[7] = fVar16;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar92 = (float *)pMVar9->data;
              pauVar89 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar81 = uVar82;
                  do {
                    auVar392._0_4_ = auVar225._0_4_ * *pfVar92;
                    auVar392._4_4_ = auVar225._4_4_ * pfVar92[1];
                    auVar392._8_4_ = auVar225._8_4_ * pfVar92[2];
                    auVar392._12_4_ = auVar225._12_4_ * pfVar92[3];
                    auVar392._16_4_ = auVar225._16_4_ * pfVar92[4];
                    auVar392._20_4_ = auVar225._20_4_ * pfVar92[5];
                    auVar392._28_36_ = in_ZMM1._28_36_;
                    auVar392._24_4_ = auVar225._24_4_ * pfVar92[6];
                    in_ZMM1 = ZEXT3264(auVar392._0_32_);
                    *pauVar84 = auVar392._0_32_;
                    pfVar92 = pfVar92 + 8;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar395 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              auVar385._0_4_ = fVar395 * *pfVar92;
              auVar385._4_4_ = fVar395 * pfVar92[1];
              auVar385._8_4_ = fVar395 * pfVar92[2];
              auVar385._12_4_ = fVar395 * pfVar92[3];
              auVar385._16_4_ = fVar395 * pfVar92[4];
              auVar385._20_4_ = fVar395 * pfVar92[5];
              auVar385._28_36_ = in_ZMM1._28_36_;
              auVar385._24_4_ = fVar395 * pfVar92[6];
              in_ZMM1 = ZEXT3264(auVar385._0_32_);
              *(undefined1 (*) [32])((long)*pauVar84 + lVar95) = auVar385._0_32_;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                    auVar390._0_4_ = auVar225._0_4_ * *pfVar92;
                    auVar390._4_4_ = auVar225._4_4_ * pfVar92[1];
                    auVar390._8_4_ = auVar225._8_4_ * pfVar92[2];
                    auVar390._12_4_ = auVar225._12_4_ * pfVar92[3];
                    auVar390._16_4_ = auVar225._16_4_ * pfVar92[4];
                    auVar390._20_4_ = auVar225._20_4_ * pfVar92[5];
                    auVar390._28_36_ = in_ZMM1._28_36_;
                    auVar390._24_4_ = auVar225._24_4_ * pfVar92[6];
                    in_ZMM1 = ZEXT3264(auVar390._0_32_);
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar390._0_32_;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar395 = *pMVar1->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar387._0_4_ = fVar395 * *pfVar92;
                  auVar387._4_4_ = fVar395 * pfVar92[1];
                  auVar387._8_4_ = fVar395 * pfVar92[2];
                  auVar387._12_4_ = fVar395 * pfVar92[3];
                  auVar387._16_4_ = fVar395 * pfVar92[4];
                  auVar387._20_4_ = fVar395 * pfVar92[5];
                  auVar387._28_36_ = in_ZMM1._28_36_;
                  auVar387._24_4_ = fVar395 * pfVar92[6];
                  in_ZMM1 = ZEXT3264(auVar387._0_32_);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar387._0_32_;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  do {
                    auVar376._0_4_ = auVar225._0_4_ * *pfVar92;
                    auVar376._4_4_ = auVar225._4_4_ * pfVar92[1];
                    auVar376._8_4_ = auVar225._8_4_ * pfVar92[2];
                    auVar376._12_4_ = auVar225._12_4_ * pfVar92[3];
                    auVar376._16_4_ = auVar225._16_4_ * pfVar92[4];
                    auVar376._20_4_ = auVar225._20_4_ * pfVar92[5];
                    auVar376._28_36_ = in_ZMM1._28_36_;
                    auVar376._24_4_ = auVar225._24_4_ * pfVar92[6];
                    in_ZMM1 = ZEXT3264(auVar376._0_32_);
                    *pauVar84 = auVar376._0_32_;
                    pfVar92 = pfVar92 + 8;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar371._0_4_ = auVar225._0_4_ * *pfVar92;
                  auVar371._4_4_ = auVar225._4_4_ * pfVar92[1];
                  auVar371._8_4_ = auVar225._8_4_ * pfVar92[2];
                  auVar371._12_4_ = auVar225._12_4_ * pfVar92[3];
                  auVar371._16_4_ = auVar225._16_4_ * pfVar92[4];
                  auVar371._20_4_ = auVar225._20_4_ * pfVar92[5];
                  auVar371._28_36_ = in_ZMM1._28_36_;
                  auVar371._24_4_ = auVar225._24_4_ * pfVar92[6];
                  in_ZMM1 = ZEXT3264(auVar371._0_32_);
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar371._0_32_;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    fVar395 = *(float *)((long)pvVar91 + lVar95);
                    pfVar92 = (float *)((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                    auVar28._4_4_ = fVar395 * pfVar92[1];
                    auVar28._0_4_ = fVar395 * *pfVar92;
                    auVar28._8_4_ = fVar395 * pfVar92[2];
                    auVar28._12_4_ = fVar395 * pfVar92[3];
                    auVar28._16_4_ = fVar395 * pfVar92[4];
                    auVar28._20_4_ = fVar395 * pfVar92[5];
                    auVar28._24_4_ = fVar395 * pfVar92[6];
                    auVar28._28_4_ = fVar395;
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar28;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      fVar395 = *(float *)((long)pvVar91 + lVar95);
                      pfVar92 = (float *)((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                      auVar47._4_4_ = fVar395 * pfVar92[1];
                      auVar47._0_4_ = fVar395 * *pfVar92;
                      auVar47._8_4_ = fVar395 * pfVar92[2];
                      auVar47._12_4_ = fVar395 * pfVar92[3];
                      auVar47._16_4_ = fVar395 * pfVar92[4];
                      auVar47._20_4_ = fVar395 * pfVar92[5];
                      auVar47._24_4_ = fVar395 * pfVar92[6];
                      auVar47._28_4_ = fVar395;
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar47;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00260425:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar381._0_4_ = auVar225._0_4_ * *pfVar92;
                          auVar381._4_4_ = auVar225._4_4_ * pfVar92[1];
                          auVar381._8_4_ = auVar225._8_4_ * pfVar92[2];
                          auVar381._12_4_ = auVar225._12_4_ * pfVar92[3];
                          auVar381._16_4_ = auVar225._16_4_ * pfVar92[4];
                          auVar381._20_4_ = auVar225._20_4_ * pfVar92[5];
                          auVar381._28_36_ = in_ZMM1._28_36_;
                          auVar381._24_4_ = auVar225._24_4_ * pfVar92[6];
                          in_ZMM1 = ZEXT3264(auVar381._0_32_);
                          *pauVar84 = auVar381._0_32_;
                          pfVar92 = pfVar92 + 8;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          pfVar93 = (float *)((long)pvVar98 + lVar95);
                          auVar42._4_4_ = pfVar92[1] * pfVar93[1];
                          auVar42._0_4_ = *pfVar92 * *pfVar93;
                          auVar42._8_4_ = pfVar92[2] * pfVar93[2];
                          auVar42._12_4_ = pfVar92[3] * pfVar93[3];
                          auVar42._16_4_ = pfVar92[4] * pfVar93[4];
                          auVar42._20_4_ = pfVar92[5] * pfVar93[5];
                          auVar42._24_4_ = pfVar92[6] * pfVar93[6];
                          auVar42._28_4_ = pfVar92[7];
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar42;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar391._0_4_ = auVar225._0_4_ * *pfVar92;
                          auVar391._4_4_ = auVar225._4_4_ * pfVar92[1];
                          auVar391._8_4_ = auVar225._8_4_ * pfVar92[2];
                          auVar391._12_4_ = auVar225._12_4_ * pfVar92[3];
                          auVar391._16_4_ = auVar225._16_4_ * pfVar92[4];
                          auVar391._20_4_ = auVar225._20_4_ * pfVar92[5];
                          auVar391._28_36_ = in_ZMM1._28_36_;
                          auVar391._24_4_ = auVar225._24_4_ * pfVar92[6];
                          in_ZMM1 = ZEXT3264(auVar391._0_32_);
                          *pauVar84 = auVar391._0_32_;
                          pfVar92 = pfVar92 + 8;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar91 + lVar95);
                          pfVar93 = (float *)((long)pvVar12 +
                                             lVar95 + (long)local_130 * local_138 * (long)local_158)
                          ;
                          auVar56._4_4_ = pfVar92[1] * pfVar93[1];
                          auVar56._0_4_ = *pfVar92 * *pfVar93;
                          auVar56._8_4_ = pfVar92[2] * pfVar93[2];
                          auVar56._12_4_ = pfVar92[3] * pfVar93[3];
                          auVar56._16_4_ = pfVar92[4] * pfVar93[4];
                          auVar56._20_4_ = pfVar92[5] * pfVar93[5];
                          auVar56._24_4_ = pfVar92[6] * pfVar93[6];
                          auVar56._28_4_ = pfVar92[7];
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar56;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    pfVar92 = (float *)((long)pvVar91 +
                                       lVar95 + local_110 * local_128 * (long)local_158);
                    pfVar93 = (float *)((long)pvVar12 +
                                       lVar95 + sVar106 * (long)local_130 * (long)local_158);
                    auVar59._4_4_ = pfVar92[1] * pfVar93[1];
                    auVar59._0_4_ = *pfVar92 * *pfVar93;
                    auVar59._8_4_ = pfVar92[2] * pfVar93[2];
                    auVar59._12_4_ = pfVar92[3] * pfVar93[3];
                    auVar59._16_4_ = pfVar92[4] * pfVar93[4];
                    auVar59._20_4_ = pfVar92[5] * pfVar93[5];
                    auVar59._24_4_ = pfVar92[6] * pfVar93[6];
                    auVar59._28_4_ = pfVar92[7];
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar59;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00260425;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                auVar389._0_4_ = auVar225._0_4_ * *pfVar92;
                auVar389._4_4_ = auVar225._4_4_ * pfVar92[1];
                auVar389._8_4_ = auVar225._8_4_ * pfVar92[2];
                auVar389._12_4_ = auVar225._12_4_ * pfVar92[3];
                auVar389._16_4_ = auVar225._16_4_ * pfVar92[4];
                auVar389._20_4_ = auVar225._20_4_ * pfVar92[5];
                auVar389._28_36_ = in_ZMM1._28_36_;
                auVar389._24_4_ = auVar225._24_4_ * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar389._0_32_);
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                     auVar389._0_32_;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                  auVar222 = *(undefined1 (*) [32])((long)pvVar98 + lVar95);
                  auVar203 = vrcpps_avx(auVar222);
                  auVar416._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                  auVar416._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                  auVar416._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                  auVar416._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                  auVar416._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                  auVar416._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                  auVar416._28_36_ = in_ZMM3._28_36_;
                  auVar416._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                  auVar50._4_4_ = auVar222._4_4_ * auVar416._4_4_;
                  auVar50._0_4_ = auVar222._0_4_ * auVar416._0_4_;
                  auVar50._8_4_ = auVar222._8_4_ * auVar416._8_4_;
                  auVar50._12_4_ = auVar222._12_4_ * auVar416._12_4_;
                  auVar50._16_4_ = auVar222._16_4_ * auVar416._16_4_;
                  auVar50._20_4_ = auVar222._20_4_ * auVar416._20_4_;
                  auVar50._24_4_ = auVar222._24_4_ * auVar416._24_4_;
                  auVar50._28_4_ = auVar222._28_4_;
                  auVar225 = vsubps_avx(auVar225,auVar50);
                  pfVar92 = (float *)((long)pvVar12 + lVar95);
                  *pfVar92 = auVar416._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                  pfVar92[1] = auVar416._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                  pfVar92[2] = auVar416._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                  pfVar92[3] = auVar416._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                  pfVar92[4] = auVar416._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                  pfVar92[5] = auVar416._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                  pfVar92[6] = auVar416._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                  pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                  in_ZMM3 = ZEXT3264(auVar416._0_32_);
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              auVar130._0_4_ = 1.0 / *pMVar1->data;
              auVar130._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar132 = vshufps_avx(auVar130,auVar130,0);
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                auVar382._0_4_ = auVar132._0_4_ * *pfVar92;
                auVar382._4_4_ = auVar132._4_4_ * pfVar92[1];
                auVar382._8_4_ = auVar132._8_4_ * pfVar92[2];
                auVar382._12_4_ = auVar132._12_4_ * pfVar92[3];
                auVar382._16_4_ = auVar132._0_4_ * pfVar92[4];
                auVar382._20_4_ = auVar132._4_4_ * pfVar92[5];
                auVar382._28_36_ = in_ZMM1._28_36_;
                auVar382._24_4_ = auVar132._8_4_ * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar382._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar382._0_32_;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    auVar417 = in_ZMM3;
                    uVar99 = uVar100;
                    do {
                      auVar222 = *pauVar87;
                      auVar203 = vrcpps_avx(auVar222);
                      auVar405._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                      auVar405._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                      auVar405._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                      auVar405._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                      auVar405._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                      auVar405._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                      auVar405._28_36_ = auVar417._28_36_;
                      auVar405._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                      in_ZMM3 = ZEXT3264(auVar405._0_32_);
                      auVar32._4_4_ = auVar222._4_4_ * auVar405._4_4_;
                      auVar32._0_4_ = auVar222._0_4_ * auVar405._0_4_;
                      auVar32._8_4_ = auVar222._8_4_ * auVar405._8_4_;
                      auVar32._12_4_ = auVar222._12_4_ * auVar405._12_4_;
                      auVar32._16_4_ = auVar222._16_4_ * auVar405._16_4_;
                      auVar32._20_4_ = auVar222._20_4_ * auVar405._20_4_;
                      auVar32._24_4_ = auVar222._24_4_ * auVar405._24_4_;
                      auVar32._28_4_ = auVar222._28_4_;
                      auVar222 = vsubps_avx(auVar225,auVar32);
                      auVar357._0_4_ = auVar405._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                      auVar357._4_4_ = auVar405._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                      auVar357._8_4_ = auVar405._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                      auVar357._12_4_ = auVar405._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                      auVar357._16_4_ = auVar405._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                      auVar357._20_4_ = auVar405._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                      auVar357._24_4_ = auVar405._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                      auVar357._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                      *pauVar84 = auVar357;
                      pauVar87 = pauVar87 + 1;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                      auVar417 = in_ZMM3;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                auVar417 = in_ZMM3;
                iVar80 = iVar107;
                do {
                  auVar222 = *(undefined1 (*) [32])
                              ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar203 = vrcpps_avx(auVar222);
                  auVar400._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                  auVar400._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                  auVar400._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                  auVar400._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                  auVar400._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                  auVar400._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                  auVar400._28_36_ = auVar417._28_36_;
                  auVar400._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                  in_ZMM3 = ZEXT3264(auVar400._0_32_);
                  auVar23._4_4_ = auVar222._4_4_ * auVar400._4_4_;
                  auVar23._0_4_ = auVar222._0_4_ * auVar400._0_4_;
                  auVar23._8_4_ = auVar222._8_4_ * auVar400._8_4_;
                  auVar23._12_4_ = auVar222._12_4_ * auVar400._12_4_;
                  auVar23._16_4_ = auVar222._16_4_ * auVar400._16_4_;
                  auVar23._20_4_ = auVar222._20_4_ * auVar400._20_4_;
                  auVar23._24_4_ = auVar222._24_4_ * auVar400._24_4_;
                  auVar23._28_4_ = auVar222._28_4_;
                  auVar222 = vsubps_avx(auVar225,auVar23);
                  auVar352._0_4_ = auVar400._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                  auVar352._4_4_ = auVar400._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                  auVar352._8_4_ = auVar400._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                  auVar352._12_4_ = auVar400._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                  auVar352._16_4_ = auVar400._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                  auVar352._20_4_ = auVar400._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                  auVar352._24_4_ = auVar400._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                  auVar352._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar352;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                  auVar417 = in_ZMM3;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              fVar395 = *pMVar9->data;
              auVar215._4_4_ = fVar395;
              auVar215._0_4_ = fVar395;
              auVar215._8_4_ = fVar395;
              auVar215._12_4_ = fVar395;
              auVar215._16_4_ = fVar395;
              auVar215._20_4_ = fVar395;
              auVar215._24_4_ = fVar395;
              auVar215._28_4_ = fVar395;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                auVar222 = vrcpps_avx(auVar225);
                auVar406._0_4_ = fVar395 * auVar222._0_4_;
                auVar406._4_4_ = fVar395 * auVar222._4_4_;
                auVar406._8_4_ = fVar395 * auVar222._8_4_;
                auVar406._12_4_ = fVar395 * auVar222._12_4_;
                auVar406._16_4_ = fVar395 * auVar222._16_4_;
                auVar406._20_4_ = fVar395 * auVar222._20_4_;
                auVar406._28_36_ = in_ZMM3._28_36_;
                auVar406._24_4_ = fVar395 * auVar222._24_4_;
                auVar33._4_4_ = auVar225._4_4_ * auVar406._4_4_;
                auVar33._0_4_ = auVar225._0_4_ * auVar406._0_4_;
                auVar33._8_4_ = auVar225._8_4_ * auVar406._8_4_;
                auVar33._12_4_ = auVar225._12_4_ * auVar406._12_4_;
                auVar33._16_4_ = auVar225._16_4_ * auVar406._16_4_;
                auVar33._20_4_ = auVar225._20_4_ * auVar406._20_4_;
                auVar33._24_4_ = auVar225._24_4_ * auVar406._24_4_;
                auVar33._28_4_ = auVar225._28_4_;
                auVar225 = vsubps_avx(auVar215,auVar33);
                pfVar92 = (float *)((long)pvVar12 + lVar95);
                *pfVar92 = auVar406._0_4_ + auVar222._0_4_ * auVar225._0_4_;
                pfVar92[1] = auVar406._4_4_ + auVar222._4_4_ * auVar225._4_4_;
                pfVar92[2] = auVar406._8_4_ + auVar222._8_4_ * auVar225._8_4_;
                pfVar92[3] = auVar406._12_4_ + auVar222._12_4_ * auVar225._12_4_;
                pfVar92[4] = auVar406._16_4_ + auVar222._16_4_ * auVar225._16_4_;
                pfVar92[5] = auVar406._20_4_ + auVar222._20_4_ * auVar225._20_4_;
                pfVar92[6] = auVar406._24_4_ + auVar222._24_4_ * auVar225._24_4_;
                pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
                in_ZMM3 = ZEXT3264(auVar406._0_32_);
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              fVar395 = *pMVar9->data;
              auVar212._4_4_ = fVar395;
              auVar212._0_4_ = fVar395;
              auVar212._8_4_ = fVar395;
              auVar212._12_4_ = fVar395;
              auVar212._16_4_ = fVar395;
              auVar212._20_4_ = fVar395;
              auVar212._24_4_ = fVar395;
              auVar212._28_4_ = fVar395;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                auVar222 = vrcpps_avx(auVar225);
                auVar404._0_4_ = fVar395 * auVar222._0_4_;
                auVar404._4_4_ = fVar395 * auVar222._4_4_;
                auVar404._8_4_ = fVar395 * auVar222._8_4_;
                auVar404._12_4_ = fVar395 * auVar222._12_4_;
                auVar404._16_4_ = fVar395 * auVar222._16_4_;
                auVar404._20_4_ = fVar395 * auVar222._20_4_;
                auVar404._28_36_ = in_ZMM3._28_36_;
                auVar404._24_4_ = fVar395 * auVar222._24_4_;
                auVar31._4_4_ = auVar225._4_4_ * auVar404._4_4_;
                auVar31._0_4_ = auVar225._0_4_ * auVar404._0_4_;
                auVar31._8_4_ = auVar225._8_4_ * auVar404._8_4_;
                auVar31._12_4_ = auVar225._12_4_ * auVar404._12_4_;
                auVar31._16_4_ = auVar225._16_4_ * auVar404._16_4_;
                auVar31._20_4_ = auVar225._20_4_ * auVar404._20_4_;
                auVar31._24_4_ = auVar225._24_4_ * auVar404._24_4_;
                auVar31._28_4_ = auVar225._28_4_;
                auVar225 = vsubps_avx(auVar212,auVar31);
                pfVar92 = (float *)((long)pvVar12 + lVar95);
                *pfVar92 = auVar404._0_4_ + auVar222._0_4_ * auVar225._0_4_;
                pfVar92[1] = auVar404._4_4_ + auVar222._4_4_ * auVar225._4_4_;
                pfVar92[2] = auVar404._8_4_ + auVar222._8_4_ * auVar225._8_4_;
                pfVar92[3] = auVar404._12_4_ + auVar222._12_4_ * auVar225._12_4_;
                pfVar92[4] = auVar404._16_4_ + auVar222._16_4_ * auVar225._16_4_;
                pfVar92[5] = auVar404._20_4_ + auVar222._20_4_ * auVar225._20_4_;
                pfVar92[6] = auVar404._24_4_ + auVar222._24_4_ * auVar225._24_4_;
                pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
                in_ZMM3 = ZEXT3264(auVar404._0_32_);
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          fVar395 = *pMVar9->data;
          auVar197._4_4_ = fVar395;
          auVar197._0_4_ = fVar395;
          auVar197._8_4_ = fVar395;
          auVar197._12_4_ = fVar395;
          auVar197._16_4_ = fVar395;
          auVar197._20_4_ = fVar395;
          auVar197._24_4_ = fVar395;
          auVar197._28_4_ = fVar395;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              auVar417 = in_ZMM3;
              iVar80 = iVar107;
              do {
                auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82)
                ;
                auVar222 = vrcpps_avx(auVar225);
                auVar398._0_4_ = fVar395 * auVar222._0_4_;
                auVar398._4_4_ = fVar395 * auVar222._4_4_;
                auVar398._8_4_ = fVar395 * auVar222._8_4_;
                auVar398._12_4_ = fVar395 * auVar222._12_4_;
                auVar398._16_4_ = fVar395 * auVar222._16_4_;
                auVar398._20_4_ = fVar395 * auVar222._20_4_;
                auVar398._28_36_ = auVar417._28_36_;
                auVar398._24_4_ = fVar395 * auVar222._24_4_;
                in_ZMM3 = ZEXT3264(auVar398._0_32_);
                auVar20._4_4_ = auVar225._4_4_ * auVar398._4_4_;
                auVar20._0_4_ = auVar225._0_4_ * auVar398._0_4_;
                auVar20._8_4_ = auVar225._8_4_ * auVar398._8_4_;
                auVar20._12_4_ = auVar225._12_4_ * auVar398._12_4_;
                auVar20._16_4_ = auVar225._16_4_ * auVar398._16_4_;
                auVar20._20_4_ = auVar225._20_4_ * auVar398._20_4_;
                auVar20._24_4_ = auVar225._24_4_ * auVar398._24_4_;
                auVar20._28_4_ = auVar225._28_4_;
                auVar225 = vsubps_avx(auVar197,auVar20);
                auVar350._0_4_ = auVar398._0_4_ + auVar222._0_4_ * auVar225._0_4_;
                auVar350._4_4_ = auVar398._4_4_ + auVar222._4_4_ * auVar225._4_4_;
                auVar350._8_4_ = auVar398._8_4_ + auVar222._8_4_ * auVar225._8_4_;
                auVar350._12_4_ = auVar398._12_4_ + auVar222._12_4_ * auVar225._12_4_;
                auVar350._16_4_ = auVar398._16_4_ + auVar222._16_4_ * auVar225._16_4_;
                auVar350._20_4_ = auVar398._20_4_ + auVar222._20_4_ * auVar225._20_4_;
                auVar350._24_4_ = auVar398._24_4_ + auVar222._24_4_ * auVar225._24_4_;
                auVar350._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar350;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
                auVar417 = in_ZMM3;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar89 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar87 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar87;
                      auVar417 = in_ZMM3;
                      uVar99 = uVar100;
                      do {
                        auVar222 = *pauVar89;
                        auVar203 = vrcpps_avx(auVar222);
                        auVar397._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                        auVar397._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                        auVar397._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                        auVar397._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                        auVar397._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                        auVar397._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                        auVar397._28_36_ = auVar417._28_36_;
                        auVar397._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                        in_ZMM3 = ZEXT3264(auVar397._0_32_);
                        auVar19._4_4_ = auVar222._4_4_ * auVar397._4_4_;
                        auVar19._0_4_ = auVar222._0_4_ * auVar397._0_4_;
                        auVar19._8_4_ = auVar222._8_4_ * auVar397._8_4_;
                        auVar19._12_4_ = auVar222._12_4_ * auVar397._12_4_;
                        auVar19._16_4_ = auVar222._16_4_ * auVar397._16_4_;
                        auVar19._20_4_ = auVar222._20_4_ * auVar397._20_4_;
                        auVar19._24_4_ = auVar222._24_4_ * auVar397._24_4_;
                        auVar19._28_4_ = auVar222._28_4_;
                        auVar222 = vsubps_avx(auVar225,auVar19);
                        auVar348._0_4_ = auVar397._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                        auVar348._4_4_ = auVar397._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                        auVar348._8_4_ = auVar397._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                        auVar348._12_4_ = auVar397._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                        auVar348._16_4_ = auVar397._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                        auVar348._20_4_ = auVar397._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                        auVar348._24_4_ = auVar397._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                        auVar348._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                        *pauVar84 = auVar348;
                        pauVar89 = pauVar89 + 1;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                        auVar417 = in_ZMM3;
                      } while (uVar99 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
              auVar222 = *(undefined1 (*) [32])((long)pvVar98 + lVar95);
              auVar203 = vrcpps_avx(auVar222);
              auVar399._0_4_ = auVar225._0_4_ * auVar203._0_4_;
              auVar399._4_4_ = auVar225._4_4_ * auVar203._4_4_;
              auVar399._8_4_ = auVar225._8_4_ * auVar203._8_4_;
              auVar399._12_4_ = auVar225._12_4_ * auVar203._12_4_;
              auVar399._16_4_ = auVar225._16_4_ * auVar203._16_4_;
              auVar399._20_4_ = auVar225._20_4_ * auVar203._20_4_;
              auVar399._28_36_ = in_ZMM3._28_36_;
              auVar399._24_4_ = auVar225._24_4_ * auVar203._24_4_;
              auVar22._4_4_ = auVar222._4_4_ * auVar399._4_4_;
              auVar22._0_4_ = auVar222._0_4_ * auVar399._0_4_;
              auVar22._8_4_ = auVar222._8_4_ * auVar399._8_4_;
              auVar22._12_4_ = auVar222._12_4_ * auVar399._12_4_;
              auVar22._16_4_ = auVar222._16_4_ * auVar399._16_4_;
              auVar22._20_4_ = auVar222._20_4_ * auVar399._20_4_;
              auVar22._24_4_ = auVar222._24_4_ * auVar399._24_4_;
              auVar22._28_4_ = auVar222._28_4_;
              auVar225 = vsubps_avx(auVar225,auVar22);
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              *pfVar92 = auVar399._0_4_ + auVar203._0_4_ * auVar225._0_4_;
              pfVar92[1] = auVar399._4_4_ + auVar203._4_4_ * auVar225._4_4_;
              pfVar92[2] = auVar399._8_4_ + auVar203._8_4_ * auVar225._8_4_;
              pfVar92[3] = auVar399._12_4_ + auVar203._12_4_ * auVar225._12_4_;
              pfVar92[4] = auVar399._16_4_ + auVar203._16_4_ * auVar225._16_4_;
              pfVar92[5] = auVar399._20_4_ + auVar203._20_4_ * auVar225._20_4_;
              pfVar92[6] = auVar399._24_4_ + auVar203._24_4_ * auVar225._24_4_;
              pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
              in_ZMM3 = ZEXT3264(auVar399._0_32_);
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar92 = (float *)pMVar9->data;
              pauVar89 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              auVar249._8_4_ = 0x3f800000;
              auVar249._0_8_ = 0x3f8000003f800000;
              auVar249._12_4_ = 0x3f800000;
              auVar249._16_4_ = 0x3f800000;
              auVar249._20_4_ = 0x3f800000;
              auVar249._24_4_ = 0x3f800000;
              auVar249._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  auVar222 = vrcpps_avx(auVar225);
                  fVar395 = auVar222._0_4_;
                  fVar424 = auVar222._4_4_;
                  auVar54._4_4_ = auVar225._4_4_ * fVar424;
                  auVar54._0_4_ = auVar225._0_4_ * fVar395;
                  fVar425 = auVar222._8_4_;
                  auVar54._8_4_ = auVar225._8_4_ * fVar425;
                  fVar426 = auVar222._12_4_;
                  auVar54._12_4_ = auVar225._12_4_ * fVar426;
                  fVar427 = auVar222._16_4_;
                  auVar54._16_4_ = auVar225._16_4_ * fVar427;
                  fVar15 = auVar222._20_4_;
                  auVar54._20_4_ = auVar225._20_4_ * fVar15;
                  fVar16 = auVar222._24_4_;
                  auVar54._24_4_ = auVar225._24_4_ * fVar16;
                  auVar54._28_4_ = auVar225._28_4_;
                  auVar225 = vsubps_avx(auVar249,auVar54);
                  uVar81 = uVar82;
                  do {
                    auVar71._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                    auVar71._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                    auVar71._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                    auVar71._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                    auVar71._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                    auVar71._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                    auVar71._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                    auVar71._28_4_ = auVar222._28_4_;
                    *pauVar84 = auVar71;
                    pfVar92 = pfVar92 + 8;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                    auVar222 = auVar71;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            auVar153._0_4_ = 1.0 / *pMVar1->data;
            auVar153._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar132 = vshufps_avx(auVar153,auVar153,0);
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              auVar386._0_4_ = auVar132._0_4_ * *pfVar92;
              auVar386._4_4_ = auVar132._4_4_ * pfVar92[1];
              auVar386._8_4_ = auVar132._8_4_ * pfVar92[2];
              auVar386._12_4_ = auVar132._12_4_ * pfVar92[3];
              auVar386._16_4_ = auVar132._0_4_ * pfVar92[4];
              auVar386._20_4_ = auVar132._4_4_ * pfVar92[5];
              auVar386._28_36_ = in_ZMM1._28_36_;
              auVar386._24_4_ = auVar132._8_4_ * pfVar92[6];
              in_ZMM1 = ZEXT3264(auVar386._0_32_);
              *(undefined1 (*) [32])((long)*pauVar84 + lVar95) = auVar386._0_32_;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              auVar240._8_4_ = 0x3f800000;
              auVar240._0_8_ = 0x3f8000003f800000;
              auVar240._12_4_ = 0x3f800000;
              auVar240._16_4_ = 0x3f800000;
              auVar240._20_4_ = 0x3f800000;
              auVar240._24_4_ = 0x3f800000;
              auVar240._28_4_ = 0x3f800000;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar9[1].data + uVar82 * 0x20);
                  auVar222 = vrcpps_avx(auVar225);
                  fVar395 = auVar222._0_4_;
                  fVar424 = auVar222._4_4_;
                  auVar45._4_4_ = auVar225._4_4_ * fVar424;
                  auVar45._0_4_ = auVar225._0_4_ * fVar395;
                  fVar425 = auVar222._8_4_;
                  auVar45._8_4_ = auVar225._8_4_ * fVar425;
                  fVar426 = auVar222._12_4_;
                  auVar45._12_4_ = auVar225._12_4_ * fVar426;
                  fVar427 = auVar222._16_4_;
                  auVar45._16_4_ = auVar225._16_4_ * fVar427;
                  fVar15 = auVar222._20_4_;
                  auVar45._20_4_ = auVar225._20_4_ * fVar15;
                  fVar16 = auVar222._24_4_;
                  auVar45._24_4_ = auVar225._24_4_ * fVar16;
                  auVar45._28_4_ = auVar225._28_4_;
                  auVar225 = vsubps_avx(auVar240,auVar45);
                  sVar11 = this_00->cstep;
                  sVar13 = this_00->elemsize;
                  pvVar12 = this_00->data;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar106 * sVar14 * uVar82);
                    auVar69._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                    auVar69._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                    auVar69._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                    auVar69._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                    auVar69._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                    auVar69._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                    auVar69._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                    auVar69._28_4_ = auVar222._28_4_;
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar11 * sVar13 * uVar82) =
                         auVar69;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                    auVar222 = auVar69;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            auVar154._0_4_ = 1.0 / *pMVar9[1].data;
            auVar154._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar132 = vshufps_avx(auVar154,auVar154,0);
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar388._0_4_ = auVar132._0_4_ * *pfVar92;
                  auVar388._4_4_ = auVar132._4_4_ * pfVar92[1];
                  auVar388._8_4_ = auVar132._8_4_ * pfVar92[2];
                  auVar388._12_4_ = auVar132._12_4_ * pfVar92[3];
                  auVar388._16_4_ = auVar132._0_4_ * pfVar92[4];
                  auVar388._20_4_ = auVar132._4_4_ * pfVar92[5];
                  auVar388._28_36_ = in_ZMM1._28_36_;
                  auVar388._24_4_ = auVar132._8_4_ * pfVar92[6];
                  in_ZMM1 = ZEXT3264(auVar388._0_32_);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar388._0_32_;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          auVar202._8_4_ = 0x3f800000;
          auVar202._0_8_ = 0x3f8000003f800000;
          auVar202._12_4_ = 0x3f800000;
          auVar202._16_4_ = 0x3f800000;
          auVar202._20_4_ = 0x3f800000;
          auVar202._24_4_ = 0x3f800000;
          auVar202._28_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  auVar222 = vrcpps_avx(auVar225);
                  fVar395 = auVar222._0_4_;
                  fVar424 = auVar222._4_4_;
                  auVar24._4_4_ = auVar225._4_4_ * fVar424;
                  auVar24._0_4_ = auVar225._0_4_ * fVar395;
                  fVar425 = auVar222._8_4_;
                  auVar24._8_4_ = auVar225._8_4_ * fVar425;
                  fVar426 = auVar222._12_4_;
                  auVar24._12_4_ = auVar225._12_4_ * fVar426;
                  fVar427 = auVar222._16_4_;
                  auVar24._16_4_ = auVar225._16_4_ * fVar427;
                  fVar15 = auVar222._20_4_;
                  auVar24._20_4_ = auVar225._20_4_ * fVar15;
                  fVar16 = auVar222._24_4_;
                  auVar24._24_4_ = auVar225._24_4_ * fVar16;
                  auVar24._28_4_ = auVar225._28_4_;
                  auVar225 = vsubps_avx(auVar202,auVar24);
                  uVar97 = uVar82;
                  do {
                    auVar64._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                    auVar64._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                    auVar64._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                    auVar64._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                    auVar64._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                    auVar64._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                    auVar64._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                    auVar64._28_4_ = auVar222._28_4_;
                    *pauVar84 = auVar64;
                    pfVar92 = pfVar92 + 8;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                    auVar222 = auVar64;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            auVar195._8_4_ = 0x3f800000;
            auVar195._0_8_ = 0x3f8000003f800000;
            auVar195._12_4_ = 0x3f800000;
            auVar195._16_4_ = 0x3f800000;
            auVar195._20_4_ = 0x3f800000;
            auVar195._24_4_ = 0x3f800000;
            auVar195._28_4_ = 0x3f800000;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                auVar222 = vrcpps_avx(auVar225);
                fVar395 = auVar222._0_4_;
                fVar424 = auVar222._4_4_;
                auVar17._4_4_ = auVar225._4_4_ * fVar424;
                auVar17._0_4_ = auVar225._0_4_ * fVar395;
                fVar425 = auVar222._8_4_;
                auVar17._8_4_ = auVar225._8_4_ * fVar425;
                fVar426 = auVar222._12_4_;
                auVar17._12_4_ = auVar225._12_4_ * fVar426;
                fVar427 = auVar222._16_4_;
                auVar17._16_4_ = auVar225._16_4_ * fVar427;
                fVar15 = auVar222._20_4_;
                auVar17._20_4_ = auVar225._20_4_ * fVar15;
                fVar16 = auVar222._24_4_;
                auVar17._24_4_ = auVar225._24_4_ * fVar16;
                auVar17._28_4_ = auVar225._28_4_;
                auVar225 = vsubps_avx(auVar195,auVar17);
                sVar11 = pMVar9->elemsize;
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar62._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                  auVar62._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                  auVar62._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                  auVar62._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                  auVar62._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                  auVar62._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                  auVar62._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                  auVar62._28_4_ = auVar222._28_4_;
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar62;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                  auVar222 = auVar62;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar132 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar91 + lVar95)));
                    auVar132 = vshufps_avx(auVar132,auVar132,0);
                    pfVar92 = (float *)((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                    auVar29._4_4_ = auVar132._4_4_ * pfVar92[1];
                    auVar29._0_4_ = auVar132._0_4_ * *pfVar92;
                    auVar29._8_4_ = auVar132._8_4_ * pfVar92[2];
                    auVar29._12_4_ = auVar132._12_4_ * pfVar92[3];
                    auVar29._16_4_ = auVar132._0_4_ * pfVar92[4];
                    auVar29._20_4_ = auVar132._4_4_ * pfVar92[5];
                    auVar29._24_4_ = auVar132._8_4_ * pfVar92[6];
                    auVar29._28_4_ = auVar132._12_4_;
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar29;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    auVar417 = in_ZMM3;
                    iVar80 = iVar107;
                    do {
                      fVar395 = *(float *)((long)pvVar91 + lVar95);
                      auVar242._4_4_ = fVar395;
                      auVar242._0_4_ = fVar395;
                      auVar242._8_4_ = fVar395;
                      auVar242._12_4_ = fVar395;
                      auVar242._16_4_ = fVar395;
                      auVar242._20_4_ = fVar395;
                      auVar242._24_4_ = fVar395;
                      auVar242._28_4_ = fVar395;
                      auVar225 = *(undefined1 (*) [32])
                                  ((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                      auVar222 = vrcpps_avx(auVar225);
                      auVar415._0_4_ = fVar395 * auVar222._0_4_;
                      auVar415._4_4_ = fVar395 * auVar222._4_4_;
                      auVar415._8_4_ = fVar395 * auVar222._8_4_;
                      auVar415._12_4_ = fVar395 * auVar222._12_4_;
                      auVar415._16_4_ = fVar395 * auVar222._16_4_;
                      auVar415._20_4_ = fVar395 * auVar222._20_4_;
                      auVar415._28_36_ = auVar417._28_36_;
                      auVar415._24_4_ = fVar395 * auVar222._24_4_;
                      in_ZMM3 = ZEXT3264(auVar415._0_32_);
                      auVar48._4_4_ = auVar225._4_4_ * auVar415._4_4_;
                      auVar48._0_4_ = auVar225._0_4_ * auVar415._0_4_;
                      auVar48._8_4_ = auVar225._8_4_ * auVar415._8_4_;
                      auVar48._12_4_ = auVar225._12_4_ * auVar415._12_4_;
                      auVar48._16_4_ = auVar225._16_4_ * auVar415._16_4_;
                      auVar48._20_4_ = auVar225._20_4_ * auVar415._20_4_;
                      auVar48._24_4_ = auVar225._24_4_ * auVar415._24_4_;
                      auVar48._28_4_ = auVar225._28_4_;
                      auVar225 = vsubps_avx(auVar242,auVar48);
                      auVar243._0_4_ = auVar415._0_4_ + auVar222._0_4_ * auVar225._0_4_;
                      auVar243._4_4_ = auVar415._4_4_ + auVar222._4_4_ * auVar225._4_4_;
                      auVar243._8_4_ = auVar415._8_4_ + auVar222._8_4_ * auVar225._8_4_;
                      auVar243._12_4_ = auVar415._12_4_ + auVar222._12_4_ * auVar225._12_4_;
                      auVar243._16_4_ = auVar415._16_4_ + auVar222._16_4_ * auVar225._16_4_;
                      auVar243._20_4_ = auVar415._20_4_ + auVar222._20_4_ * auVar225._20_4_;
                      auVar243._24_4_ = auVar415._24_4_ + auVar222._24_4_ * auVar225._24_4_;
                      auVar243._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar243;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                      auVar417 = in_ZMM3;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002609ff:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                auVar220._8_4_ = 0x3f800000;
                auVar220._0_8_ = 0x3f8000003f800000;
                auVar220._12_4_ = 0x3f800000;
                auVar220._16_4_ = 0x3f800000;
                auVar220._20_4_ = 0x3f800000;
                auVar220._24_4_ = 0x3f800000;
                auVar220._28_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        auVar222 = vrcpps_avx(auVar225);
                        fVar395 = auVar222._0_4_;
                        fVar424 = auVar222._4_4_;
                        auVar34._4_4_ = auVar225._4_4_ * fVar424;
                        auVar34._0_4_ = auVar225._0_4_ * fVar395;
                        fVar425 = auVar222._8_4_;
                        auVar34._8_4_ = auVar225._8_4_ * fVar425;
                        fVar426 = auVar222._12_4_;
                        auVar34._12_4_ = auVar225._12_4_ * fVar426;
                        fVar427 = auVar222._16_4_;
                        auVar34._16_4_ = auVar225._16_4_ * fVar427;
                        fVar15 = auVar222._20_4_;
                        auVar34._20_4_ = auVar225._20_4_ * fVar15;
                        fVar16 = auVar222._24_4_;
                        auVar34._24_4_ = auVar225._24_4_ * fVar16;
                        auVar34._28_4_ = auVar225._28_4_;
                        auVar225 = vsubps_avx(auVar220,auVar34);
                        uVar102 = uVar82;
                        do {
                          auVar66._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                          auVar66._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                          auVar66._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                          auVar66._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                          auVar66._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                          auVar66._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                          auVar66._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                          auVar66._28_4_ = auVar222._28_4_;
                          *pauVar84 = auVar66;
                          pfVar92 = pfVar92 + 8;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                          auVar222 = auVar66;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        auVar417 = in_ZMM3;
                        do {
                          auVar225 = *(undefined1 (*) [32])((long)pvVar98 + lVar95);
                          auVar222 = *(undefined1 (*) [32])
                                      ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          auVar203 = vrcpps_avx(auVar222);
                          auVar412._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                          auVar412._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                          auVar412._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                          auVar412._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                          auVar412._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                          auVar412._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                          auVar412._28_36_ = auVar417._28_36_;
                          auVar412._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                          in_ZMM3 = ZEXT3264(auVar412._0_32_);
                          auVar43._4_4_ = auVar222._4_4_ * auVar412._4_4_;
                          auVar43._0_4_ = auVar222._0_4_ * auVar412._0_4_;
                          auVar43._8_4_ = auVar222._8_4_ * auVar412._8_4_;
                          auVar43._12_4_ = auVar222._12_4_ * auVar412._12_4_;
                          auVar43._16_4_ = auVar222._16_4_ * auVar412._16_4_;
                          auVar43._20_4_ = auVar222._20_4_ * auVar412._20_4_;
                          auVar43._24_4_ = auVar222._24_4_ * auVar412._24_4_;
                          auVar43._28_4_ = auVar222._28_4_;
                          auVar225 = vsubps_avx(auVar225,auVar43);
                          auVar237._0_4_ = auVar412._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                          auVar237._4_4_ = auVar412._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                          auVar237._8_4_ = auVar412._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                          auVar237._12_4_ = auVar412._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                          auVar237._16_4_ = auVar412._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                          auVar237._20_4_ = auVar412._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                          auVar237._24_4_ = auVar412._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                          auVar237._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar237;
                          lVar95 = lVar95 + 0x20;
                          auVar417 = in_ZMM3;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        auVar417 = in_ZMM3;
                        uVar101 = uVar100;
                        do {
                          auVar222 = *pauVar89;
                          auVar203 = vrcpps_avx(auVar222);
                          auVar418._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                          auVar418._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                          auVar418._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                          auVar418._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                          auVar418._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                          auVar418._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                          auVar418._28_36_ = auVar417._28_36_;
                          auVar418._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                          in_ZMM3 = ZEXT3264(auVar418._0_32_);
                          auVar52._4_4_ = auVar222._4_4_ * auVar418._4_4_;
                          auVar52._0_4_ = auVar222._0_4_ * auVar418._0_4_;
                          auVar52._8_4_ = auVar222._8_4_ * auVar418._8_4_;
                          auVar52._12_4_ = auVar222._12_4_ * auVar418._12_4_;
                          auVar52._16_4_ = auVar222._16_4_ * auVar418._16_4_;
                          auVar52._20_4_ = auVar222._20_4_ * auVar418._20_4_;
                          auVar52._24_4_ = auVar222._24_4_ * auVar418._24_4_;
                          auVar52._28_4_ = auVar222._28_4_;
                          auVar222 = vsubps_avx(auVar225,auVar52);
                          auVar367._0_4_ = auVar418._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                          auVar367._4_4_ = auVar418._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                          auVar367._8_4_ = auVar418._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                          auVar367._12_4_ = auVar418._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                          auVar367._16_4_ = auVar418._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                          auVar367._20_4_ = auVar418._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                          auVar367._24_4_ = auVar418._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                          auVar367._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                          *pauVar84 = auVar367;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                          auVar417 = in_ZMM3;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        auVar417 = in_ZMM3;
                        do {
                          auVar225 = *(undefined1 (*) [32])
                                      ((long)pvVar12 +
                                      lVar95 + (long)local_130 * local_138 * (long)local_158);
                          auVar222 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                          auVar203 = vrcpps_avx(auVar222);
                          auVar420._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                          auVar420._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                          auVar420._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                          auVar420._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                          auVar420._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                          auVar420._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                          auVar420._28_36_ = auVar417._28_36_;
                          auVar420._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                          in_ZMM3 = ZEXT3264(auVar420._0_32_);
                          auVar57._4_4_ = auVar222._4_4_ * auVar420._4_4_;
                          auVar57._0_4_ = auVar222._0_4_ * auVar420._0_4_;
                          auVar57._8_4_ = auVar222._8_4_ * auVar420._8_4_;
                          auVar57._12_4_ = auVar222._12_4_ * auVar420._12_4_;
                          auVar57._16_4_ = auVar222._16_4_ * auVar420._16_4_;
                          auVar57._20_4_ = auVar222._20_4_ * auVar420._20_4_;
                          auVar57._24_4_ = auVar222._24_4_ * auVar420._24_4_;
                          auVar57._28_4_ = auVar222._28_4_;
                          auVar225 = vsubps_avx(auVar225,auVar57);
                          auVar250._0_4_ = auVar420._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                          auVar250._4_4_ = auVar420._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                          auVar250._8_4_ = auVar420._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                          auVar250._12_4_ = auVar420._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                          auVar250._16_4_ = auVar420._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                          auVar250._20_4_ = auVar420._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                          auVar250._24_4_ = auVar420._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                          auVar250._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar250;
                          lVar95 = lVar95 + 0x20;
                          auVar417 = in_ZMM3;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  auVar417 = in_ZMM3;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = *(undefined1 (*) [32])
                                ((long)pvVar12 +
                                lVar95 + sVar106 * (long)local_130 * (long)local_158);
                    auVar222 = *(undefined1 (*) [32])
                                ((long)pvVar91 + lVar95 + local_110 * local_128 * (long)local_158);
                    auVar203 = vrcpps_avx(auVar222);
                    auVar422._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                    auVar422._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                    auVar422._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                    auVar422._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                    auVar422._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                    auVar422._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                    auVar422._28_36_ = auVar417._28_36_;
                    auVar422._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                    in_ZMM3 = ZEXT3264(auVar422._0_32_);
                    auVar60._4_4_ = auVar222._4_4_ * auVar422._4_4_;
                    auVar60._0_4_ = auVar222._0_4_ * auVar422._0_4_;
                    auVar60._8_4_ = auVar222._8_4_ * auVar422._8_4_;
                    auVar60._12_4_ = auVar222._12_4_ * auVar422._12_4_;
                    auVar60._16_4_ = auVar222._16_4_ * auVar422._16_4_;
                    auVar60._20_4_ = auVar222._20_4_ * auVar422._20_4_;
                    auVar60._24_4_ = auVar222._24_4_ * auVar422._24_4_;
                    auVar60._28_4_ = auVar222._28_4_;
                    auVar225 = vsubps_avx(auVar225,auVar60);
                    auVar254._0_4_ = auVar422._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                    auVar254._4_4_ = auVar422._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                    auVar254._8_4_ = auVar422._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                    auVar254._12_4_ = auVar422._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                    auVar254._16_4_ = auVar422._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                    auVar254._20_4_ = auVar422._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                    auVar254._24_4_ = auVar422._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                    auVar254._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar254;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                    auVar417 = in_ZMM3;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002609ff;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              auVar417 = in_ZMM3;
              iVar80 = iVar107;
              do {
                auVar222 = *(undefined1 (*) [32])
                            ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                auVar203 = vrcpps_avx(auVar222);
                auVar411._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                auVar411._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                auVar411._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                auVar411._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                auVar411._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                auVar411._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                auVar411._28_36_ = auVar417._28_36_;
                auVar411._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                in_ZMM3 = ZEXT3264(auVar411._0_32_);
                auVar40._4_4_ = auVar222._4_4_ * auVar411._4_4_;
                auVar40._0_4_ = auVar222._0_4_ * auVar411._0_4_;
                auVar40._8_4_ = auVar222._8_4_ * auVar411._8_4_;
                auVar40._12_4_ = auVar222._12_4_ * auVar411._12_4_;
                auVar40._16_4_ = auVar222._16_4_ * auVar411._16_4_;
                auVar40._20_4_ = auVar222._20_4_ * auVar411._20_4_;
                auVar40._24_4_ = auVar222._24_4_ * auVar411._24_4_;
                auVar40._28_4_ = auVar222._28_4_;
                auVar222 = vsubps_avx(auVar225,auVar40);
                auVar363._0_4_ = auVar411._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                auVar363._4_4_ = auVar411._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                auVar363._8_4_ = auVar411._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                auVar363._12_4_ = auVar411._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                auVar363._16_4_ = auVar411._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                auVar363._20_4_ = auVar411._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                auVar363._24_4_ = auVar411._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                auVar363._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar363
                ;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
                auVar417 = in_ZMM3;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar225 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                        *(undefined1 (*) [32])((long)pvVar98 + lVar95));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar211._4_4_ = uVar4;
              auVar211._0_4_ = uVar4;
              auVar211._8_4_ = uVar4;
              auVar211._12_4_ = uVar4;
              auVar211._16_4_ = uVar4;
              auVar211._20_4_ = uVar4;
              auVar211._24_4_ = uVar4;
              auVar211._28_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar225 = vmaxps_avx(auVar211,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    uVar99 = uVar100;
                    do {
                      auVar222 = vmaxps_avx(auVar225,*pauVar87);
                      *pauVar84 = auVar222;
                      pauVar87 = pauVar87 + 1;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar222 = vmaxps_avx(auVar225,*(undefined1 (*) [32])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar210._4_4_ = uVar4;
              auVar210._0_4_ = uVar4;
              auVar210._8_4_ = uVar4;
              auVar210._12_4_ = uVar4;
              auVar210._16_4_ = uVar4;
              auVar210._20_4_ = uVar4;
              auVar210._24_4_ = uVar4;
              auVar210._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vmaxps_avx(auVar210,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar209._4_4_ = uVar4;
              auVar209._0_4_ = uVar4;
              auVar209._8_4_ = uVar4;
              auVar209._12_4_ = uVar4;
              auVar209._16_4_ = uVar4;
              auVar209._20_4_ = uVar4;
              auVar209._24_4_ = uVar4;
              auVar209._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vmaxps_avx(auVar209,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar196._4_4_ = uVar4;
          auVar196._0_4_ = uVar4;
          auVar196._8_4_ = uVar4;
          auVar196._12_4_ = uVar4;
          auVar196._16_4_ = uVar4;
          auVar196._20_4_ = uVar4;
          auVar196._24_4_ = uVar4;
          auVar196._28_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar225 = vmaxps_avx(auVar196,*(undefined1 (*) [32])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar225;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar89 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar87 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar87;
                      uVar99 = uVar100;
                      do {
                        auVar222 = vmaxps_avx(auVar225,*pauVar89);
                        *pauVar84 = auVar222;
                        pauVar89 = pauVar89 + 1;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar225 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                    *(undefined1 (*) [32])((long)pvVar98 + lVar95));
              *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar89 = (undefined1 (*) [32])pMVar9->data;
              pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar87;
                  uVar81 = uVar82;
                  do {
                    auVar222 = vmaxps_avx(auVar225,*pauVar89);
                    *pauVar84 = auVar222;
                    pauVar89 = pauVar89 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar226._4_4_ = uVar4;
            auVar226._0_4_ = uVar4;
            auVar226._8_4_ = uVar4;
            auVar226._12_4_ = uVar4;
            auVar226._16_4_ = uVar4;
            auVar226._20_4_ = uVar4;
            auVar226._24_4_ = uVar4;
            auVar226._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar225 = vmaxps_avx(auVar226,*(undefined1 (*) [32])((long)pvVar12 + lVar95));
              *(undefined1 (*) [32])((long)*pauVar84 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar222 = vmaxps_avx(auVar225,*(undefined1 (*) [32])
                                                    ((long)pvVar91 +
                                                    lVar95 + sVar13 * sVar14 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar222;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar227._4_4_ = uVar4;
            auVar227._0_4_ = uVar4;
            auVar227._8_4_ = uVar4;
            auVar227._12_4_ = uVar4;
            auVar227._16_4_ = uVar4;
            auVar227._20_4_ = uVar4;
            auVar227._24_4_ = uVar4;
            auVar227._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar225 = vmaxps_avx(auVar227,*(undefined1 (*) [32])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar225;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar87 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  do {
                    auVar222 = vmaxps_avx(auVar225,*pauVar87);
                    *pauVar84 = auVar222;
                    pauVar87 = pauVar87 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar222 = vmaxps_avx(auVar225,*(undefined1 (*) [32])
                                                  ((long)pvVar12 +
                                                  lVar95 + sVar106 * sVar11 * uVar82));
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar204._4_4_ = uVar4;
                    auVar204._0_4_ = uVar4;
                    auVar204._8_4_ = uVar4;
                    auVar204._12_4_ = uVar4;
                    auVar204._16_4_ = uVar4;
                    auVar204._20_4_ = uVar4;
                    auVar204._24_4_ = uVar4;
                    auVar204._28_4_ = uVar4;
                    auVar225 = vmaxps_avx(auVar204,*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    lVar95 * 8 + sVar106 * sVar11 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar225;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar241._4_4_ = uVar4;
                      auVar241._0_4_ = uVar4;
                      auVar241._8_4_ = uVar4;
                      auVar241._12_4_ = uVar4;
                      auVar241._16_4_ = uVar4;
                      auVar241._20_4_ = uVar4;
                      auVar241._24_4_ = uVar4;
                      auVar241._28_4_ = uVar4;
                      auVar225 = vmaxps_avx(auVar241,*(undefined1 (*) [32])
                                                      ((long)pvVar12 +
                                                      lVar95 * 8 + sVar106 * sVar11 * uVar82));
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar225;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_0025fd41:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar222 = vmaxps_avx(auVar225,*pauVar89);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar98 + lVar95),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ));
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar222 = vmaxps_avx(auVar225,*pauVar89);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vmaxps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar95 + (long)local_130 * local_138 *
                                                          (long)local_158),
                                                *(undefined1 (*) [32])((long)pvVar91 + lVar95));
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = vmaxps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * (long)local_130 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar91 +
                                           lVar95 + local_110 * local_128 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar225;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_0025fd41;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar222 = vmaxps_avx(auVar225,*(undefined1 (*) [32])
                                                ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82)
                                     );
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar222
                ;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar225 = vminps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                        *(undefined1 (*) [32])((long)pvVar98 + lVar95));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar224._4_4_ = uVar4;
              auVar224._0_4_ = uVar4;
              auVar224._8_4_ = uVar4;
              auVar224._12_4_ = uVar4;
              auVar224._16_4_ = uVar4;
              auVar224._20_4_ = uVar4;
              auVar224._24_4_ = uVar4;
              auVar224._28_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar225 = vminps_avx(auVar224,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    uVar99 = uVar100;
                    do {
                      auVar222 = vminps_avx(auVar225,*pauVar87);
                      *pauVar84 = auVar222;
                      pauVar87 = pauVar87 + 1;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar222 = vminps_avx(auVar225,*(undefined1 (*) [32])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar223._4_4_ = uVar4;
              auVar223._0_4_ = uVar4;
              auVar223._8_4_ = uVar4;
              auVar223._12_4_ = uVar4;
              auVar223._16_4_ = uVar4;
              auVar223._20_4_ = uVar4;
              auVar223._24_4_ = uVar4;
              auVar223._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vminps_avx(auVar223,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar221._4_4_ = uVar4;
              auVar221._0_4_ = uVar4;
              auVar221._8_4_ = uVar4;
              auVar221._12_4_ = uVar4;
              auVar221._16_4_ = uVar4;
              auVar221._20_4_ = uVar4;
              auVar221._24_4_ = uVar4;
              auVar221._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vminps_avx(auVar221,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar201._4_4_ = uVar4;
          auVar201._0_4_ = uVar4;
          auVar201._8_4_ = uVar4;
          auVar201._12_4_ = uVar4;
          auVar201._16_4_ = uVar4;
          auVar201._20_4_ = uVar4;
          auVar201._24_4_ = uVar4;
          auVar201._28_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar225 = vminps_avx(auVar201,*(undefined1 (*) [32])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar225;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar89 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar87 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar87;
                      uVar99 = uVar100;
                      do {
                        auVar222 = vminps_avx(auVar225,*pauVar89);
                        *pauVar84 = auVar222;
                        pauVar89 = pauVar89 + 1;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar225 = vminps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                    *(undefined1 (*) [32])((long)pvVar98 + lVar95));
              *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar89 = (undefined1 (*) [32])pMVar9->data;
              pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar87;
                  uVar81 = uVar82;
                  do {
                    auVar222 = vminps_avx(auVar225,*pauVar89);
                    *pauVar84 = auVar222;
                    pauVar89 = pauVar89 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar231._4_4_ = uVar4;
            auVar231._0_4_ = uVar4;
            auVar231._8_4_ = uVar4;
            auVar231._12_4_ = uVar4;
            auVar231._16_4_ = uVar4;
            auVar231._20_4_ = uVar4;
            auVar231._24_4_ = uVar4;
            auVar231._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar225 = vminps_avx(auVar231,*(undefined1 (*) [32])((long)pvVar12 + lVar95));
              *(undefined1 (*) [32])((long)*pauVar84 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar222 = vminps_avx(auVar225,*(undefined1 (*) [32])
                                                    ((long)pvVar91 +
                                                    lVar95 + sVar13 * sVar14 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar222;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar234._4_4_ = uVar4;
            auVar234._0_4_ = uVar4;
            auVar234._8_4_ = uVar4;
            auVar234._12_4_ = uVar4;
            auVar234._16_4_ = uVar4;
            auVar234._20_4_ = uVar4;
            auVar234._24_4_ = uVar4;
            auVar234._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar225 = vminps_avx(auVar234,*(undefined1 (*) [32])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar225;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar87 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  do {
                    auVar222 = vminps_avx(auVar225,*pauVar87);
                    *pauVar84 = auVar222;
                    pauVar87 = pauVar87 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar222 = vminps_avx(auVar225,*(undefined1 (*) [32])
                                                  ((long)pvVar12 +
                                                  lVar95 + sVar106 * sVar11 * uVar82));
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar207._4_4_ = uVar4;
                    auVar207._0_4_ = uVar4;
                    auVar207._8_4_ = uVar4;
                    auVar207._12_4_ = uVar4;
                    auVar207._16_4_ = uVar4;
                    auVar207._20_4_ = uVar4;
                    auVar207._24_4_ = uVar4;
                    auVar207._28_4_ = uVar4;
                    auVar225 = vminps_avx(auVar207,*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    lVar95 * 8 + sVar106 * sVar11 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar225;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar247._4_4_ = uVar4;
                      auVar247._0_4_ = uVar4;
                      auVar247._8_4_ = uVar4;
                      auVar247._12_4_ = uVar4;
                      auVar247._16_4_ = uVar4;
                      auVar247._20_4_ = uVar4;
                      auVar247._24_4_ = uVar4;
                      auVar247._28_4_ = uVar4;
                      auVar225 = vminps_avx(auVar247,*(undefined1 (*) [32])
                                                      ((long)pvVar12 +
                                                      lVar95 * 8 + sVar106 * sVar11 * uVar82));
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar225;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002615e0:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar222 = vminps_avx(auVar225,*pauVar89);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vminps_avx(*(undefined1 (*) [32])((long)pvVar98 + lVar95),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ));
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar222 = vminps_avx(auVar225,*pauVar89);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vminps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar95 + (long)local_130 * local_138 *
                                                          (long)local_158),
                                                *(undefined1 (*) [32])((long)pvVar91 + lVar95));
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = vminps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * (long)local_130 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar91 +
                                           lVar95 + local_110 * local_128 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar225;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002615e0;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar222 = vminps_avx(auVar225,*(undefined1 (*) [32])
                                                ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82)
                                     );
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar222
                ;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar99 = pMVar9->w;
      local_110 = (size_t)uVar99;
      local_60 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      uVar82 = (ulong)uVar6;
      sVar106 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      local_128 = uVar82;
      if (iVar94 == 1) {
        local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar100);
        iVar94 = pMVar9[1].dims;
        if (iVar80 == 1 && uVar99 == 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar100,sVar106,uVar101,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *local_a0->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < (int)uVar100) {
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pafVar86 = (__m256 *)((long)pvVar91 + lVar95);
                uVar269 = *(undefined8 *)*pafVar86;
                uVar268 = *(undefined8 *)(*pafVar86 + 2);
                uVar271 = *(undefined8 *)(*pafVar86 + 4);
                uVar272 = *(undefined8 *)(*pafVar86 + 6);
                local_80 = *pafVar86;
                binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
                *puVar103 = uVar269;
                puVar103[1] = uVar268;
                puVar103[2] = uVar271;
                puVar103[3] = uVar272;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
            }
          }
          else if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar106,uVar101,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *local_a0->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < (int)local_90) {
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              iVar80 = (int)local_90;
              do {
                pafVar86 = (__m256 *)((long)pvVar91 + lVar95);
                uVar269 = *(undefined8 *)*pafVar86;
                uVar268 = *(undefined8 *)(*pafVar86 + 2);
                uVar271 = *(undefined8 *)(*pafVar86 + 4);
                uVar272 = *(undefined8 *)(*pafVar86 + 6);
                local_80 = *pafVar86;
                binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
                *puVar103 = uVar269;
                puVar103[1] = uVar268;
                puVar103[2] = uVar271;
                puVar103[3] = uVar272;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
          }
          else if (iVar94 == 3) {
            Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep == 0) {
              return -100;
            }
            fVar395 = *local_a0->data;
            local_100._4_4_ = fVar395;
            local_100._0_4_ = fVar395;
            fStack_f8 = fVar395;
            fStack_f4 = fVar395;
            uStack_f0._0_4_ = fVar395;
            uStack_f0._4_4_ = fVar395;
            fStack_e8 = fVar395;
            fStack_e4 = fVar395;
            if (0 < (int)uVar6) {
              local_150 = 0;
              do {
                if (0 < (int)local_90) {
                  sVar106 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0[1].cstep;
                  sVar14 = local_a0[1].elemsize;
                  pvVar91 = local_a0[1].data;
                  lVar95 = 0;
                  iVar80 = (int)local_90;
                  do {
                    local_80 = *(__m256 *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                    binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                    *(__m256 *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150) = local_80;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_128);
            }
          }
        }
        else if (iVar94 == 1) {
          Mat::create(this_00,uVar99,local_60,iVar80,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (uVar101 == 1 && local_a0[1].w == 1) {
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < (int)local_110) {
              pvVar91 = local_a0->data;
              lVar95 = 0;
              sVar106 = local_110;
              do {
                pafVar86 = (__m256 *)((long)pvVar91 + lVar95);
                uVar269 = *(undefined8 *)*pafVar86;
                uVar268 = *(undefined8 *)(*pafVar86 + 2);
                uVar271 = *(undefined8 *)(*pafVar86 + 4);
                uVar272 = *(undefined8 *)(*pafVar86 + 6);
                local_80 = *pafVar86;
                binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
                *puVar103 = uVar269;
                puVar103[1] = uVar268;
                puVar103[2] = uVar271;
                puVar103[3] = uVar272;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)sVar106 - 1;
                sVar106 = (size_t)uVar101;
              } while (uVar101 != 0);
            }
          }
          else {
            if ((int)local_110 < 1) {
              return 0;
            }
            pvVar91 = local_a0->data;
            pvVar98 = local_a0[1].data;
            lVar95 = 0;
            sVar106 = local_110;
            do {
              _local_100 = *(__m256 *)((long)pvVar91 + lVar95);
              pafVar86 = (__m256 *)((long)pvVar98 + lVar95);
              uVar269 = *(undefined8 *)*pafVar86;
              uVar268 = *(undefined8 *)(*pafVar86 + 2);
              uVar271 = *(undefined8 *)(*pafVar86 + 4);
              uVar272 = *(undefined8 *)(*pafVar86 + 6);
              local_80 = *pafVar86;
              binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
              puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
              *puVar103 = uVar269;
              puVar103[1] = uVar268;
              puVar103[2] = uVar271;
              puVar103[3] = uVar272;
              lVar95 = lVar95 + 0x20;
              uVar101 = (int)sVar106 - 1;
              sVar106 = (size_t)uVar101;
            } while (uVar101 != 0);
          }
        }
        else {
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar106,uVar101,opt->blob_allocator);
            puVar103 = (undefined8 *)this_00->data;
            if (puVar103 == (undefined8 *)0x0) {
              return -100;
            }
            local_130 = (void *)CONCAT44(local_130._4_4_,uVar5);
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                local_158 = (__m256 *)local_a0->data;
                pafVar86 = (__m256 *)local_a0[1].data;
                iVar80 = 0;
                do {
                  _local_100 = *local_158;
                  uVar101 = uVar100;
                  if (0 < (int)uVar100) {
                    do {
                      uVar269 = *(undefined8 *)*pafVar86;
                      uVar268 = *(undefined8 *)(*pafVar86 + 2);
                      uVar271 = *(undefined8 *)(*pafVar86 + 4);
                      uVar272 = *(undefined8 *)(*pafVar86 + 6);
                      local_80 = *pafVar86;
                      binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                      *puVar103 = uVar269;
                      puVar103[1] = uVar268;
                      puVar103[2] = uVar271;
                      puVar103[3] = uVar272;
                      pafVar86 = pafVar86 + 1;
                      puVar103 = puVar103 + 4;
                      uVar101 = uVar101 - 1;
                    } while (uVar101 != 0);
                  }
                  local_158 = local_158 + 1;
                  iVar80 = iVar80 + 1;
                } while (iVar80 != (int)local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 == 3) {
            Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_150 = 0;
                do {
                  _local_100 = *(__m256 *)((long)local_a0->data + local_150 * 0x20);
                  if (0 < (int)local_90) {
                    sVar106 = local_120->cstep;
                    sVar11 = local_120->elemsize;
                    pvVar12 = local_120->data;
                    sVar13 = local_a0[1].cstep;
                    sVar14 = local_a0[1].elemsize;
                    pvVar91 = local_a0[1].data;
                    lVar95 = 0;
                    iVar80 = (int)local_90;
                    do {
                      pafVar86 = (__m256 *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                      uVar269 = *(undefined8 *)*pafVar86;
                      uVar268 = *(undefined8 *)(*pafVar86 + 2);
                      uVar271 = *(undefined8 *)(*pafVar86 + 4);
                      uVar272 = *(undefined8 *)(*pafVar86 + 6);
                      local_80 = *pafVar86;
                      binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                      puVar103 = (undefined8 *)
                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150);
                      *puVar103 = uVar269;
                      puVar103[1] = uVar268;
                      puVar103[2] = uVar271;
                      puVar103[3] = uVar272;
                      lVar95 = lVar95 + 0x20;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
      }
      else {
        uVar7 = pMVar9->h;
        local_138 = (ulong)uVar7;
        local_104 = uVar7 * uVar99;
        if (iVar94 == 2) {
          local_130 = (void *)CONCAT44(local_130._4_4_,uVar5);
          if (pMVar9[1].dims == 3) {
            Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_138 = 0;
                do {
                  if (0 < (int)local_130) {
                    pafVar104 = (__m256 *)
                                (local_120->cstep * local_138 * local_120->elemsize +
                                (long)local_120->data);
                    pafVar105 = (__m256 *)
                                (local_a0[1].cstep * local_138 * local_a0[1].elemsize +
                                (long)local_a0[1].data);
                    pafVar86 = (__m256 *)
                               ((long)local_a0->w * local_138 * local_a0->elemsize +
                               (long)local_a0->data);
                    iVar80 = 0;
                    do {
                      _local_100 = *pafVar86;
                      uVar101 = uVar100;
                      if (0 < (int)uVar100) {
                        do {
                          local_80 = *pafVar105;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *pafVar104 = local_80;
                          pafVar105 = pafVar105 + 1;
                          pafVar104 = pafVar104 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      pafVar86 = pafVar86 + 1;
                      iVar80 = iVar80 + 1;
                    } while (iVar80 != (int)local_130);
                  }
                  local_138 = local_138 + 1;
                } while (local_138 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = CONCAT44(uVar4,uVar101);
          Mat::create(this_00,uVar99,uVar7,local_60,iVar80,opt->blob_allocator);
          pMVar9 = local_a0;
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_a0[1].dims == 1) {
            Mat::create(this_00,(int)local_110,(int)local_138,local_60,iVar80,opt->blob_allocator);
            puVar103 = (undefined8 *)this_00->data;
            if (puVar103 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_128 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)local_138) {
                pafVar86 = (__m256 *)pMVar9->data;
                local_158 = (__m256 *)pMVar9[1].data;
                iVar80 = 0;
                do {
                  _local_100 = *local_158;
                  uVar82 = local_110 & 0xffffffff;
                  if (0 < (int)local_110) {
                    do {
                      uVar269 = *(undefined8 *)*pafVar86;
                      uVar268 = *(undefined8 *)(*pafVar86 + 2);
                      uVar271 = *(undefined8 *)(*pafVar86 + 4);
                      uVar272 = *(undefined8 *)(*pafVar86 + 6);
                      local_80 = *pafVar86;
                      binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                      *puVar103 = uVar269;
                      puVar103[1] = uVar268;
                      puVar103[2] = uVar271;
                      puVar103[3] = uVar272;
                      pafVar86 = pafVar86 + 1;
                      puVar103 = puVar103 + 4;
                      uVar101 = (int)uVar82 - 1;
                      uVar82 = (ulong)uVar101;
                    } while (uVar101 != 0);
                  }
                  local_158 = local_158 + 1;
                  iVar80 = iVar80 + 1;
                } while (iVar80 != (int)local_138);
                return 0;
              }
              return 0;
            }
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            uStack_f0._0_4_ = (float)local_100._4_4_;
            uStack_f0._4_4_ = (float)local_100._4_4_;
            fStack_e8 = (float)local_100._4_4_;
            fStack_e4 = (float)local_100._4_4_;
            if (0 < local_104) {
              pvVar12 = pMVar9->data;
              lVar95 = 0;
              iVar80 = local_104;
              do {
                pafVar86 = (__m256 *)((long)pvVar12 + lVar95);
                uVar269 = *(undefined8 *)*pafVar86;
                uVar268 = *(undefined8 *)(*pafVar86 + 2);
                uVar271 = *(undefined8 *)(*pafVar86 + 4);
                uVar272 = *(undefined8 *)(*pafVar86 + 6);
                local_80 = *pafVar86;
                binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                puVar3 = (undefined8 *)((long)puVar103 + lVar95);
                *puVar3 = uVar269;
                puVar3[1] = uVar268;
                puVar3[2] = uVar271;
                puVar3[3] = uVar272;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
          }
          else if (local_a0[1].dims == 2) {
            if (local_104 < 1) {
              return 0;
            }
            pvVar91 = local_a0->data;
            pvVar98 = local_a0[1].data;
            lVar95 = 0;
            iVar80 = local_104;
            do {
              _local_100 = *(__m256 *)((long)pvVar91 + lVar95);
              pafVar86 = (__m256 *)((long)pvVar98 + lVar95);
              uVar269 = *(undefined8 *)*pafVar86;
              uVar268 = *(undefined8 *)(*pafVar86 + 2);
              uVar271 = *(undefined8 *)(*pafVar86 + 4);
              uVar272 = *(undefined8 *)(*pafVar86 + 6);
              local_80 = *pafVar86;
              binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
              puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
              *puVar103 = uVar269;
              puVar103[1] = uVar268;
              puVar103[2] = uVar271;
              puVar103[3] = uVar272;
              lVar95 = lVar95 + 0x20;
              iVar80 = iVar80 + -1;
            } while (iVar80 != 0);
          }
        }
        else if (iVar94 == 3) {
          uVar8 = pMVar9->c;
          local_98 = (ulong)uVar8;
          if (pMVar9[1].dims == 3) {
            local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar100);
            if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
              Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)uVar8) {
                  local_150 = 0;
                  do {
                    pvVar12 = local_a0->data;
                    sVar106 = local_a0->elemsize;
                    sVar11 = local_a0->cstep;
                    pvVar91 = local_120->data;
                    sVar13 = local_120->elemsize;
                    sVar14 = local_120->cstep;
                    _local_100 = *(__m256 *)
                                  ((long)local_a0[1].data +
                                  local_a0[1].cstep * local_150 * local_a0[1].elemsize);
                    if (0 < local_104) {
                      lVar95 = 0;
                      iVar80 = local_104;
                      do {
                        pafVar86 = (__m256 *)((long)pvVar12 + lVar95 + sVar11 * sVar106 * local_150)
                        ;
                        uVar269 = *(undefined8 *)*pafVar86;
                        uVar268 = *(undefined8 *)(*pafVar86 + 2);
                        uVar271 = *(undefined8 *)(*pafVar86 + 4);
                        uVar272 = *(undefined8 *)(*pafVar86 + 6);
                        local_80 = *pafVar86;
                        binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                        puVar103 = (undefined8 *)
                                   ((long)pvVar91 + lVar95 + sVar14 * sVar13 * local_150);
                        *puVar103 = uVar269;
                        puVar103[1] = uVar268;
                        puVar103[2] = uVar271;
                        puVar103[3] = uVar272;
                        lVar95 = lVar95 + 0x20;
                        iVar80 = iVar80 + -1;
                      } while (iVar80 != 0);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_130 = (void *)CONCAT44(local_130._4_4_,uVar5);
            if (uVar100 == uVar99) {
              if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
                Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)uVar8) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < local_104) {
                        lVar95 = local_a0->cstep * local_a0->elemsize * (long)local_130;
                        pvVar12 = local_a0->data;
                        pvVar91 = local_a0[1].data;
                        lVar96 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar98 = local_120->data;
                        lVar108 = 0;
                        iVar80 = local_104;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar12 + lVar108 * 8 + lVar95);
                          fVar395 = *(float *)((long)pvVar91 + lVar108);
                          local_80[1] = fVar395;
                          local_80[0] = fVar395;
                          local_80[2] = fVar395;
                          local_80[3] = fVar395;
                          local_80[4] = fVar395;
                          local_80[5] = fVar395;
                          local_80[6] = fVar395;
                          local_80[7] = fVar395;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar98 + lVar108 * 8 + lVar96) = local_80;
                          lVar108 = lVar108 + 4;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              local_81 = uVar7 == 1;
              if ((uVar99 == 1 && local_81) && uVar6 == uVar8) {
LAB_002650d6:
                local_81 = uVar7 == 1;
                Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_150 = 0;
                    do {
                      pvVar12 = local_a0[1].data;
                      sVar106 = local_a0[1].cstep;
                      sVar11 = local_a0[1].elemsize;
                      pvVar91 = local_120->data;
                      sVar13 = local_120->elemsize;
                      sVar14 = local_120->cstep;
                      _local_100 = *(__m256 *)
                                    ((long)local_a0->data +
                                    local_a0->cstep * local_150 * local_a0->elemsize);
                      if (0 < (int)local_90) {
                        lVar95 = 0;
                        iVar80 = (int)local_90;
                        do {
                          pafVar86 = (__m256 *)
                                     ((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150);
                          uVar269 = *(undefined8 *)*pafVar86;
                          uVar268 = *(undefined8 *)(*pafVar86 + 2);
                          uVar271 = *(undefined8 *)(*pafVar86 + 4);
                          uVar272 = *(undefined8 *)(*pafVar86 + 6);
                          local_80 = *pafVar86;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          puVar103 = (undefined8 *)
                                     ((long)pvVar91 + lVar95 + sVar14 * sVar13 * local_150);
                          *puVar103 = uVar269;
                          puVar103[1] = uVar268;
                          puVar103[2] = uVar271;
                          puVar103[3] = uVar272;
                          lVar95 = lVar95 + 0x20;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
                Mat::create(this_00,uVar99,uVar7,uVar6,sVar106,uVar101,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < (int)local_90) {
                        lVar95 = local_a0[1].cstep * local_a0[1].elemsize * (long)local_130;
                        pvVar12 = local_a0[1].data;
                        pvVar91 = local_a0->data;
                        lVar96 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar98 = local_120->data;
                        lVar108 = 0;
                        iVar80 = (int)local_90;
                        do {
                          local_100._4_4_ = *(float *)((long)pvVar91 + lVar108);
                          local_100._0_4_ = local_100._4_4_;
                          fStack_f8 = (float)local_100._4_4_;
                          fStack_f4 = (float)local_100._4_4_;
                          uStack_f0._0_4_ = (float)local_100._4_4_;
                          uStack_f0._4_4_ = (float)local_100._4_4_;
                          fStack_e8 = (float)local_100._4_4_;
                          fStack_e4 = (float)local_100._4_4_;
                          local_80 = *(__m256 *)((long)pvVar12 + lVar108 * 8 + lVar95);
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar98 + lVar108 * 8 + lVar96) = local_80;
                          lVar108 = lVar108 + 4;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
            }
            else if ((uVar99 == 1 && uVar7 == 1) && uVar6 == uVar8) goto LAB_002650d6;
            local_81 = uVar7 == 1;
            local_128 = (ulong)uVar101;
            if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
              Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)uVar8) {
                  local_150 = 0;
                  do {
                    if (0 < (int)local_138) {
                      sVar106 = local_a0[1].cstep;
                      sVar11 = local_a0[1].elemsize;
                      pvVar12 = local_a0[1].data;
                      pafVar86 = (__m256 *)
                                 (local_120->cstep * local_150 * local_120->elemsize +
                                 (long)local_120->data);
                      pafVar105 = (__m256 *)
                                  (local_a0->cstep * local_150 * local_a0->elemsize +
                                  (long)local_a0->data);
                      uVar82 = 0;
                      do {
                        _local_100 = *(__m256 *)
                                      ((long)pvVar12 + uVar82 * 0x20 + sVar106 * local_150 * sVar11)
                        ;
                        uVar81 = local_110 & 0xffffffff;
                        if (0 < (int)local_110) {
                          do {
                            local_80 = *pafVar105;
                            binary_op_pow_pack8::operator()
                                      (&local_139,&local_80,(__m256 *)local_100);
                            *pafVar86 = local_80;
                            pafVar105 = pafVar105 + 1;
                            pafVar86 = pafVar86 + 1;
                            uVar101 = (int)uVar81 - 1;
                            uVar81 = (ulong)uVar101;
                          } while (uVar101 != 0);
                        }
                        uVar82 = uVar82 + 1;
                      } while (uVar82 != local_138);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar100 != uVar99 || (uVar5 ^ 1) != 0) || uVar8 != uVar6) || uVar7 == 1) {
              if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
                Mat::create(this_00,uVar100,uVar7,uVar8,sVar106,uVar101,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_98) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < (int)local_138) {
                        lVar95 = local_a0->cstep * (long)local_130;
                        sVar106 = local_a0->elemsize;
                        pvVar12 = local_a0->data;
                        pafVar86 = (__m256 *)
                                   (local_120->cstep * (long)local_130 * local_120->elemsize +
                                   (long)local_120->data);
                        pafVar105 = (__m256 *)
                                    (local_a0[1].cstep * (long)local_130 * local_a0[1].elemsize +
                                    (long)local_a0[1].data);
                        uVar82 = 0;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar12 + uVar82 * 0x20 + lVar95 * sVar106)
                          ;
                          uVar101 = uVar100;
                          if (0 < (int)uVar100) {
                            do {
                              local_80 = *pafVar105;
                              binary_op_pow_pack8::operator()
                                        (&local_139,(__m256 *)local_100,&local_80);
                              *pafVar86 = local_80;
                              pafVar105 = pafVar105 + 1;
                              pafVar86 = pafVar86 + 1;
                              uVar101 = uVar101 - 1;
                            } while (uVar101 != 0);
                          }
                          uVar82 = uVar82 + 1;
                        } while (uVar82 != local_138);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if ((local_81 && uVar6 == uVar8) && (uVar5 != 1 && uVar100 == uVar99)) {
                Mat::create(this_00,uVar99,uVar5,uVar8,sVar106,uVar101,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    lVar95 = local_110 << 5;
                    local_138 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar252 = _local_100;
                      bVar109 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      sVar106 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      sVar11 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])(sVar106 * local_138 * sVar11 + (long)pvVar12);
                      uStack_f0 = sVar11;
                      fStack_e4 = afVar252[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      pvVar91 = (void *)(pMVar1[1].cstep * local_138 * pMVar1[1].elemsize +
                                        (long)pMVar1[1].data);
                      local_d8 = bVar109 ^ 3;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])pvVar91;
                      uStack_f0 = pMVar1[1].elemsize;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_120->d;
                      }
                      sVar13 = local_120->elemsize;
                      pvVar98 = (void *)(local_120->cstep * local_138 * sVar13 +
                                        (long)local_120->data);
                      local_d8 = bVar109 ^ 3;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])pvVar98;
                      uStack_f0._0_4_ = (float)(int)sVar13;
                      uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      if (0 < (int)local_130) {
                        lVar96 = sVar106 * sVar11 * local_138;
                        iVar94 = 0;
                        uVar82 = local_110;
                        iVar80 = (int)local_130;
                        do {
                          if (0 < (int)uVar82) {
                            lVar108 = 0;
                            do {
                              _local_100 = *(__m256 *)((long)pvVar12 + lVar108 + lVar96);
                              local_80 = *(__m256 *)((long)pvVar91 + lVar108);
                              afVar252 = local_80;
                              binary_op_pow_pack8::operator()
                                        (&local_139,(__m256 *)local_100,&local_80);
                              *(__m256 *)((long)pvVar98 + lVar108) = afVar252;
                              lVar108 = lVar108 + 0x20;
                            } while (lVar95 != lVar108);
                            pvVar98 = (void *)((long)pvVar98 + lVar108);
                            pvVar91 = (void *)((long)pvVar91 + lVar108);
                            uVar82 = local_110;
                            iVar80 = (int)local_130;
                          }
                          iVar94 = iVar94 + 1;
                        } while (iVar94 != iVar80);
                      }
                      local_138 = local_138 + 1;
                    } while (local_138 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              else {
                Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    local_150 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar252 = _local_100;
                      bVar109 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      local_138 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      local_110 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_138 * local_150 * local_110 + (long)pvVar12);
                      uStack_f0 = local_110;
                      fStack_e4 = afVar252[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      local_128 = pMVar1[1].cstep;
                      local_130 = pMVar1[1].data;
                      local_90 = pMVar1[1].elemsize;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_128 * local_150 * local_90 + (long)local_130);
                      uStack_f0 = local_90;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_120->d;
                      }
                      sVar106 = local_120->cstep;
                      pvVar91 = local_120->data;
                      sVar11 = local_120->elemsize;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])(sVar106 * local_150 * sVar11 + (long)pvVar91);
                      uStack_f0._0_4_ = (float)(int)sVar11;
                      uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      pvVar98 = local_130;
                      if (0 < local_104) {
                        lVar95 = local_128 * local_90;
                        lVar96 = local_138 * local_110;
                        lVar108 = 0;
                        iVar80 = local_104;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar12 + lVar108 + lVar96 * local_150);
                          local_80 = *(__m256 *)((long)pvVar98 + lVar108 + lVar95 * local_150);
                          afVar252 = local_80;
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar91 + lVar108 + sVar106 * sVar11 * local_150) =
                               afVar252;
                          lVar108 = lVar108 + 0x20;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              return -100;
            }
            Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_98) {
                lVar95 = local_110 << 5;
                local_150 = 0;
                do {
                  if (0 < (int)local_138) {
                    sVar106 = local_a0[1].elemsize;
                    pvVar98 = (void *)(local_120->cstep * local_150 * local_120->elemsize +
                                      (long)local_120->data);
                    pvVar91 = (void *)(local_a0->cstep * local_150 * local_a0->elemsize +
                                      (long)local_a0->data);
                    sVar11 = local_a0[1].cstep;
                    pvVar12 = local_a0[1].data;
                    iVar80 = 0;
                    uVar82 = local_110;
                    do {
                      if (0 < (int)uVar82) {
                        lVar96 = 0;
                        do {
                          _local_100 = *(__m256 *)((long)pvVar91 + lVar96);
                          local_80 = *(__m256 *)
                                      ((long)pvVar12 + lVar96 + sVar106 * sVar11 * local_150);
                          binary_op_pow_pack8::operator()(&local_139,(__m256 *)local_100,&local_80);
                          *(__m256 *)((long)pvVar98 + lVar96) = local_80;
                          lVar96 = lVar96 + 0x20;
                        } while (lVar95 != lVar96);
                        pvVar98 = (void *)((long)pvVar98 + lVar96);
                        pvVar91 = (void *)((long)pvVar91 + lVar96);
                        uVar82 = local_110;
                      }
                      iVar80 = iVar80 + 1;
                    } while (iVar80 != (int)local_138);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
          if (local_120->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep == 0) {
            return -100;
          }
          if (local_a0[1].dims == 1) {
            if (uVar101 != 1 || local_a0[1].w != 1) {
              if (0 < (int)uVar8) {
                local_150 = 0;
                do {
                  pvVar12 = local_a0->data;
                  sVar106 = local_a0->elemsize;
                  sVar11 = local_a0->cstep;
                  _local_100 = *(__m256 *)((long)local_a0[1].data + local_150 * 0x20);
                  if (0 < local_104) {
                    sVar13 = local_120->cstep;
                    sVar14 = local_120->elemsize;
                    pvVar91 = local_120->data;
                    lVar95 = 0;
                    iVar80 = local_104;
                    do {
                      pafVar86 = (__m256 *)((long)pvVar12 + lVar95 + sVar11 * sVar106 * local_150);
                      uVar269 = *(undefined8 *)*pafVar86;
                      uVar268 = *(undefined8 *)(*pafVar86 + 2);
                      uVar271 = *(undefined8 *)(*pafVar86 + 4);
                      uVar272 = *(undefined8 *)(*pafVar86 + 6);
                      local_80 = *pafVar86;
                      binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                      puVar103 = (undefined8 *)
                                 ((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                      *puVar103 = uVar269;
                      puVar103[1] = uVar268;
                      puVar103[2] = uVar271;
                      puVar103[3] = uVar272;
                      lVar95 = lVar95 + 0x20;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            fVar395 = *pMVar1->data;
            local_100._4_4_ = fVar395;
            local_100._0_4_ = fVar395;
            fStack_f8 = fVar395;
            fStack_f4 = fVar395;
            uStack_f0._0_4_ = fVar395;
            uStack_f0._4_4_ = fVar395;
            fStack_e8 = fVar395;
            fStack_e4 = fVar395;
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < local_104) {
                  sVar106 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0->cstep;
                  sVar14 = local_a0->elemsize;
                  pvVar91 = local_a0->data;
                  lVar95 = 0;
                  iVar80 = local_104;
                  do {
                    local_80 = *(__m256 *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                    binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                    *(__m256 *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150) = local_80;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
            }
          }
          else if (local_a0[1].dims == 2) {
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < (int)local_138) {
                  pafVar104 = (__m256 *)
                              (local_120->cstep * local_150 * local_120->elemsize +
                              (long)local_120->data);
                  pafVar86 = (__m256 *)
                             ((long)local_a0[1].w * local_150 * local_a0[1].elemsize +
                             (long)local_a0[1].data);
                  pafVar105 = (__m256 *)
                              (local_a0->cstep * local_150 * local_a0->elemsize +
                              (long)local_a0->data);
                  iVar80 = 0;
                  do {
                    _local_100 = *pafVar86;
                    uVar82 = local_110 & 0xffffffff;
                    if (0 < (int)local_110) {
                      do {
                        local_80 = *pafVar105;
                        binary_op_pow_pack8::operator()(&local_139,&local_80,(__m256 *)local_100);
                        *pafVar104 = local_80;
                        pafVar105 = pafVar105 + 1;
                        pafVar104 = pafVar104 + 1;
                        uVar101 = (int)uVar82 - 1;
                        uVar82 = (ulong)uVar101;
                      } while (uVar101 != 0);
                    }
                    pafVar86 = pafVar86 + 1;
                    iVar80 = iVar80 + 1;
                  } while (iVar80 != (int)local_138);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
              return 0;
            }
            return 0;
          }
        }
      }
      return 0;
    case 7:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar98 + lVar95),
                                        *(undefined1 (*) [32])((long)pvVar91 + lVar95));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar217._4_4_ = uVar4;
              auVar217._0_4_ = uVar4;
              auVar217._8_4_ = uVar4;
              auVar217._12_4_ = uVar4;
              auVar217._16_4_ = uVar4;
              auVar217._20_4_ = uVar4;
              auVar217._24_4_ = uVar4;
              auVar217._28_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar225 = vsubps_avx(auVar217,*(undefined1 (*) [32])((long)pvVar91 + lVar95));
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    uVar99 = uVar100;
                    do {
                      auVar222 = vsubps_avx(*pauVar87,auVar225);
                      *pauVar84 = auVar222;
                      pauVar87 = pauVar87 + 1;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar222 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),
                                        auVar225);
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar216._4_4_ = uVar4;
              auVar216._0_4_ = uVar4;
              auVar216._8_4_ = uVar4;
              auVar216._12_4_ = uVar4;
              auVar216._16_4_ = uVar4;
              auVar216._20_4_ = uVar4;
              auVar216._24_4_ = uVar4;
              auVar216._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),auVar216);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar213._4_4_ = uVar4;
              auVar213._0_4_ = uVar4;
              auVar213._8_4_ = uVar4;
              auVar213._12_4_ = uVar4;
              auVar213._16_4_ = uVar4;
              auVar213._20_4_ = uVar4;
              auVar213._24_4_ = uVar4;
              auVar213._28_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),auVar213);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          uVar4 = *pMVar9->data;
          auVar198._4_4_ = uVar4;
          auVar198._0_4_ = uVar4;
          auVar198._8_4_ = uVar4;
          auVar198._12_4_ = uVar4;
          auVar198._16_4_ = uVar4;
          auVar198._20_4_ = uVar4;
          auVar198._24_4_ = uVar4;
          auVar198._28_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                       ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),auVar198)
                ;
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar225;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar89 = (undefined1 (*) [32])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar87 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar87;
                      uVar99 = uVar100;
                      do {
                        auVar222 = vsubps_avx(*pauVar89,auVar225);
                        *pauVar84 = auVar222;
                        pauVar89 = pauVar89 + 1;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar98 + lVar95),
                                    *(undefined1 (*) [32])((long)pvVar91 + lVar95));
              *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar89 = (undefined1 (*) [32])pMVar9->data;
              pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar87;
                  uVar81 = uVar82;
                  do {
                    auVar222 = vsubps_avx(auVar225,*pauVar89);
                    *pauVar84 = auVar222;
                    pauVar89 = pauVar89 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            uVar4 = *pMVar1->data;
            auVar228._4_4_ = uVar4;
            auVar228._0_4_ = uVar4;
            auVar228._8_4_ = uVar4;
            auVar228._12_4_ = uVar4;
            auVar228._16_4_ = uVar4;
            auVar228._20_4_ = uVar4;
            auVar228._24_4_ = uVar4;
            auVar228._28_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar225 = vsubps_avx(auVar228,*(undefined1 (*) [32])((long)pvVar12 + lVar95));
              *(undefined1 (*) [32])((long)*pauVar84 + lVar95) = auVar225;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar222 = vsubps_avx(auVar225,*(undefined1 (*) [32])
                                                    ((long)pvVar91 +
                                                    lVar95 + sVar13 * sVar14 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar222;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar230._4_4_ = uVar4;
            auVar230._0_4_ = uVar4;
            auVar230._8_4_ = uVar4;
            auVar230._12_4_ = uVar4;
            auVar230._16_4_ = uVar4;
            auVar230._20_4_ = uVar4;
            auVar230._24_4_ = uVar4;
            auVar230._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar225 = vsubps_avx(auVar230,*(undefined1 (*) [32])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar225;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar87 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  do {
                    auVar222 = vsubps_avx(auVar225,*pauVar87);
                    *pauVar84 = auVar222;
                    pauVar87 = pauVar87 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_138;
                do {
                  auVar222 = vsubps_avx(auVar225,*(undefined1 (*) [32])
                                                  ((long)pvVar12 +
                                                  lVar95 + sVar106 * sVar11 * uVar82));
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar222;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar205._4_4_ = uVar4;
                    auVar205._0_4_ = uVar4;
                    auVar205._8_4_ = uVar4;
                    auVar205._12_4_ = uVar4;
                    auVar205._16_4_ = uVar4;
                    auVar205._20_4_ = uVar4;
                    auVar205._24_4_ = uVar4;
                    auVar205._28_4_ = uVar4;
                    auVar225 = vsubps_avx(auVar205,*(undefined1 (*) [32])
                                                    ((long)pvVar12 +
                                                    lVar95 * 8 + sVar106 * sVar11 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar225;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar244._4_4_ = uVar4;
                      auVar244._0_4_ = uVar4;
                      auVar244._8_4_ = uVar4;
                      auVar244._12_4_ = uVar4;
                      auVar244._16_4_ = uVar4;
                      auVar244._20_4_ = uVar4;
                      auVar244._24_4_ = uVar4;
                      auVar244._28_4_ = uVar4;
                      auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                             ((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82
                                             ),auVar244);
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar225;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00260b78:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar222 = vsubps_avx(auVar225,*pauVar89);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ),*(undefined1 (*) [32])((long)pvVar98 + lVar95));
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar222 = vsubps_avx(*pauVar89,auVar225);
                          *pauVar84 = auVar222;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar225 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar91 + lVar95),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar12 +
                                                 lVar95 + (long)local_130 * local_138 *
                                                          (long)local_158));
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar225;
                          lVar95 = lVar95 + 0x20;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar91 +
                                           lVar95 + local_110 * local_128 * (long)local_158),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * (long)local_130 * (long)local_158));
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar225;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00260b78;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              sVar11 = pMVar9[1].elemsize;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar222 = vsubps_avx(*(undefined1 (*) [32])
                                       ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82),auVar225
                                     );
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar222
                ;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_130 = (void *)(ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                  auVar203 = vrcpps_avx(auVar225);
                  auVar222 = *(undefined1 (*) [32])((long)pvVar98 + lVar95);
                  auVar417._0_4_ = auVar222._0_4_ * auVar203._0_4_;
                  auVar417._4_4_ = auVar222._4_4_ * auVar203._4_4_;
                  auVar417._8_4_ = auVar222._8_4_ * auVar203._8_4_;
                  auVar417._12_4_ = auVar222._12_4_ * auVar203._12_4_;
                  auVar417._16_4_ = auVar222._16_4_ * auVar203._16_4_;
                  auVar417._20_4_ = auVar222._20_4_ * auVar203._20_4_;
                  auVar417._28_36_ = in_ZMM3._28_36_;
                  auVar417._24_4_ = auVar222._24_4_ * auVar203._24_4_;
                  auVar51._4_4_ = auVar225._4_4_ * auVar417._4_4_;
                  auVar51._0_4_ = auVar225._0_4_ * auVar417._0_4_;
                  auVar51._8_4_ = auVar225._8_4_ * auVar417._8_4_;
                  auVar51._12_4_ = auVar225._12_4_ * auVar417._12_4_;
                  auVar51._16_4_ = auVar225._16_4_ * auVar417._16_4_;
                  auVar51._20_4_ = auVar225._20_4_ * auVar417._20_4_;
                  auVar51._24_4_ = auVar225._24_4_ * auVar417._24_4_;
                  auVar51._28_4_ = auVar225._28_4_;
                  auVar225 = vsubps_avx(auVar222,auVar51);
                  pfVar92 = (float *)((long)pvVar12 + lVar95);
                  *pfVar92 = auVar417._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                  pfVar92[1] = auVar417._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                  pfVar92[2] = auVar417._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                  pfVar92[3] = auVar417._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                  pfVar92[4] = auVar417._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                  pfVar92[5] = auVar417._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                  pfVar92[6] = auVar417._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                  pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
                  lVar95 = lVar95 + 0x20;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                  in_ZMM3 = ZEXT3264(auVar417._0_32_);
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              fVar395 = *pMVar1->data;
              auVar225._4_4_ = fVar395;
              auVar225._0_4_ = fVar395;
              auVar225._8_4_ = fVar395;
              auVar225._12_4_ = fVar395;
              auVar225._16_4_ = fVar395;
              auVar225._20_4_ = fVar395;
              auVar225._24_4_ = fVar395;
              auVar225._28_4_ = fVar395;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar222 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                auVar203 = vrcpps_avx(auVar222);
                auVar407._0_4_ = fVar395 * auVar203._0_4_;
                auVar407._4_4_ = fVar395 * auVar203._4_4_;
                auVar407._8_4_ = fVar395 * auVar203._8_4_;
                auVar407._12_4_ = fVar395 * auVar203._12_4_;
                auVar407._16_4_ = fVar395 * auVar203._16_4_;
                auVar407._20_4_ = fVar395 * auVar203._20_4_;
                auVar407._28_36_ = in_ZMM3._28_36_;
                auVar407._24_4_ = fVar395 * auVar203._24_4_;
                auVar36._4_4_ = auVar222._4_4_ * auVar407._4_4_;
                auVar36._0_4_ = auVar222._0_4_ * auVar407._0_4_;
                auVar36._8_4_ = auVar222._8_4_ * auVar407._8_4_;
                auVar36._12_4_ = auVar222._12_4_ * auVar407._12_4_;
                auVar36._16_4_ = auVar222._16_4_ * auVar407._16_4_;
                auVar36._20_4_ = auVar222._20_4_ * auVar407._20_4_;
                auVar36._24_4_ = auVar222._24_4_ * auVar407._24_4_;
                auVar36._28_4_ = auVar222._28_4_;
                auVar222 = vsubps_avx(auVar225,auVar36);
                pfVar92 = (float *)((long)pvVar12 + lVar95);
                *pfVar92 = auVar407._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                pfVar92[1] = auVar407._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                pfVar92[2] = auVar407._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                pfVar92[3] = auVar407._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                pfVar92[4] = auVar407._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                pfVar92[5] = auVar407._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                pfVar92[6] = auVar407._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                pfVar92[7] = in_ZMM3._28_4_ + auVar222._28_4_;
                lVar95 = lVar95 + 0x20;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
                in_ZMM3 = ZEXT3264(auVar407._0_32_);
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar84 = (undefined1 (*) [32])this_00->data;
            if (pauVar84 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar89 = (undefined1 (*) [32])pMVar9->data;
                pfVar92 = (float *)pMVar9[1].data;
                uVar101 = 0;
                auVar222._8_4_ = 0x3f800000;
                auVar222._0_8_ = 0x3f8000003f800000;
                auVar222._12_4_ = 0x3f800000;
                auVar222._16_4_ = 0x3f800000;
                auVar222._20_4_ = 0x3f800000;
                auVar222._24_4_ = 0x3f800000;
                auVar222._28_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar100) {
                    auVar225 = *pauVar89;
                    auVar203 = vrcpps_avx(auVar225);
                    fVar395 = auVar203._0_4_;
                    fVar424 = auVar203._4_4_;
                    auVar35._4_4_ = auVar225._4_4_ * fVar424;
                    auVar35._0_4_ = auVar225._0_4_ * fVar395;
                    fVar425 = auVar203._8_4_;
                    auVar35._8_4_ = auVar225._8_4_ * fVar425;
                    fVar426 = auVar203._12_4_;
                    auVar35._12_4_ = auVar225._12_4_ * fVar426;
                    fVar427 = auVar203._16_4_;
                    auVar35._16_4_ = auVar225._16_4_ * fVar427;
                    fVar15 = auVar203._20_4_;
                    auVar35._20_4_ = auVar225._20_4_ * fVar15;
                    fVar16 = auVar203._24_4_;
                    auVar35._24_4_ = auVar225._24_4_ * fVar16;
                    auVar35._28_4_ = auVar225._28_4_;
                    auVar225 = vsubps_avx(auVar222,auVar35);
                    uVar99 = uVar100;
                    do {
                      auVar67._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                      auVar67._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                      auVar67._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                      auVar67._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                      auVar67._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                      auVar67._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                      auVar67._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                      auVar67._28_4_ = auVar203._28_4_;
                      *pauVar84 = auVar67;
                      pfVar92 = pfVar92 + 8;
                      pauVar84 = pauVar84 + 1;
                      uVar99 = uVar99 - 1;
                      auVar203 = auVar67;
                    } while (uVar99 != 0);
                  }
                  pauVar89 = pauVar89 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_130) {
            uVar82 = 0;
            auVar203._8_4_ = 0x3f800000;
            auVar203._0_8_ = 0x3f8000003f800000;
            auVar203._12_4_ = 0x3f800000;
            auVar203._16_4_ = 0x3f800000;
            auVar203._20_4_ = 0x3f800000;
            auVar203._24_4_ = 0x3f800000;
            auVar203._28_4_ = 0x3f800000;
            do {
              if (0 < iVar107) {
                sVar106 = pMVar9[1].cstep;
                auVar225 = *(undefined1 (*) [32])((long)pMVar9->data + uVar82 * 0x20);
                auVar222 = vrcpps_avx(auVar225);
                fVar395 = auVar222._0_4_;
                fVar424 = auVar222._4_4_;
                auVar26._4_4_ = auVar225._4_4_ * fVar424;
                auVar26._0_4_ = auVar225._0_4_ * fVar395;
                fVar425 = auVar222._8_4_;
                auVar26._8_4_ = auVar225._8_4_ * fVar425;
                fVar426 = auVar222._12_4_;
                auVar26._12_4_ = auVar225._12_4_ * fVar426;
                fVar427 = auVar222._16_4_;
                auVar26._16_4_ = auVar225._16_4_ * fVar427;
                fVar15 = auVar222._20_4_;
                auVar26._20_4_ = auVar225._20_4_ * fVar15;
                fVar16 = auVar222._24_4_;
                auVar26._24_4_ = auVar225._24_4_ * fVar16;
                auVar26._28_4_ = auVar225._28_4_;
                auVar225 = vsubps_avx(auVar203,auVar26);
                sVar11 = this_00->cstep;
                sVar13 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar106 * sVar14 * uVar82);
                  auVar65._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                  auVar65._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                  auVar65._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                  auVar65._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                  auVar65._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                  auVar65._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                  auVar65._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                  auVar65._28_4_ = auVar222._28_4_;
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar11 * sVar13 * uVar82) =
                       auVar65;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                  auVar222 = auVar65;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while ((void *)uVar82 != local_130);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              auVar132._0_4_ = 1.0 / *pMVar9->data;
              auVar132._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar132 = vshufps_avx(auVar132,auVar132,0);
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                auVar384._0_4_ = auVar132._0_4_ * *pfVar92;
                auVar384._4_4_ = auVar132._4_4_ * pfVar92[1];
                auVar384._8_4_ = auVar132._8_4_ * pfVar92[2];
                auVar384._12_4_ = auVar132._12_4_ * pfVar92[3];
                auVar384._16_4_ = auVar132._0_4_ * pfVar92[4];
                auVar384._20_4_ = auVar132._4_4_ * pfVar92[5];
                auVar384._28_36_ = in_ZMM1._28_36_;
                auVar384._24_4_ = auVar132._8_4_ * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar384._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar384._0_32_;
                lVar95 = lVar95 + 0x20;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              auVar131._0_4_ = 1.0 / *pMVar9->data;
              auVar131._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar132 = vshufps_avx(auVar131,auVar131,0);
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                auVar383._0_4_ = auVar132._0_4_ * *pfVar92;
                auVar383._4_4_ = auVar132._4_4_ * pfVar92[1];
                auVar383._8_4_ = auVar132._8_4_ * pfVar92[2];
                auVar383._12_4_ = auVar132._12_4_ * pfVar92[3];
                auVar383._16_4_ = auVar132._0_4_ * pfVar92[4];
                auVar383._20_4_ = auVar132._4_4_ * pfVar92[5];
                auVar383._28_36_ = in_ZMM1._28_36_;
                auVar383._24_4_ = auVar132._8_4_ * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar383._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95) = auVar383._0_32_;
                lVar95 = lVar95 + 0x20;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_130) {
          auVar111._0_4_ = 1.0 / *pMVar9->data;
          auVar111._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar132 = vshufps_avx(auVar111,auVar111,0);
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar374._0_4_ = auVar132._0_4_ * *pfVar92;
                auVar374._4_4_ = auVar132._4_4_ * pfVar92[1];
                auVar374._8_4_ = auVar132._8_4_ * pfVar92[2];
                auVar374._12_4_ = auVar132._12_4_ * pfVar92[3];
                auVar374._16_4_ = auVar132._0_4_ * pfVar92[4];
                auVar374._20_4_ = auVar132._4_4_ * pfVar92[5];
                auVar374._28_36_ = in_ZMM1._28_36_;
                auVar374._24_4_ = auVar132._8_4_ * pfVar92[6];
                in_ZMM1 = ZEXT3264(auVar374._0_32_);
                *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar374._0_32_;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_138 = CONCAT44(local_138._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_130) {
              uVar82 = 0;
              auVar200._8_4_ = 0x3f800000;
              auVar200._0_8_ = 0x3f8000003f800000;
              auVar200._12_4_ = 0x3f800000;
              auVar200._16_4_ = 0x3f800000;
              auVar200._20_4_ = 0x3f800000;
              auVar200._24_4_ = 0x3f800000;
              auVar200._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar5) {
                  pauVar84 = (undefined1 (*) [32])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar89 = (undefined1 (*) [32])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar225 = *pauVar89;
                      auVar222 = vrcpps_avx(auVar225);
                      fVar395 = auVar222._0_4_;
                      fVar424 = auVar222._4_4_;
                      auVar21._4_4_ = auVar225._4_4_ * fVar424;
                      auVar21._0_4_ = auVar225._0_4_ * fVar395;
                      fVar425 = auVar222._8_4_;
                      auVar21._8_4_ = auVar225._8_4_ * fVar425;
                      fVar426 = auVar222._12_4_;
                      auVar21._12_4_ = auVar225._12_4_ * fVar426;
                      fVar427 = auVar222._16_4_;
                      auVar21._16_4_ = auVar225._16_4_ * fVar427;
                      fVar15 = auVar222._20_4_;
                      auVar21._20_4_ = auVar225._20_4_ * fVar15;
                      fVar16 = auVar222._24_4_;
                      auVar21._24_4_ = auVar225._24_4_ * fVar16;
                      auVar21._28_4_ = auVar225._28_4_;
                      auVar225 = vsubps_avx(auVar200,auVar21);
                      uVar99 = uVar100;
                      do {
                        auVar63._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                        auVar63._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                        auVar63._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                        auVar63._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                        auVar63._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                        auVar63._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                        auVar63._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                        auVar63._28_4_ = auVar222._28_4_;
                        *pauVar84 = auVar63;
                        pfVar92 = pfVar92 + 8;
                        pauVar84 = pauVar84 + 1;
                        uVar99 = uVar99 - 1;
                        auVar222 = auVar63;
                      } while (uVar99 != 0);
                    }
                    pauVar89 = pauVar89 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while ((void *)uVar82 != local_130);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_138) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar225 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
              auVar203 = vrcpps_avx(auVar225);
              auVar222 = *(undefined1 (*) [32])((long)pvVar98 + lVar95);
              auVar401._0_4_ = auVar222._0_4_ * auVar203._0_4_;
              auVar401._4_4_ = auVar222._4_4_ * auVar203._4_4_;
              auVar401._8_4_ = auVar222._8_4_ * auVar203._8_4_;
              auVar401._12_4_ = auVar222._12_4_ * auVar203._12_4_;
              auVar401._16_4_ = auVar222._16_4_ * auVar203._16_4_;
              auVar401._20_4_ = auVar222._20_4_ * auVar203._20_4_;
              auVar401._28_36_ = in_ZMM3._28_36_;
              auVar401._24_4_ = auVar222._24_4_ * auVar203._24_4_;
              auVar25._4_4_ = auVar225._4_4_ * auVar401._4_4_;
              auVar25._0_4_ = auVar225._0_4_ * auVar401._0_4_;
              auVar25._8_4_ = auVar225._8_4_ * auVar401._8_4_;
              auVar25._12_4_ = auVar225._12_4_ * auVar401._12_4_;
              auVar25._16_4_ = auVar225._16_4_ * auVar401._16_4_;
              auVar25._20_4_ = auVar225._20_4_ * auVar401._20_4_;
              auVar25._24_4_ = auVar225._24_4_ * auVar401._24_4_;
              auVar25._28_4_ = auVar225._28_4_;
              auVar225 = vsubps_avx(auVar222,auVar25);
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              *pfVar92 = auVar401._0_4_ + auVar203._0_4_ * auVar225._0_4_;
              pfVar92[1] = auVar401._4_4_ + auVar203._4_4_ * auVar225._4_4_;
              pfVar92[2] = auVar401._8_4_ + auVar203._8_4_ * auVar225._8_4_;
              pfVar92[3] = auVar401._12_4_ + auVar203._12_4_ * auVar225._12_4_;
              pfVar92[4] = auVar401._16_4_ + auVar203._16_4_ * auVar225._16_4_;
              pfVar92[5] = auVar401._20_4_ + auVar203._20_4_ * auVar225._20_4_;
              pfVar92[6] = auVar401._24_4_ + auVar203._24_4_ * auVar225._24_4_;
              pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
              in_ZMM3 = ZEXT3264(auVar401._0_32_);
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar84 = (undefined1 (*) [32])this_00->data;
        if (pauVar84 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar89 = (undefined1 (*) [32])pMVar9->data;
              pauVar87 = (undefined1 (*) [32])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar87;
                  uVar81 = uVar82;
                  auVar417 = in_ZMM3;
                  do {
                    auVar222 = *pauVar89;
                    auVar203 = vrcpps_avx(auVar222);
                    auVar419._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                    auVar419._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                    auVar419._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                    auVar419._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                    auVar419._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                    auVar419._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                    auVar419._28_36_ = auVar417._28_36_;
                    auVar419._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                    in_ZMM3 = ZEXT3264(auVar419._0_32_);
                    auVar55._4_4_ = auVar222._4_4_ * auVar419._4_4_;
                    auVar55._0_4_ = auVar222._0_4_ * auVar419._0_4_;
                    auVar55._8_4_ = auVar222._8_4_ * auVar419._8_4_;
                    auVar55._12_4_ = auVar222._12_4_ * auVar419._12_4_;
                    auVar55._16_4_ = auVar222._16_4_ * auVar419._16_4_;
                    auVar55._20_4_ = auVar222._20_4_ * auVar419._20_4_;
                    auVar55._24_4_ = auVar222._24_4_ * auVar419._24_4_;
                    auVar55._28_4_ = auVar222._28_4_;
                    auVar222 = vsubps_avx(auVar225,auVar55);
                    auVar370._0_4_ = auVar419._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                    auVar370._4_4_ = auVar419._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                    auVar370._8_4_ = auVar419._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                    auVar370._12_4_ = auVar419._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                    auVar370._16_4_ = auVar419._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                    auVar370._20_4_ = auVar419._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                    auVar370._24_4_ = auVar419._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                    auVar370._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                    *pauVar84 = auVar370;
                    pauVar89 = pauVar89 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                    auVar417 = in_ZMM3;
                  } while (uVar100 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_138) {
            fVar395 = *pMVar1->data;
            auVar233._4_4_ = fVar395;
            auVar233._0_4_ = fVar395;
            auVar233._8_4_ = fVar395;
            auVar233._12_4_ = fVar395;
            auVar233._16_4_ = fVar395;
            auVar233._20_4_ = fVar395;
            auVar233._24_4_ = fVar395;
            auVar233._28_4_ = fVar395;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar225 = *(undefined1 (*) [32])((long)pvVar12 + lVar95);
              auVar222 = vrcpps_avx(auVar225);
              auVar409._0_4_ = fVar395 * auVar222._0_4_;
              auVar409._4_4_ = fVar395 * auVar222._4_4_;
              auVar409._8_4_ = fVar395 * auVar222._8_4_;
              auVar409._12_4_ = fVar395 * auVar222._12_4_;
              auVar409._16_4_ = fVar395 * auVar222._16_4_;
              auVar409._20_4_ = fVar395 * auVar222._20_4_;
              auVar409._28_36_ = in_ZMM3._28_36_;
              auVar409._24_4_ = fVar395 * auVar222._24_4_;
              auVar38._4_4_ = auVar225._4_4_ * auVar409._4_4_;
              auVar38._0_4_ = auVar225._0_4_ * auVar409._0_4_;
              auVar38._8_4_ = auVar225._8_4_ * auVar409._8_4_;
              auVar38._12_4_ = auVar225._12_4_ * auVar409._12_4_;
              auVar38._16_4_ = auVar225._16_4_ * auVar409._16_4_;
              auVar38._20_4_ = auVar225._20_4_ * auVar409._20_4_;
              auVar38._24_4_ = auVar225._24_4_ * auVar409._24_4_;
              auVar38._28_4_ = auVar225._28_4_;
              auVar225 = vsubps_avx(auVar233,auVar38);
              pfVar92 = (float *)((long)*pauVar84 + lVar95);
              *pfVar92 = auVar409._0_4_ + auVar222._0_4_ * auVar225._0_4_;
              pfVar92[1] = auVar409._4_4_ + auVar222._4_4_ * auVar225._4_4_;
              pfVar92[2] = auVar409._8_4_ + auVar222._8_4_ * auVar225._8_4_;
              pfVar92[3] = auVar409._12_4_ + auVar222._12_4_ * auVar225._12_4_;
              pfVar92[4] = auVar409._16_4_ + auVar222._16_4_ * auVar225._16_4_;
              pfVar92[5] = auVar409._20_4_ + auVar222._20_4_ * auVar225._20_4_;
              pfVar92[6] = auVar409._24_4_ + auVar222._24_4_ * auVar225._24_4_;
              pfVar92[7] = in_ZMM3._28_4_ + auVar225._28_4_;
              lVar95 = lVar95 + 0x20;
              local_138._0_4_ = (int)local_138 + -1;
              in_ZMM3 = ZEXT3264(auVar409._0_32_);
            } while ((int)local_138 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar225 = *(undefined1 (*) [32])((long)pMVar1->data + uVar82 * 0x20);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  auVar417 = in_ZMM3;
                  iVar80 = (int)local_138;
                  do {
                    auVar222 = *(undefined1 (*) [32])
                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                    auVar203 = vrcpps_avx(auVar222);
                    auVar414._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                    auVar414._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                    auVar414._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                    auVar414._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                    auVar414._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                    auVar414._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                    auVar414._28_36_ = auVar417._28_36_;
                    auVar414._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                    in_ZMM3 = ZEXT3264(auVar414._0_32_);
                    auVar46._4_4_ = auVar222._4_4_ * auVar414._4_4_;
                    auVar46._0_4_ = auVar222._0_4_ * auVar414._0_4_;
                    auVar46._8_4_ = auVar222._8_4_ * auVar414._8_4_;
                    auVar46._12_4_ = auVar222._12_4_ * auVar414._12_4_;
                    auVar46._16_4_ = auVar222._16_4_ * auVar414._16_4_;
                    auVar46._20_4_ = auVar222._20_4_ * auVar414._20_4_;
                    auVar46._24_4_ = auVar222._24_4_ * auVar414._24_4_;
                    auVar46._28_4_ = auVar222._28_4_;
                    auVar222 = vsubps_avx(auVar225,auVar46);
                    auVar366._0_4_ = auVar414._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                    auVar366._4_4_ = auVar414._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                    auVar366._8_4_ = auVar414._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                    auVar366._12_4_ = auVar414._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                    auVar366._16_4_ = auVar414._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                    auVar366._20_4_ = auVar414._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                    auVar366._24_4_ = auVar414._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                    auVar366._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                    *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar366;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                    auVar417 = in_ZMM3;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar395 = *pMVar1->data;
            auVar235._4_4_ = fVar395;
            auVar235._0_4_ = fVar395;
            auVar235._8_4_ = fVar395;
            auVar235._12_4_ = fVar395;
            auVar235._16_4_ = fVar395;
            auVar235._20_4_ = fVar395;
            auVar235._24_4_ = fVar395;
            auVar235._28_4_ = fVar395;
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                auVar417 = in_ZMM3;
                iVar80 = (int)local_138;
                do {
                  auVar225 = *(undefined1 (*) [32])
                              ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar222 = vrcpps_avx(auVar225);
                  auVar410._0_4_ = fVar395 * auVar222._0_4_;
                  auVar410._4_4_ = fVar395 * auVar222._4_4_;
                  auVar410._8_4_ = fVar395 * auVar222._8_4_;
                  auVar410._12_4_ = fVar395 * auVar222._12_4_;
                  auVar410._16_4_ = fVar395 * auVar222._16_4_;
                  auVar410._20_4_ = fVar395 * auVar222._20_4_;
                  auVar410._28_36_ = auVar417._28_36_;
                  auVar410._24_4_ = fVar395 * auVar222._24_4_;
                  in_ZMM3 = ZEXT3264(auVar410._0_32_);
                  auVar39._4_4_ = auVar225._4_4_ * auVar410._4_4_;
                  auVar39._0_4_ = auVar225._0_4_ * auVar410._0_4_;
                  auVar39._8_4_ = auVar225._8_4_ * auVar410._8_4_;
                  auVar39._12_4_ = auVar225._12_4_ * auVar410._12_4_;
                  auVar39._16_4_ = auVar225._16_4_ * auVar410._16_4_;
                  auVar39._20_4_ = auVar225._20_4_ * auVar410._20_4_;
                  auVar39._24_4_ = auVar225._24_4_ * auVar410._24_4_;
                  auVar39._28_4_ = auVar225._28_4_;
                  auVar225 = vsubps_avx(auVar235,auVar39);
                  auVar362._0_4_ = auVar410._0_4_ + auVar222._0_4_ * auVar225._0_4_;
                  auVar362._4_4_ = auVar410._4_4_ + auVar222._4_4_ * auVar225._4_4_;
                  auVar362._8_4_ = auVar410._8_4_ + auVar222._8_4_ * auVar225._8_4_;
                  auVar362._12_4_ = auVar410._12_4_ + auVar222._12_4_ * auVar225._12_4_;
                  auVar362._16_4_ = auVar410._16_4_ + auVar222._16_4_ * auVar225._16_4_;
                  auVar362._20_4_ = auVar410._20_4_ + auVar222._20_4_ * auVar225._20_4_;
                  auVar362._24_4_ = auVar410._24_4_ + auVar222._24_4_ * auVar225._24_4_;
                  auVar362._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                  *(undefined1 (*) [32])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar362;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                  auVar417 = in_ZMM3;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar84 = (undefined1 (*) [32])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar89 = (undefined1 (*) [32])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar87 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar225 = *pauVar89;
                  uVar97 = uVar82;
                  auVar417 = in_ZMM3;
                  do {
                    auVar222 = *pauVar87;
                    auVar203 = vrcpps_avx(auVar222);
                    auVar402._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                    auVar402._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                    auVar402._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                    auVar402._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                    auVar402._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                    auVar402._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                    auVar402._28_36_ = auVar417._28_36_;
                    auVar402._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                    in_ZMM3 = ZEXT3264(auVar402._0_32_);
                    auVar27._4_4_ = auVar222._4_4_ * auVar402._4_4_;
                    auVar27._0_4_ = auVar222._0_4_ * auVar402._0_4_;
                    auVar27._8_4_ = auVar222._8_4_ * auVar402._8_4_;
                    auVar27._12_4_ = auVar222._12_4_ * auVar402._12_4_;
                    auVar27._16_4_ = auVar222._16_4_ * auVar402._16_4_;
                    auVar27._20_4_ = auVar222._20_4_ * auVar402._20_4_;
                    auVar27._24_4_ = auVar222._24_4_ * auVar402._24_4_;
                    auVar27._28_4_ = auVar222._28_4_;
                    auVar222 = vsubps_avx(auVar225,auVar27);
                    auVar355._0_4_ = auVar402._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                    auVar355._4_4_ = auVar402._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                    auVar355._8_4_ = auVar402._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                    auVar355._12_4_ = auVar402._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                    auVar355._16_4_ = auVar402._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                    auVar355._20_4_ = auVar402._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                    auVar355._24_4_ = auVar402._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                    auVar355._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                    *pauVar84 = auVar355;
                    pauVar87 = pauVar87 + 1;
                    pauVar84 = pauVar84 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                    auVar417 = in_ZMM3;
                  } while (uVar100 != 0);
                }
                pauVar89 = pauVar89 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_138) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar225 = *(undefined1 (*) [32])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                auVar417 = in_ZMM3;
                iVar80 = (int)local_138;
                do {
                  auVar222 = *(undefined1 (*) [32])
                              ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar203 = vrcpps_avx(auVar222);
                  auVar396._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                  auVar396._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                  auVar396._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                  auVar396._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                  auVar396._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                  auVar396._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                  auVar396._28_36_ = auVar417._28_36_;
                  auVar396._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                  in_ZMM3 = ZEXT3264(auVar396._0_32_);
                  auVar18._4_4_ = auVar222._4_4_ * auVar396._4_4_;
                  auVar18._0_4_ = auVar222._0_4_ * auVar396._0_4_;
                  auVar18._8_4_ = auVar222._8_4_ * auVar396._8_4_;
                  auVar18._12_4_ = auVar222._12_4_ * auVar396._12_4_;
                  auVar18._16_4_ = auVar222._16_4_ * auVar396._16_4_;
                  auVar18._20_4_ = auVar222._20_4_ * auVar396._20_4_;
                  auVar18._24_4_ = auVar222._24_4_ * auVar396._24_4_;
                  auVar18._28_4_ = auVar222._28_4_;
                  auVar222 = vsubps_avx(auVar225,auVar18);
                  auVar347._0_4_ = auVar396._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                  auVar347._4_4_ = auVar396._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                  auVar347._8_4_ = auVar396._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                  auVar347._12_4_ = auVar396._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                  auVar347._16_4_ = auVar396._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                  auVar347._20_4_ = auVar396._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                  auVar347._24_4_ = auVar396._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                  auVar347._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                  *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar347;
                  lVar95 = lVar95 + 0x20;
                  iVar80 = iVar80 + -1;
                  auVar417 = in_ZMM3;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_110 = sVar106;
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_138) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  auVar417 = in_ZMM3;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = *(undefined1 (*) [32])
                                ((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                    auVar222 = vrcpps_avx(auVar225);
                    fVar395 = *(float *)((long)pvVar91 + lVar95);
                    auVar394._4_4_ = fVar395;
                    auVar394._0_4_ = fVar395;
                    auVar394._8_4_ = fVar395;
                    auVar394._12_4_ = fVar395;
                    auVar394._16_4_ = fVar395;
                    auVar394._20_4_ = fVar395;
                    auVar394._24_4_ = fVar395;
                    auVar394._28_4_ = fVar395;
                    auVar403._0_4_ = fVar395 * auVar222._0_4_;
                    auVar403._4_4_ = fVar395 * auVar222._4_4_;
                    auVar403._8_4_ = fVar395 * auVar222._8_4_;
                    auVar403._12_4_ = fVar395 * auVar222._12_4_;
                    auVar403._16_4_ = fVar395 * auVar222._16_4_;
                    auVar403._20_4_ = fVar395 * auVar222._20_4_;
                    auVar403._28_36_ = auVar417._28_36_;
                    auVar403._24_4_ = fVar395 * auVar222._24_4_;
                    in_ZMM3 = ZEXT3264(auVar403._0_32_);
                    auVar30._4_4_ = auVar225._4_4_ * auVar403._4_4_;
                    auVar30._0_4_ = auVar225._0_4_ * auVar403._0_4_;
                    auVar30._8_4_ = auVar225._8_4_ * auVar403._8_4_;
                    auVar30._12_4_ = auVar225._12_4_ * auVar403._12_4_;
                    auVar30._16_4_ = auVar225._16_4_ * auVar403._16_4_;
                    auVar30._20_4_ = auVar225._20_4_ * auVar403._20_4_;
                    auVar30._24_4_ = auVar225._24_4_ * auVar403._24_4_;
                    auVar30._28_4_ = auVar225._28_4_;
                    auVar225 = vsubps_avx(auVar394,auVar30);
                    auVar208._0_4_ = auVar403._0_4_ + auVar222._0_4_ * auVar225._0_4_;
                    auVar208._4_4_ = auVar403._4_4_ + auVar222._4_4_ * auVar225._4_4_;
                    auVar208._8_4_ = auVar403._8_4_ + auVar222._8_4_ * auVar225._8_4_;
                    auVar208._12_4_ = auVar403._12_4_ + auVar222._12_4_ * auVar225._12_4_;
                    auVar208._16_4_ = auVar403._16_4_ + auVar222._16_4_ * auVar225._16_4_;
                    auVar208._20_4_ = auVar403._20_4_ + auVar222._20_4_ * auVar225._20_4_;
                    auVar208._24_4_ = auVar403._24_4_ + auVar222._24_4_ * auVar225._24_4_;
                    auVar208._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                    *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82) =
                         auVar208;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                    auVar417 = in_ZMM3;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_130) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      auVar132 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar91 + lVar95)));
                      auVar132 = vshufps_avx(auVar132,auVar132,0);
                      pfVar92 = (float *)((long)pvVar12 + lVar95 * 8 + sVar106 * sVar11 * uVar82);
                      auVar49._4_4_ = auVar132._4_4_ * pfVar92[1];
                      auVar49._0_4_ = auVar132._0_4_ * *pfVar92;
                      auVar49._8_4_ = auVar132._8_4_ * pfVar92[2];
                      auVar49._12_4_ = auVar132._12_4_ * pfVar92[3];
                      auVar49._16_4_ = auVar132._0_4_ * pfVar92[4];
                      auVar49._20_4_ = auVar132._4_4_ * pfVar92[5];
                      auVar49._24_4_ = auVar132._8_4_ * pfVar92[6];
                      auVar49._28_4_ = auVar132._12_4_;
                      *(undefined1 (*) [32])((long)pvVar98 + lVar95 * 8 + sVar13 * sVar14 * uVar82)
                           = auVar49;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while ((void *)uVar82 != local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00261a3f:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar89 = (undefined1 (*) [32])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar97 * 0x20 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        auVar417 = in_ZMM3;
                        do {
                          auVar222 = *pauVar89;
                          auVar203 = vrcpps_avx(auVar222);
                          auVar408._0_4_ = auVar225._0_4_ * auVar203._0_4_;
                          auVar408._4_4_ = auVar225._4_4_ * auVar203._4_4_;
                          auVar408._8_4_ = auVar225._8_4_ * auVar203._8_4_;
                          auVar408._12_4_ = auVar225._12_4_ * auVar203._12_4_;
                          auVar408._16_4_ = auVar225._16_4_ * auVar203._16_4_;
                          auVar408._20_4_ = auVar225._20_4_ * auVar203._20_4_;
                          auVar408._28_36_ = auVar417._28_36_;
                          auVar408._24_4_ = auVar225._24_4_ * auVar203._24_4_;
                          in_ZMM3 = ZEXT3264(auVar408._0_32_);
                          auVar37._4_4_ = auVar222._4_4_ * auVar408._4_4_;
                          auVar37._0_4_ = auVar222._0_4_ * auVar408._0_4_;
                          auVar37._8_4_ = auVar222._8_4_ * auVar408._8_4_;
                          auVar37._12_4_ = auVar222._12_4_ * auVar408._12_4_;
                          auVar37._16_4_ = auVar222._16_4_ * auVar408._16_4_;
                          auVar37._20_4_ = auVar222._20_4_ * auVar408._20_4_;
                          auVar37._24_4_ = auVar222._24_4_ * auVar408._24_4_;
                          auVar37._28_4_ = auVar222._28_4_;
                          auVar222 = vsubps_avx(auVar225,auVar37);
                          auVar360._0_4_ = auVar408._0_4_ + auVar203._0_4_ * auVar222._0_4_;
                          auVar360._4_4_ = auVar408._4_4_ + auVar203._4_4_ * auVar222._4_4_;
                          auVar360._8_4_ = auVar408._8_4_ + auVar203._8_4_ * auVar222._8_4_;
                          auVar360._12_4_ = auVar408._12_4_ + auVar203._12_4_ * auVar222._12_4_;
                          auVar360._16_4_ = auVar408._16_4_ + auVar203._16_4_ * auVar222._16_4_;
                          auVar360._20_4_ = auVar408._20_4_ + auVar203._20_4_ * auVar222._20_4_;
                          auVar360._24_4_ = auVar408._24_4_ + auVar203._24_4_ * auVar222._24_4_;
                          auVar360._28_4_ = auVar417._28_4_ + auVar222._28_4_;
                          *pauVar84 = auVar360;
                          pauVar89 = pauVar89 + 1;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                          auVar417 = in_ZMM3;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        auVar417 = in_ZMM3;
                        do {
                          auVar225 = *(undefined1 (*) [32])((long)pvVar98 + lVar95);
                          auVar203 = vrcpps_avx(auVar225);
                          auVar222 = *(undefined1 (*) [32])
                                      ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          auVar413._0_4_ = auVar222._0_4_ * auVar203._0_4_;
                          auVar413._4_4_ = auVar222._4_4_ * auVar203._4_4_;
                          auVar413._8_4_ = auVar222._8_4_ * auVar203._8_4_;
                          auVar413._12_4_ = auVar222._12_4_ * auVar203._12_4_;
                          auVar413._16_4_ = auVar222._16_4_ * auVar203._16_4_;
                          auVar413._20_4_ = auVar222._20_4_ * auVar203._20_4_;
                          auVar413._28_36_ = auVar417._28_36_;
                          auVar413._24_4_ = auVar222._24_4_ * auVar203._24_4_;
                          in_ZMM3 = ZEXT3264(auVar413._0_32_);
                          auVar44._4_4_ = auVar225._4_4_ * auVar413._4_4_;
                          auVar44._0_4_ = auVar225._0_4_ * auVar413._0_4_;
                          auVar44._8_4_ = auVar225._8_4_ * auVar413._8_4_;
                          auVar44._12_4_ = auVar225._12_4_ * auVar413._12_4_;
                          auVar44._16_4_ = auVar225._16_4_ * auVar413._16_4_;
                          auVar44._20_4_ = auVar225._20_4_ * auVar413._20_4_;
                          auVar44._24_4_ = auVar225._24_4_ * auVar413._24_4_;
                          auVar44._28_4_ = auVar225._28_4_;
                          auVar225 = vsubps_avx(auVar222,auVar44);
                          auVar239._0_4_ = auVar413._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                          auVar239._4_4_ = auVar413._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                          auVar239._8_4_ = auVar413._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                          auVar239._12_4_ = auVar413._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                          auVar239._16_4_ = auVar413._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                          auVar239._20_4_ = auVar413._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                          auVar239._24_4_ = auVar413._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                          auVar239._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                          *(undefined1 (*) [32])((long)pvVar91 + lVar95) = auVar239;
                          lVar95 = lVar95 + 0x20;
                          auVar417 = in_ZMM3;
                        } while (uVar82 << 5 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                auVar248._8_4_ = 0x3f800000;
                auVar248._0_8_ = 0x3f8000003f800000;
                auVar248._12_4_ = 0x3f800000;
                auVar248._16_4_ = 0x3f800000;
                auVar248._20_4_ = 0x3f800000;
                auVar248._24_4_ = 0x3f800000;
                auVar248._28_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar84 = (undefined1 (*) [32])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar225 = *(undefined1 (*) [32])
                                    ((long)pvVar12 + uVar83 * 0x20 + sVar106 * uVar82 * sVar11);
                        auVar222 = vrcpps_avx(auVar225);
                        fVar395 = auVar222._0_4_;
                        fVar424 = auVar222._4_4_;
                        auVar53._4_4_ = auVar225._4_4_ * fVar424;
                        auVar53._0_4_ = auVar225._0_4_ * fVar395;
                        fVar425 = auVar222._8_4_;
                        auVar53._8_4_ = auVar225._8_4_ * fVar425;
                        fVar426 = auVar222._12_4_;
                        auVar53._12_4_ = auVar225._12_4_ * fVar426;
                        fVar427 = auVar222._16_4_;
                        auVar53._16_4_ = auVar225._16_4_ * fVar427;
                        fVar15 = auVar222._20_4_;
                        auVar53._20_4_ = auVar225._20_4_ * fVar15;
                        fVar16 = auVar222._24_4_;
                        auVar53._24_4_ = auVar225._24_4_ * fVar16;
                        auVar53._28_4_ = auVar225._28_4_;
                        auVar225 = vsubps_avx(auVar248,auVar53);
                        uVar101 = uVar100;
                        do {
                          auVar70._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                          auVar70._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                          auVar70._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                          auVar70._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                          auVar70._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                          auVar70._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                          auVar70._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                          auVar70._28_4_ = auVar222._28_4_;
                          *pauVar84 = auVar70;
                          pfVar92 = pfVar92 + 8;
                          pauVar84 = pauVar84 + 1;
                          uVar101 = uVar101 - 1;
                          auVar222 = auVar70;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar8) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  local_130 = (void *)local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_138 = local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              ((long)local_130 * (long)local_158 * local_138 + (long)pvVar12);
                  uStack_f0 = local_138;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar106 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar106 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar106;
                  uStack_f0._4_4_ = (float)(int)(sVar106 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        auVar417 = in_ZMM3;
                        do {
                          auVar225 = *(undefined1 (*) [32])
                                      ((long)pvVar12 +
                                      lVar95 + (long)local_130 * local_138 * (long)local_158);
                          auVar203 = vrcpps_avx(auVar225);
                          auVar222 = *(undefined1 (*) [32])((long)pvVar91 + lVar95);
                          auVar421._0_4_ = auVar222._0_4_ * auVar203._0_4_;
                          auVar421._4_4_ = auVar222._4_4_ * auVar203._4_4_;
                          auVar421._8_4_ = auVar222._8_4_ * auVar203._8_4_;
                          auVar421._12_4_ = auVar222._12_4_ * auVar203._12_4_;
                          auVar421._16_4_ = auVar222._16_4_ * auVar203._16_4_;
                          auVar421._20_4_ = auVar222._20_4_ * auVar203._20_4_;
                          auVar421._28_36_ = auVar417._28_36_;
                          auVar421._24_4_ = auVar222._24_4_ * auVar203._24_4_;
                          in_ZMM3 = ZEXT3264(auVar421._0_32_);
                          auVar58._4_4_ = auVar225._4_4_ * auVar421._4_4_;
                          auVar58._0_4_ = auVar225._0_4_ * auVar421._0_4_;
                          auVar58._8_4_ = auVar225._8_4_ * auVar421._8_4_;
                          auVar58._12_4_ = auVar225._12_4_ * auVar421._12_4_;
                          auVar58._16_4_ = auVar225._16_4_ * auVar421._16_4_;
                          auVar58._20_4_ = auVar225._20_4_ * auVar421._20_4_;
                          auVar58._24_4_ = auVar225._24_4_ * auVar421._24_4_;
                          auVar58._28_4_ = auVar225._28_4_;
                          auVar225 = vsubps_avx(auVar222,auVar58);
                          auVar253._0_4_ = auVar421._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                          auVar253._4_4_ = auVar421._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                          auVar253._8_4_ = auVar421._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                          auVar253._12_4_ = auVar421._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                          auVar253._16_4_ = auVar421._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                          auVar253._20_4_ = auVar421._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                          auVar253._24_4_ = auVar421._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                          auVar253._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                          *(undefined1 (*) [32])((long)pvVar98 + lVar95) = auVar253;
                          lVar95 = lVar95 + 0x20;
                          auVar417 = in_ZMM3;
                        } while (uVar82 << 5 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)uVar8) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                local_130 = (void *)local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                uStack_f0 = local_130;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_110 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_110 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar11 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar13 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar11 * (long)local_158 * sVar13 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar13;
                uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_138) {
                  lVar95 = 0;
                  auVar417 = in_ZMM3;
                  iVar80 = (int)local_138;
                  do {
                    auVar225 = *(undefined1 (*) [32])
                                ((long)pvVar12 +
                                lVar95 + sVar106 * (long)local_130 * (long)local_158);
                    auVar203 = vrcpps_avx(auVar225);
                    auVar222 = *(undefined1 (*) [32])
                                ((long)pvVar91 + lVar95 + local_110 * local_128 * (long)local_158);
                    auVar423._0_4_ = auVar222._0_4_ * auVar203._0_4_;
                    auVar423._4_4_ = auVar222._4_4_ * auVar203._4_4_;
                    auVar423._8_4_ = auVar222._8_4_ * auVar203._8_4_;
                    auVar423._12_4_ = auVar222._12_4_ * auVar203._12_4_;
                    auVar423._16_4_ = auVar222._16_4_ * auVar203._16_4_;
                    auVar423._20_4_ = auVar222._20_4_ * auVar203._20_4_;
                    auVar423._28_36_ = auVar417._28_36_;
                    auVar423._24_4_ = auVar222._24_4_ * auVar203._24_4_;
                    in_ZMM3 = ZEXT3264(auVar423._0_32_);
                    auVar61._4_4_ = auVar225._4_4_ * auVar423._4_4_;
                    auVar61._0_4_ = auVar225._0_4_ * auVar423._0_4_;
                    auVar61._8_4_ = auVar225._8_4_ * auVar423._8_4_;
                    auVar61._12_4_ = auVar225._12_4_ * auVar423._12_4_;
                    auVar61._16_4_ = auVar225._16_4_ * auVar423._16_4_;
                    auVar61._20_4_ = auVar225._20_4_ * auVar423._20_4_;
                    auVar61._24_4_ = auVar225._24_4_ * auVar423._24_4_;
                    auVar61._28_4_ = auVar225._28_4_;
                    auVar225 = vsubps_avx(auVar222,auVar61);
                    auVar256._0_4_ = auVar423._0_4_ + auVar203._0_4_ * auVar225._0_4_;
                    auVar256._4_4_ = auVar423._4_4_ + auVar203._4_4_ * auVar225._4_4_;
                    auVar256._8_4_ = auVar423._8_4_ + auVar203._8_4_ * auVar225._8_4_;
                    auVar256._12_4_ = auVar423._12_4_ + auVar203._12_4_ * auVar225._12_4_;
                    auVar256._16_4_ = auVar423._16_4_ + auVar203._16_4_ * auVar225._16_4_;
                    auVar256._20_4_ = auVar423._20_4_ + auVar203._20_4_ * auVar225._20_4_;
                    auVar256._24_4_ = auVar423._24_4_ + auVar203._24_4_ * auVar225._24_4_;
                    auVar256._28_4_ = auVar417._28_4_ + auVar225._28_4_;
                    *(undefined1 (*) [32])
                     ((long)pvVar98 + lVar95 + sVar11 * sVar13 * (long)local_158) = auVar256;
                    lVar95 = lVar95 + 0x20;
                    iVar80 = iVar80 + -1;
                    auVar417 = in_ZMM3;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00261a3f;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_130) {
          uVar82 = 0;
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = 0x3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar236._16_4_ = 0x3f800000;
          auVar236._20_4_ = 0x3f800000;
          auVar236._24_4_ = 0x3f800000;
          auVar236._28_4_ = 0x3f800000;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              auVar225 = *(undefined1 (*) [32])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              auVar222 = vrcpps_avx(auVar225);
              fVar395 = auVar222._0_4_;
              fVar424 = auVar222._4_4_;
              auVar41._4_4_ = auVar225._4_4_ * fVar424;
              auVar41._0_4_ = auVar225._0_4_ * fVar395;
              fVar425 = auVar222._8_4_;
              auVar41._8_4_ = auVar225._8_4_ * fVar425;
              fVar426 = auVar222._12_4_;
              auVar41._12_4_ = auVar225._12_4_ * fVar426;
              fVar427 = auVar222._16_4_;
              auVar41._16_4_ = auVar225._16_4_ * fVar427;
              fVar15 = auVar222._20_4_;
              auVar41._20_4_ = auVar225._20_4_ * fVar15;
              fVar16 = auVar222._24_4_;
              auVar41._24_4_ = auVar225._24_4_ * fVar16;
              auVar41._28_4_ = auVar225._28_4_;
              auVar225 = vsubps_avx(auVar236,auVar41);
              sVar11 = pMVar9[1].elemsize;
              pvVar12 = pMVar9[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar91 = this_00->data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                auVar68._4_4_ = (fVar424 + fVar424 * auVar225._4_4_) * pfVar92[1];
                auVar68._0_4_ = (fVar395 + fVar395 * auVar225._0_4_) * *pfVar92;
                auVar68._8_4_ = (fVar425 + fVar425 * auVar225._8_4_) * pfVar92[2];
                auVar68._12_4_ = (fVar426 + fVar426 * auVar225._12_4_) * pfVar92[3];
                auVar68._16_4_ = (fVar427 + fVar427 * auVar225._16_4_) * pfVar92[4];
                auVar68._20_4_ = (fVar15 + fVar15 * auVar225._20_4_) * pfVar92[5];
                auVar68._24_4_ = (fVar16 + fVar16 * auVar225._24_4_) * pfVar92[6];
                auVar68._28_4_ = auVar222._28_4_;
                *(undefined1 (*) [32])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) = auVar68;
                lVar95 = lVar95 + 0x20;
                iVar80 = iVar80 + -1;
                auVar222 = auVar68;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while ((void *)uVar82 != local_130);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  p_Var10 = this->_vptr_BinaryOp_x86_avx[-3];
  if (uVar101 == 4 || iVar80 == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var10)) {
    case 0:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  pfVar92 = (float *)((long)pvVar98 + lVar95);
                  fVar395 = pfVar92[1];
                  fVar424 = pfVar92[2];
                  fVar425 = pfVar92[3];
                  pfVar93 = (float *)((long)pvVar91 + lVar95);
                  fVar426 = pfVar93[1];
                  fVar427 = pfVar93[2];
                  fVar15 = pfVar93[3];
                  pfVar2 = (float *)((long)pvVar12 + lVar95);
                  *pfVar2 = *pfVar92 + *pfVar93;
                  pfVar2[1] = fVar395 + fVar426;
                  pfVar2[2] = fVar424 + fVar427;
                  pfVar2[3] = fVar425 + fVar15;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              fVar395 = *pMVar1->data;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 + *pfVar92;
                pfVar93[1] = fVar395 + fVar424;
                pfVar93[2] = fVar395 + fVar425;
                pfVar93[3] = fVar395 + fVar426;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pfVar92 = (float *)pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar305._0_4_ = auVar132._0_4_ + *pfVar92;
                      auVar305._4_4_ = auVar132._4_4_ + pfVar92[1];
                      auVar305._8_4_ = auVar132._8_4_ + pfVar92[2];
                      auVar305._12_4_ = auVar132._12_4_ + pfVar92[3];
                      *pauVar85 = auVar305;
                      pfVar92 = pfVar92 + 4;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar294._0_4_ = auVar132._0_4_ + *pfVar92;
                  auVar294._4_4_ = auVar132._4_4_ + pfVar92[1];
                  auVar294._8_4_ = auVar132._8_4_ + pfVar92[2];
                  auVar294._12_4_ = auVar132._12_4_ + pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar294;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 + *pfVar92;
                pfVar93[1] = fVar395 + fVar424;
                pfVar93[2] = fVar395 + fVar425;
                pfVar93[3] = fVar395 + fVar426;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 + *pfVar92;
                pfVar93[1] = fVar395 + fVar424;
                pfVar93[2] = fVar395 + fVar425;
                pfVar93[3] = fVar395 + fVar426;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar395 = *pMVar9->data;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar285._0_4_ = fVar395 + *pfVar92;
                auVar285._4_4_ = fVar395 + pfVar92[1];
                auVar285._8_4_ = fVar395 + pfVar92[2];
                auVar285._12_4_ = fVar395 + pfVar92[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar285;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar90 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar90;
                      uVar99 = uVar100;
                      do {
                        auVar282._0_4_ = auVar132._0_4_ + *pfVar92;
                        auVar282._4_4_ = auVar132._4_4_ + pfVar92[1];
                        auVar282._8_4_ = auVar132._8_4_ + pfVar92[2];
                        auVar282._12_4_ = auVar132._12_4_ + pfVar92[3];
                        *pauVar85 = auVar282;
                        pfVar92 = pfVar92 + 4;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar90 = pauVar90 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar98 + lVar95);
              fVar395 = pfVar92[1];
              fVar424 = pfVar92[2];
              fVar425 = pfVar92[3];
              pfVar93 = (float *)((long)pvVar91 + lVar95);
              fVar426 = pfVar93[1];
              fVar427 = pfVar93[2];
              fVar15 = pfVar93[3];
              pfVar2 = (float *)((long)pvVar12 + lVar95);
              *pfVar2 = *pfVar92 + *pfVar93;
              pfVar2[1] = fVar395 + fVar426;
              pfVar2[2] = fVar424 + fVar427;
              pfVar2[3] = fVar425 + fVar15;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar92 = (float *)pMVar9->data;
              pauVar90 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar81 = uVar82;
                  do {
                    auVar341._0_4_ = auVar132._0_4_ + *pfVar92;
                    auVar341._4_4_ = auVar132._4_4_ + pfVar92[1];
                    auVar341._8_4_ = auVar132._8_4_ + pfVar92[2];
                    auVar341._12_4_ = auVar132._12_4_ + pfVar92[3];
                    *pauVar85 = auVar341;
                    pfVar92 = pfVar92 + 4;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar395 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              fVar424 = pfVar92[1];
              fVar425 = pfVar92[2];
              fVar426 = pfVar92[3];
              pfVar93 = (float *)((long)*pauVar85 + lVar95);
              *pfVar93 = fVar395 + *pfVar92;
              pfVar93[1] = fVar395 + fVar424;
              pfVar93[2] = fVar395 + fVar425;
              pfVar93[3] = fVar395 + fVar426;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                    auVar328._0_4_ = auVar132._0_4_ + *pfVar92;
                    auVar328._4_4_ = auVar132._4_4_ + pfVar92[1];
                    auVar328._8_4_ = auVar132._8_4_ + pfVar92[2];
                    auVar328._12_4_ = auVar132._12_4_ + pfVar92[3];
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar328;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar395 = *pMVar1->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar316._0_4_ = fVar395 + *pfVar92;
                  auVar316._4_4_ = fVar395 + pfVar92[1];
                  auVar316._8_4_ = fVar395 + pfVar92[2];
                  auVar316._12_4_ = fVar395 + pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar316;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar295._0_4_ = auVar132._0_4_ + *pfVar92;
                    auVar295._4_4_ = auVar132._4_4_ + pfVar92[1];
                    auVar295._8_4_ = auVar132._8_4_ + pfVar92[2];
                    auVar295._12_4_ = auVar132._12_4_ + pfVar92[3];
                    *pauVar85 = auVar295;
                    pfVar92 = pfVar92 + 4;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar273._0_4_ = auVar132._0_4_ + *pfVar92;
                  auVar273._4_4_ = auVar132._4_4_ + pfVar92[1];
                  auVar273._8_4_ = auVar132._8_4_ + pfVar92[2];
                  auVar273._12_4_ = auVar132._12_4_ + pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar273;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    fVar395 = *(float *)((long)pvVar91 + lVar95);
                    pfVar92 = (float *)((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                    auVar125._0_4_ = fVar395 + *pfVar92;
                    auVar125._4_4_ = fVar395 + pfVar92[1];
                    auVar125._8_4_ = fVar395 + pfVar92[2];
                    auVar125._12_4_ = fVar395 + pfVar92[3];
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar125;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      fVar395 = *(float *)((long)pvVar91 + lVar95);
                      pfVar92 = (float *)((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                      auVar179._0_4_ = fVar395 + *pfVar92;
                      auVar179._4_4_ = fVar395 + pfVar92[1];
                      auVar179._8_4_ = fVar395 + pfVar92[2];
                      auVar179._12_4_ = fVar395 + pfVar92[3];
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar179;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00263110:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar309._0_4_ = auVar132._0_4_ + *pfVar92;
                          auVar309._4_4_ = auVar132._4_4_ + pfVar92[1];
                          auVar309._8_4_ = auVar132._8_4_ + pfVar92[2];
                          auVar309._12_4_ = auVar132._12_4_ + pfVar92[3];
                          *pauVar85 = auVar309;
                          pfVar92 = pfVar92 + 4;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          pfVar93 = (float *)((long)pvVar98 + lVar95);
                          auVar170._0_4_ = *pfVar92 + *pfVar93;
                          auVar170._4_4_ = pfVar92[1] + pfVar93[1];
                          auVar170._8_4_ = pfVar92[2] + pfVar93[2];
                          auVar170._12_4_ = pfVar92[3] + pfVar93[3];
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar170;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar337._0_4_ = auVar132._0_4_ + *pfVar92;
                          auVar337._4_4_ = auVar132._4_4_ + pfVar92[1];
                          auVar337._8_4_ = auVar132._8_4_ + pfVar92[2];
                          auVar337._12_4_ = auVar132._12_4_ + pfVar92[3];
                          *pauVar85 = auVar337;
                          pfVar92 = pfVar92 + 4;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar91 + lVar95);
                          pfVar93 = (float *)((long)pvVar12 +
                                             lVar95 + sVar106 * (long)local_130 * (long)local_158);
                          auVar187._0_4_ = *pfVar92 + *pfVar93;
                          auVar187._4_4_ = pfVar92[1] + pfVar93[1];
                          auVar187._8_4_ = pfVar92[2] + pfVar93[2];
                          auVar187._12_4_ = pfVar92[3] + pfVar93[3];
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar187;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    pfVar92 = (float *)((long)pvVar91 +
                                       lVar95 + local_138 * local_110 * (long)local_158);
                    pfVar93 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * (long)local_158)
                    ;
                    auVar192._0_4_ = *pfVar92 + *pfVar93;
                    auVar192._4_4_ = pfVar92[1] + pfVar93[1];
                    auVar192._8_4_ = pfVar92[2] + pfVar93[2];
                    auVar192._12_4_ = pfVar92[3] + pfVar93[3];
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar192;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00263110;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar323._0_4_ = auVar132._0_4_ + *pfVar92;
                auVar323._4_4_ = auVar132._4_4_ + pfVar92[1];
                auVar323._8_4_ = auVar132._8_4_ + pfVar92[2];
                auVar323._12_4_ = auVar132._12_4_ + pfVar92[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar323;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                        *(undefined1 (*) [16])((long)pvVar98 + lVar95));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar144._4_4_ = uVar4;
              auVar144._0_4_ = uVar4;
              auVar144._8_4_ = uVar4;
              auVar144._12_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),auVar144);
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar131 = vsubps_avx(auVar132,*pauVar88);
                      *pauVar85 = auVar131;
                      pauVar88 = pauVar88 + 1;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar131 = vsubps_avx(auVar132,*(undefined1 (*) [16])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar143._4_4_ = uVar4;
              auVar143._0_4_ = uVar4;
              auVar143._8_4_ = uVar4;
              auVar143._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vsubps_avx(auVar143,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar138._4_4_ = uVar4;
              auVar138._0_4_ = uVar4;
              auVar138._8_4_ = uVar4;
              auVar138._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vsubps_avx(auVar138,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar115._4_4_ = uVar4;
          auVar115._0_4_ = uVar4;
          auVar115._8_4_ = uVar4;
          auVar115._12_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar132 = vsubps_avx(auVar115,*(undefined1 (*) [16])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar132;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar90 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar88 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar88;
                      uVar99 = uVar100;
                      do {
                        auVar131 = vsubps_avx(auVar132,*pauVar90);
                        *pauVar85 = auVar131;
                        pauVar90 = pauVar90 + 1;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar88 = pauVar88 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                    *(undefined1 (*) [16])((long)pvVar98 + lVar95));
              *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar90 = (undefined1 (*) [16])pMVar9->data;
              pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar88;
                  uVar81 = uVar82;
                  do {
                    auVar131 = vsubps_avx(*pauVar90,auVar132);
                    *pauVar85 = auVar131;
                    pauVar90 = pauVar90 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar88 = pauVar88 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar159._4_4_ = uVar4;
            auVar159._0_4_ = uVar4;
            auVar159._8_4_ = uVar4;
            auVar159._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar12 + lVar95),auVar159);
              *(undefined1 (*) [16])((long)*pauVar85 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar131 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),
                                          auVar132);
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar131;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar163._4_4_ = uVar4;
            auVar163._0_4_ = uVar4;
            auVar163._8_4_ = uVar4;
            auVar163._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),
                                        auVar163);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar132;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar88 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar131 = vsubps_avx(*pauVar88,auVar132);
                    *pauVar85 = auVar131;
                    pauVar88 = pauVar88 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar131 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82),
                                        auVar132);
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar300._4_4_ = uVar4;
                    auVar300._0_4_ = uVar4;
                    auVar300._8_4_ = uVar4;
                    auVar300._12_4_ = uVar4;
                    auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82),
                                          auVar300);
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar132;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar180._4_4_ = uVar4;
                      auVar180._0_4_ = uVar4;
                      auVar180._8_4_ = uVar4;
                      auVar180._12_4_ = uVar4;
                      auVar132 = vsubps_avx(auVar180,*(undefined1 (*) [16])
                                                      ((long)pvVar12 +
                                                      lVar95 * 4 + sVar106 * sVar11 * uVar82));
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar132;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00263256:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar131 = vsubps_avx(*pauVar90,auVar132);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar98 + lVar95),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ));
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar131 = vsubps_avx(auVar132,*pauVar90);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar95 + sVar106 * (long)local_130 *
                                                          (long)local_158),
                                                *(undefined1 (*) [16])((long)pvVar91 + lVar95));
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * sVar11 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar91 +
                                           lVar95 + local_138 * local_110 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar132;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00263256;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar131 = vsubps_avx(auVar132,*(undefined1 (*) [16])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar131;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  pfVar92 = (float *)((long)pvVar98 + lVar95);
                  fVar395 = pfVar92[1];
                  fVar424 = pfVar92[2];
                  fVar425 = pfVar92[3];
                  pfVar93 = (float *)((long)pvVar91 + lVar95);
                  fVar426 = pfVar93[1];
                  fVar427 = pfVar93[2];
                  fVar15 = pfVar93[3];
                  pfVar2 = (float *)((long)pvVar12 + lVar95);
                  *pfVar2 = *pfVar92 * *pfVar93;
                  pfVar2[1] = fVar395 * fVar426;
                  pfVar2[2] = fVar424 * fVar427;
                  pfVar2[3] = fVar425 * fVar15;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              fVar395 = *pMVar1->data;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 * *pfVar92;
                pfVar93[1] = fVar395 * fVar424;
                pfVar93[2] = fVar395 * fVar425;
                pfVar93[3] = fVar395 * fVar426;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pfVar92 = (float *)pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar301._0_4_ = auVar132._0_4_ * *pfVar92;
                      auVar301._4_4_ = auVar132._4_4_ * pfVar92[1];
                      auVar301._8_4_ = auVar132._8_4_ * pfVar92[2];
                      auVar301._12_4_ = auVar132._12_4_ * pfVar92[3];
                      *pauVar85 = auVar301;
                      pfVar92 = pfVar92 + 4;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar288._0_4_ = auVar132._0_4_ * *pfVar92;
                  auVar288._4_4_ = auVar132._4_4_ * pfVar92[1];
                  auVar288._8_4_ = auVar132._8_4_ * pfVar92[2];
                  auVar288._12_4_ = auVar132._12_4_ * pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar288;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 * *pfVar92;
                pfVar93[1] = fVar395 * fVar424;
                pfVar93[2] = fVar395 * fVar425;
                pfVar93[3] = fVar395 * fVar426;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              fVar395 = *pMVar9->data;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar424 = pfVar92[1];
                fVar425 = pfVar92[2];
                fVar426 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = fVar395 * *pfVar92;
                pfVar93[1] = fVar395 * fVar424;
                pfVar93[2] = fVar395 * fVar425;
                pfVar93[3] = fVar395 * fVar426;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar395 = *pMVar9->data;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar279._0_4_ = fVar395 * *pfVar92;
                auVar279._4_4_ = fVar395 * pfVar92[1];
                auVar279._8_4_ = fVar395 * pfVar92[2];
                auVar279._12_4_ = fVar395 * pfVar92[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar279;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar90 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar90;
                      uVar99 = uVar100;
                      do {
                        auVar278._0_4_ = auVar132._0_4_ * *pfVar92;
                        auVar278._4_4_ = auVar132._4_4_ * pfVar92[1];
                        auVar278._8_4_ = auVar132._8_4_ * pfVar92[2];
                        auVar278._12_4_ = auVar132._12_4_ * pfVar92[3];
                        *pauVar85 = auVar278;
                        pfVar92 = pfVar92 + 4;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar90 = pauVar90 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar98 + lVar95);
              fVar395 = pfVar92[1];
              fVar424 = pfVar92[2];
              fVar425 = pfVar92[3];
              pfVar93 = (float *)((long)pvVar91 + lVar95);
              fVar426 = pfVar93[1];
              fVar427 = pfVar93[2];
              fVar15 = pfVar93[3];
              pfVar2 = (float *)((long)pvVar12 + lVar95);
              *pfVar2 = *pfVar92 * *pfVar93;
              pfVar2[1] = fVar395 * fVar426;
              pfVar2[2] = fVar424 * fVar427;
              pfVar2[3] = fVar425 * fVar15;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar92 = (float *)pMVar9->data;
              pauVar90 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar81 = uVar82;
                  do {
                    auVar339._0_4_ = auVar132._0_4_ * *pfVar92;
                    auVar339._4_4_ = auVar132._4_4_ * pfVar92[1];
                    auVar339._8_4_ = auVar132._8_4_ * pfVar92[2];
                    auVar339._12_4_ = auVar132._12_4_ * pfVar92[3];
                    *pauVar85 = auVar339;
                    pfVar92 = pfVar92 + 4;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar395 = *pMVar1->data;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              fVar424 = pfVar92[1];
              fVar425 = pfVar92[2];
              fVar426 = pfVar92[3];
              pfVar93 = (float *)((long)*pauVar85 + lVar95);
              *pfVar93 = fVar395 * *pfVar92;
              pfVar93[1] = fVar395 * fVar424;
              pfVar93[2] = fVar395 * fVar425;
              pfVar93[3] = fVar395 * fVar426;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                    auVar326._0_4_ = auVar132._0_4_ * *pfVar92;
                    auVar326._4_4_ = auVar132._4_4_ * pfVar92[1];
                    auVar326._8_4_ = auVar132._8_4_ * pfVar92[2];
                    auVar326._12_4_ = auVar132._12_4_ * pfVar92[3];
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar326;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar395 = *pMVar1->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar314._0_4_ = fVar395 * *pfVar92;
                  auVar314._4_4_ = fVar395 * pfVar92[1];
                  auVar314._8_4_ = fVar395 * pfVar92[2];
                  auVar314._12_4_ = fVar395 * pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar314;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar290._0_4_ = auVar132._0_4_ * *pfVar92;
                    auVar290._4_4_ = auVar132._4_4_ * pfVar92[1];
                    auVar290._8_4_ = auVar132._8_4_ * pfVar92[2];
                    auVar290._12_4_ = auVar132._12_4_ * pfVar92[3];
                    *pauVar85 = auVar290;
                    pfVar92 = pfVar92 + 4;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar274._0_4_ = auVar132._0_4_ * *pfVar92;
                  auVar274._4_4_ = auVar132._4_4_ * pfVar92[1];
                  auVar274._8_4_ = auVar132._8_4_ * pfVar92[2];
                  auVar274._12_4_ = auVar132._12_4_ * pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar274;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    fVar395 = *(float *)((long)pvVar91 + lVar95);
                    pfVar92 = (float *)((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                    auVar123._0_4_ = fVar395 * *pfVar92;
                    auVar123._4_4_ = fVar395 * pfVar92[1];
                    auVar123._8_4_ = fVar395 * pfVar92[2];
                    auVar123._12_4_ = fVar395 * pfVar92[3];
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar123;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      fVar395 = *(float *)((long)pvVar91 + lVar95);
                      pfVar92 = (float *)((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                      auVar175._0_4_ = fVar395 * *pfVar92;
                      auVar175._4_4_ = fVar395 * pfVar92[1];
                      auVar175._8_4_ = fVar395 * pfVar92[2];
                      auVar175._12_4_ = fVar395 * pfVar92[3];
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar175;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00262759:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar306._0_4_ = auVar132._0_4_ * *pfVar92;
                          auVar306._4_4_ = auVar132._4_4_ * pfVar92[1];
                          auVar306._8_4_ = auVar132._8_4_ * pfVar92[2];
                          auVar306._12_4_ = auVar132._12_4_ * pfVar92[3];
                          *pauVar85 = auVar306;
                          pfVar92 = pfVar92 + 4;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          pfVar93 = (float *)((long)pvVar98 + lVar95);
                          auVar168._0_4_ = *pfVar92 * *pfVar93;
                          auVar168._4_4_ = pfVar92[1] * pfVar93[1];
                          auVar168._8_4_ = pfVar92[2] * pfVar93[2];
                          auVar168._12_4_ = pfVar92[3] * pfVar93[3];
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar168;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pfVar92 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar334._0_4_ = auVar132._0_4_ * *pfVar92;
                          auVar334._4_4_ = auVar132._4_4_ * pfVar92[1];
                          auVar334._8_4_ = auVar132._8_4_ * pfVar92[2];
                          auVar334._12_4_ = auVar132._12_4_ * pfVar92[3];
                          *pauVar85 = auVar334;
                          pfVar92 = pfVar92 + 4;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          pfVar92 = (float *)((long)pvVar91 + lVar95);
                          pfVar93 = (float *)((long)pvVar12 +
                                             lVar95 + sVar106 * (long)local_130 * (long)local_158);
                          auVar185._0_4_ = *pfVar92 * *pfVar93;
                          auVar185._4_4_ = pfVar92[1] * pfVar93[1];
                          auVar185._8_4_ = pfVar92[2] * pfVar93[2];
                          auVar185._12_4_ = pfVar92[3] * pfVar93[3];
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar185;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    pfVar92 = (float *)((long)pvVar91 +
                                       lVar95 + local_138 * local_110 * (long)local_158);
                    pfVar93 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * (long)local_158)
                    ;
                    auVar190._0_4_ = *pfVar92 * *pfVar93;
                    auVar190._4_4_ = pfVar92[1] * pfVar93[1];
                    auVar190._8_4_ = pfVar92[2] * pfVar93[2];
                    auVar190._12_4_ = pfVar92[3] * pfVar93[3];
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar190;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00262759;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar320._0_4_ = auVar132._0_4_ * *pfVar92;
                auVar320._4_4_ = auVar132._4_4_ * pfVar92[1];
                auVar320._8_4_ = auVar132._8_4_ * pfVar92[2];
                auVar320._12_4_ = auVar132._12_4_ * pfVar92[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar320;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                  auVar131 = *(undefined1 (*) [16])((long)pvVar98 + lVar95);
                  auVar111 = vrcpps_avx(auVar131);
                  fVar395 = auVar132._0_4_ * auVar111._0_4_;
                  fVar424 = auVar132._4_4_ * auVar111._4_4_;
                  fVar425 = auVar132._8_4_ * auVar111._8_4_;
                  fVar426 = auVar132._12_4_ * auVar111._12_4_;
                  auVar333._0_4_ = auVar131._0_4_ * fVar395;
                  auVar333._4_4_ = auVar131._4_4_ * fVar424;
                  auVar333._8_4_ = auVar131._8_4_ * fVar425;
                  auVar333._12_4_ = auVar131._12_4_ * fVar426;
                  auVar132 = vsubps_avx(auVar132,auVar333);
                  pfVar92 = (float *)((long)pvVar12 + lVar95);
                  *pfVar92 = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                  pfVar92[1] = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                  pfVar92[2] = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                  pfVar92[3] = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              auVar140._0_4_ = 1.0 / *pMVar1->data;
              auVar140._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar132 = vshufps_avx(auVar140,auVar140,0);
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar395 = pfVar92[1];
                fVar424 = pfVar92[2];
                fVar425 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = auVar132._0_4_ * *pfVar92;
                pfVar93[1] = auVar132._4_4_ * fVar395;
                pfVar93[2] = auVar132._8_4_ * fVar424;
                pfVar93[3] = auVar132._12_4_ * fVar425;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar131 = *pauVar88;
                      auVar111 = vrcpps_avx(auVar131);
                      fVar395 = auVar132._0_4_ * auVar111._0_4_;
                      fVar424 = auVar132._4_4_ * auVar111._4_4_;
                      fVar425 = auVar132._8_4_ * auVar111._8_4_;
                      fVar426 = auVar132._12_4_ * auVar111._12_4_;
                      auVar303._0_4_ = auVar131._0_4_ * fVar395;
                      auVar303._4_4_ = auVar131._4_4_ * fVar424;
                      auVar303._8_4_ = auVar131._8_4_ * fVar425;
                      auVar303._12_4_ = auVar131._12_4_ * fVar426;
                      auVar131 = vsubps_avx(auVar132,auVar303);
                      auVar304._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                      auVar304._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                      auVar304._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                      auVar304._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                      *pauVar85 = auVar304;
                      pauVar88 = pauVar88 + 1;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar131 = *(undefined1 (*) [16])
                              ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar111 = vrcpps_avx(auVar131);
                  fVar395 = auVar132._0_4_ * auVar111._0_4_;
                  fVar424 = auVar132._4_4_ * auVar111._4_4_;
                  fVar425 = auVar132._8_4_ * auVar111._8_4_;
                  fVar426 = auVar132._12_4_ * auVar111._12_4_;
                  auVar291._0_4_ = auVar131._0_4_ * fVar395;
                  auVar291._4_4_ = auVar131._4_4_ * fVar424;
                  auVar291._8_4_ = auVar131._8_4_ * fVar425;
                  auVar291._12_4_ = auVar131._12_4_ * fVar426;
                  auVar131 = vsubps_avx(auVar132,auVar291);
                  auVar292._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                  auVar292._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                  auVar292._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                  auVar292._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar292;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              fVar395 = *pMVar9->data;
              auVar139._4_4_ = fVar395;
              auVar139._0_4_ = fVar395;
              auVar139._8_4_ = fVar395;
              auVar139._12_4_ = fVar395;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                auVar131 = vrcpps_avx(auVar132);
                fVar424 = fVar395 * auVar131._0_4_;
                fVar425 = fVar395 * auVar131._4_4_;
                fVar426 = fVar395 * auVar131._8_4_;
                fVar427 = fVar395 * auVar131._12_4_;
                auVar307._0_4_ = auVar132._0_4_ * fVar424;
                auVar307._4_4_ = auVar132._4_4_ * fVar425;
                auVar307._8_4_ = auVar132._8_4_ * fVar426;
                auVar307._12_4_ = auVar132._12_4_ * fVar427;
                auVar132 = vsubps_avx(auVar139,auVar307);
                pfVar92 = (float *)((long)pvVar12 + lVar95);
                *pfVar92 = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                pfVar92[1] = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                pfVar92[2] = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                pfVar92[3] = fVar427 + auVar131._12_4_ * auVar132._12_4_;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              fVar395 = *pMVar9->data;
              auVar136._4_4_ = fVar395;
              auVar136._0_4_ = fVar395;
              auVar136._8_4_ = fVar395;
              auVar136._12_4_ = fVar395;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                auVar131 = vrcpps_avx(auVar132);
                fVar424 = fVar395 * auVar131._0_4_;
                fVar425 = fVar395 * auVar131._4_4_;
                fVar426 = fVar395 * auVar131._8_4_;
                fVar427 = fVar395 * auVar131._12_4_;
                auVar302._0_4_ = auVar132._0_4_ * fVar424;
                auVar302._4_4_ = auVar132._4_4_ * fVar425;
                auVar302._8_4_ = auVar132._8_4_ * fVar426;
                auVar302._12_4_ = auVar132._12_4_ * fVar427;
                auVar132 = vsubps_avx(auVar136,auVar302);
                pfVar92 = (float *)((long)pvVar12 + lVar95);
                *pfVar92 = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                pfVar92[1] = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                pfVar92[2] = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                pfVar92[3] = fVar427 + auVar131._12_4_ * auVar132._12_4_;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          fVar395 = *pMVar9->data;
          auVar113._4_4_ = fVar395;
          auVar113._0_4_ = fVar395;
          auVar113._8_4_ = fVar395;
          auVar113._12_4_ = fVar395;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82)
                ;
                auVar131 = vrcpps_avx(auVar132);
                fVar424 = fVar395 * auVar131._0_4_;
                fVar425 = fVar395 * auVar131._4_4_;
                fVar426 = fVar395 * auVar131._8_4_;
                fVar427 = fVar395 * auVar131._12_4_;
                auVar283._0_4_ = auVar132._0_4_ * fVar424;
                auVar283._4_4_ = auVar132._4_4_ * fVar425;
                auVar283._8_4_ = auVar132._8_4_ * fVar426;
                auVar283._12_4_ = auVar132._12_4_ * fVar427;
                auVar132 = vsubps_avx(auVar113,auVar283);
                auVar284._0_4_ = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                auVar284._4_4_ = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                auVar284._8_4_ = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                auVar284._12_4_ = fVar427 + auVar131._12_4_ * auVar132._12_4_;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar284;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar90 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar88 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar88;
                      uVar99 = uVar100;
                      do {
                        auVar131 = *pauVar90;
                        auVar111 = vrcpps_avx(auVar131);
                        fVar395 = auVar132._0_4_ * auVar111._0_4_;
                        fVar424 = auVar132._4_4_ * auVar111._4_4_;
                        fVar425 = auVar132._8_4_ * auVar111._8_4_;
                        fVar426 = auVar132._12_4_ * auVar111._12_4_;
                        auVar280._0_4_ = auVar131._0_4_ * fVar395;
                        auVar280._4_4_ = auVar131._4_4_ * fVar424;
                        auVar280._8_4_ = auVar131._8_4_ * fVar425;
                        auVar280._12_4_ = auVar131._12_4_ * fVar426;
                        auVar131 = vsubps_avx(auVar132,auVar280);
                        auVar281._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                        auVar281._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                        auVar281._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                        auVar281._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                        *pauVar85 = auVar281;
                        pauVar90 = pauVar90 + 1;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar88 = pauVar88 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
              auVar131 = *(undefined1 (*) [16])((long)pvVar98 + lVar95);
              auVar111 = vrcpps_avx(auVar131);
              fVar395 = auVar132._0_4_ * auVar111._0_4_;
              fVar424 = auVar132._4_4_ * auVar111._4_4_;
              fVar425 = auVar132._8_4_ * auVar111._8_4_;
              fVar426 = auVar132._12_4_ * auVar111._12_4_;
              auVar289._0_4_ = auVar131._0_4_ * fVar395;
              auVar289._4_4_ = auVar131._4_4_ * fVar424;
              auVar289._8_4_ = auVar131._8_4_ * fVar425;
              auVar289._12_4_ = auVar131._12_4_ * fVar426;
              auVar132 = vsubps_avx(auVar132,auVar289);
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              *pfVar92 = fVar395 + auVar111._0_4_ * auVar132._0_4_;
              pfVar92[1] = fVar424 + auVar111._4_4_ * auVar132._4_4_;
              pfVar92[2] = fVar425 + auVar111._8_4_ * auVar132._8_4_;
              pfVar92[3] = fVar426 + auVar111._12_4_ * auVar132._12_4_;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pfVar92 = (float *)this_00->data;
        if (pfVar92 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pfVar93 = (float *)pMVar9->data;
              pauVar85 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              auVar184._8_4_ = 0x3f800000;
              auVar184._0_8_ = 0x3f8000003f800000;
              auVar184._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar85;
                  auVar131 = vrcpps_avx(auVar132);
                  fVar395 = auVar131._0_4_;
                  auVar340._0_4_ = auVar132._0_4_ * fVar395;
                  fVar424 = auVar131._4_4_;
                  auVar340._4_4_ = auVar132._4_4_ * fVar424;
                  fVar425 = auVar131._8_4_;
                  auVar340._8_4_ = auVar132._8_4_ * fVar425;
                  fVar426 = auVar131._12_4_;
                  auVar340._12_4_ = auVar132._12_4_ * fVar426;
                  auVar132 = vsubps_avx(auVar184,auVar340);
                  uVar81 = uVar82;
                  do {
                    fVar427 = pfVar93[1];
                    fVar15 = pfVar93[2];
                    fVar16 = pfVar93[3];
                    *pfVar92 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar93;
                    pfVar92[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                    pfVar92[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                    pfVar92[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                    pfVar93 = pfVar93 + 4;
                    pfVar92 = pfVar92 + 4;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar85 = pauVar85 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            auVar157._0_4_ = 1.0 / *pMVar1->data;
            auVar157._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar132 = vshufps_avx(auVar157,auVar157,0);
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              pfVar93 = (float *)((long)pvVar12 + lVar95);
              fVar395 = pfVar93[1];
              fVar424 = pfVar93[2];
              fVar425 = pfVar93[3];
              pfVar2 = (float *)((long)pfVar92 + lVar95);
              *pfVar2 = auVar132._0_4_ * *pfVar93;
              pfVar2[1] = auVar132._4_4_ * fVar395;
              pfVar2[2] = auVar132._8_4_ * fVar424;
              pfVar2[3] = auVar132._12_4_ * fVar425;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = 0x3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar9[1].data + uVar82 * 0x10);
                  auVar131 = vrcpps_avx(auVar132);
                  fVar395 = auVar131._0_4_;
                  auVar327._0_4_ = auVar132._0_4_ * fVar395;
                  fVar424 = auVar131._4_4_;
                  auVar327._4_4_ = auVar132._4_4_ * fVar424;
                  fVar425 = auVar131._8_4_;
                  auVar327._8_4_ = auVar132._8_4_ * fVar425;
                  fVar426 = auVar131._12_4_;
                  auVar327._12_4_ = auVar132._12_4_ * fVar426;
                  auVar132 = vsubps_avx(auVar173,auVar327);
                  sVar11 = this_00->cstep;
                  sVar13 = this_00->elemsize;
                  pvVar12 = this_00->data;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar106 * sVar14 * uVar82);
                    fVar427 = pfVar92[1];
                    fVar15 = pfVar92[2];
                    fVar16 = pfVar92[3];
                    pfVar93 = (float *)((long)pvVar12 + lVar95 + sVar11 * sVar13 * uVar82);
                    *pfVar93 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar92;
                    pfVar93[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                    pfVar93[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                    pfVar93[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            auVar160._0_4_ = 1.0 / *pMVar9[1].data;
            auVar160._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar132 = vshufps_avx(auVar160,auVar160,0);
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar315._0_4_ = auVar132._0_4_ * *pfVar92;
                  auVar315._4_4_ = auVar132._4_4_ * pfVar92[1];
                  auVar315._8_4_ = auVar132._8_4_ * pfVar92[2];
                  auVar315._12_4_ = auVar132._12_4_ * pfVar92[3];
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar315;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          auVar119._8_4_ = 0x3f800000;
          auVar119._0_8_ = 0x3f8000003f800000;
          auVar119._12_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar7) {
              pfVar92 = (float *)(this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar85 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pfVar93 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar85;
                  auVar131 = vrcpps_avx(auVar132);
                  fVar395 = auVar131._0_4_;
                  auVar293._0_4_ = auVar132._0_4_ * fVar395;
                  fVar424 = auVar131._4_4_;
                  auVar293._4_4_ = auVar132._4_4_ * fVar424;
                  fVar425 = auVar131._8_4_;
                  auVar293._8_4_ = auVar132._8_4_ * fVar425;
                  fVar426 = auVar131._12_4_;
                  auVar293._12_4_ = auVar132._12_4_ * fVar426;
                  auVar132 = vsubps_avx(auVar119,auVar293);
                  uVar97 = uVar82;
                  do {
                    fVar427 = pfVar93[1];
                    fVar15 = pfVar93[2];
                    fVar16 = pfVar93[3];
                    *pfVar92 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar93;
                    pfVar92[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                    pfVar92[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                    pfVar92[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                    pfVar93 = pfVar93 + 4;
                    pfVar92 = pfVar92 + 4;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar85 = pauVar85 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            auVar110._8_4_ = 0x3f800000;
            auVar110._0_8_ = 0x3f8000003f800000;
            auVar110._12_4_ = 0x3f800000;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                auVar131 = vrcpps_avx(auVar132);
                fVar395 = auVar131._0_4_;
                auVar275._0_4_ = auVar132._0_4_ * fVar395;
                fVar424 = auVar131._4_4_;
                auVar275._4_4_ = auVar132._4_4_ * fVar424;
                fVar425 = auVar131._8_4_;
                auVar275._8_4_ = auVar132._8_4_ * fVar425;
                fVar426 = auVar131._12_4_;
                auVar275._12_4_ = auVar132._12_4_ * fVar426;
                auVar132 = vsubps_avx(auVar110,auVar275);
                sVar11 = pMVar9->elemsize;
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  pfVar92 = (float *)((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  fVar427 = pfVar92[1];
                  fVar15 = pfVar92[2];
                  fVar16 = pfVar92[3];
                  pfVar93 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  *pfVar93 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar92;
                  pfVar93[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                  pfVar93[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                  pfVar93[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar91 + lVar95)));
                    auVar132 = vshufps_avx(auVar132,auVar132,0);
                    pfVar92 = (float *)((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                    auVar299._0_4_ = auVar132._0_4_ * *pfVar92;
                    auVar299._4_4_ = auVar132._4_4_ * pfVar92[1];
                    auVar299._8_4_ = auVar132._8_4_ * pfVar92[2];
                    auVar299._12_4_ = auVar132._12_4_ * pfVar92[3];
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar299;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_110 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      fVar395 = *(float *)((long)pvVar91 + lVar95);
                      auVar176._4_4_ = fVar395;
                      auVar176._0_4_ = fVar395;
                      auVar176._8_4_ = fVar395;
                      auVar176._12_4_ = fVar395;
                      auVar132 = *(undefined1 (*) [16])
                                  ((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                      auVar131 = vrcpps_avx(auVar132);
                      fVar424 = fVar395 * auVar131._0_4_;
                      fVar425 = fVar395 * auVar131._4_4_;
                      fVar426 = fVar395 * auVar131._8_4_;
                      fVar395 = fVar395 * auVar131._12_4_;
                      auVar331._0_4_ = auVar132._0_4_ * fVar424;
                      auVar331._4_4_ = auVar132._4_4_ * fVar425;
                      auVar331._8_4_ = auVar132._8_4_ * fVar426;
                      auVar331._12_4_ = auVar132._12_4_ * fVar395;
                      auVar132 = vsubps_avx(auVar176,auVar331);
                      auVar177._0_4_ = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                      auVar177._4_4_ = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                      auVar177._8_4_ = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                      auVar177._12_4_ = fVar395 + auVar131._12_4_ * auVar132._12_4_;
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar177;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00262d29:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_110 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                auVar145._8_4_ = 0x3f800000;
                auVar145._0_8_ = 0x3f8000003f800000;
                auVar145._12_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pfVar92 = (float *)(this_00->cstep * uVar83 * this_00->elemsize +
                                       (long)this_00->data);
                    pfVar93 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                       (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        auVar131 = vrcpps_avx(auVar132);
                        fVar395 = auVar131._0_4_;
                        auVar308._0_4_ = auVar132._0_4_ * fVar395;
                        fVar424 = auVar131._4_4_;
                        auVar308._4_4_ = auVar132._4_4_ * fVar424;
                        fVar425 = auVar131._8_4_;
                        auVar308._8_4_ = auVar132._8_4_ * fVar425;
                        fVar426 = auVar131._12_4_;
                        auVar308._12_4_ = auVar132._12_4_ * fVar426;
                        auVar132 = vsubps_avx(auVar145,auVar308);
                        uVar102 = uVar82;
                        do {
                          fVar427 = pfVar93[1];
                          fVar15 = pfVar93[2];
                          fVar16 = pfVar93[3];
                          *pfVar92 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar93;
                          pfVar92[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                          pfVar92[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                          pfVar92[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                          pfVar93 = pfVar93 + 4;
                          pfVar92 = pfVar92 + 4;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_110 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = *(undefined1 (*) [16])((long)pvVar98 + lVar95);
                          auVar131 = *(undefined1 (*) [16])
                                      ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          auVar111 = vrcpps_avx(auVar131);
                          fVar395 = auVar132._0_4_ * auVar111._0_4_;
                          fVar424 = auVar132._4_4_ * auVar111._4_4_;
                          fVar425 = auVar132._8_4_ * auVar111._8_4_;
                          fVar426 = auVar132._12_4_ * auVar111._12_4_;
                          auVar325._0_4_ = auVar131._0_4_ * fVar395;
                          auVar325._4_4_ = auVar131._4_4_ * fVar424;
                          auVar325._8_4_ = auVar131._8_4_ * fVar425;
                          auVar325._12_4_ = auVar131._12_4_ * fVar426;
                          auVar132 = vsubps_avx(auVar132,auVar325);
                          auVar169._0_4_ = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                          auVar169._4_4_ = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                          auVar169._8_4_ = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                          auVar169._12_4_ = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar169;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar6 == uVar8 && uVar5 == uVar7) & uVar100 != 1 & (byte)local_128) == 1) {
            local_110 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar131 = *pauVar90;
                          auVar111 = vrcpps_avx(auVar131);
                          fVar395 = auVar132._0_4_ * auVar111._0_4_;
                          fVar424 = auVar132._4_4_ * auVar111._4_4_;
                          fVar425 = auVar132._8_4_ * auVar111._8_4_;
                          fVar426 = auVar132._12_4_ * auVar111._12_4_;
                          auVar335._0_4_ = auVar131._0_4_ * fVar395;
                          auVar335._4_4_ = auVar131._4_4_ * fVar424;
                          auVar335._8_4_ = auVar131._8_4_ * fVar425;
                          auVar335._12_4_ = auVar131._12_4_ * fVar426;
                          auVar131 = vsubps_avx(auVar132,auVar335);
                          auVar336._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                          auVar336._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                          auVar336._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                          auVar336._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                          *pauVar85 = auVar336;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_110 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_110) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = *(undefined1 (*) [16])
                                      ((long)pvVar12 +
                                      lVar95 + sVar106 * (long)local_130 * (long)local_158);
                          auVar131 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                          auVar111 = vrcpps_avx(auVar131);
                          fVar395 = auVar132._0_4_ * auVar111._0_4_;
                          fVar424 = auVar132._4_4_ * auVar111._4_4_;
                          fVar425 = auVar132._8_4_ * auVar111._8_4_;
                          fVar426 = auVar132._12_4_ * auVar111._12_4_;
                          auVar344._0_4_ = auVar131._0_4_ * fVar395;
                          auVar344._4_4_ = auVar131._4_4_ * fVar424;
                          auVar344._8_4_ = auVar131._8_4_ * fVar425;
                          auVar344._12_4_ = auVar131._12_4_ * fVar426;
                          auVar132 = vsubps_avx(auVar132,auVar344);
                          auVar186._0_4_ = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                          auVar186._4_4_ = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                          auVar186._8_4_ = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                          auVar186._12_4_ = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar186;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_110);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_110 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_110) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_128 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_128 + (long)pvVar91);
                uStack_f0 = local_128;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = *(undefined1 (*) [16])
                                ((long)pvVar12 + lVar95 + sVar106 * sVar11 * (long)local_158);
                    auVar131 = *(undefined1 (*) [16])
                                ((long)pvVar91 + lVar95 + local_138 * local_128 * (long)local_158);
                    auVar111 = vrcpps_avx(auVar131);
                    fVar395 = auVar132._0_4_ * auVar111._0_4_;
                    fVar424 = auVar132._4_4_ * auVar111._4_4_;
                    fVar425 = auVar132._8_4_ * auVar111._8_4_;
                    fVar426 = auVar132._12_4_ * auVar111._12_4_;
                    auVar345._0_4_ = auVar131._0_4_ * fVar395;
                    auVar345._4_4_ = auVar131._4_4_ * fVar424;
                    auVar345._8_4_ = auVar131._8_4_ * fVar425;
                    auVar345._12_4_ = auVar131._12_4_ * fVar426;
                    auVar132 = vsubps_avx(auVar132,auVar345);
                    auVar191._0_4_ = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                    auVar191._4_4_ = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                    auVar191._8_4_ = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                    auVar191._12_4_ = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar191;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_110);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_128 = CONCAT71(local_128._1_7_,uVar99 == 1);
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_110 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00262d29;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar131 = *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82)
                ;
                auVar111 = vrcpps_avx(auVar131);
                fVar395 = auVar132._0_4_ * auVar111._0_4_;
                fVar424 = auVar132._4_4_ * auVar111._4_4_;
                fVar425 = auVar132._8_4_ * auVar111._8_4_;
                fVar426 = auVar132._12_4_ * auVar111._12_4_;
                auVar321._0_4_ = auVar131._0_4_ * fVar395;
                auVar321._4_4_ = auVar131._4_4_ * fVar424;
                auVar321._8_4_ = auVar131._8_4_ * fVar425;
                auVar321._12_4_ = auVar131._12_4_ * fVar426;
                auVar131 = vsubps_avx(auVar132,auVar321);
                auVar322._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                auVar322._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                auVar322._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                auVar322._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar322;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar132 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                        *(undefined1 (*) [16])((long)pvVar98 + lVar95));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar135._4_4_ = uVar4;
              auVar135._0_4_ = uVar4;
              auVar135._8_4_ = uVar4;
              auVar135._12_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar132 = vmaxps_avx(auVar135,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar131 = vmaxps_avx(auVar132,*pauVar88);
                      *pauVar85 = auVar131;
                      pauVar88 = pauVar88 + 1;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar131 = vmaxps_avx(auVar132,*(undefined1 (*) [16])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar134._4_4_ = uVar4;
              auVar134._0_4_ = uVar4;
              auVar134._8_4_ = uVar4;
              auVar134._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vmaxps_avx(auVar134,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar133._4_4_ = uVar4;
              auVar133._0_4_ = uVar4;
              auVar133._8_4_ = uVar4;
              auVar133._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vmaxps_avx(auVar133,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar112._4_4_ = uVar4;
          auVar112._0_4_ = uVar4;
          auVar112._8_4_ = uVar4;
          auVar112._12_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar132 = vmaxps_avx(auVar112,*(undefined1 (*) [16])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar132;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar90 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar88 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar88;
                      uVar99 = uVar100;
                      do {
                        auVar131 = vmaxps_avx(auVar132,*pauVar90);
                        *pauVar85 = auVar131;
                        pauVar90 = pauVar90 + 1;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar88 = pauVar88 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar132 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                    *(undefined1 (*) [16])((long)pvVar98 + lVar95));
              *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar90 = (undefined1 (*) [16])pMVar9->data;
              pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar88;
                  uVar81 = uVar82;
                  do {
                    auVar131 = vmaxps_avx(auVar132,*pauVar90);
                    *pauVar85 = auVar131;
                    pauVar90 = pauVar90 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar88 = pauVar88 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar155._4_4_ = uVar4;
            auVar155._0_4_ = uVar4;
            auVar155._8_4_ = uVar4;
            auVar155._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar132 = vmaxps_avx(auVar155,*(undefined1 (*) [16])((long)pvVar12 + lVar95));
              *(undefined1 (*) [16])((long)*pauVar85 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar131 = vmaxps_avx(auVar132,*(undefined1 (*) [16])
                                                    ((long)pvVar91 +
                                                    lVar95 + sVar13 * sVar14 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar131;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar156._4_4_ = uVar4;
            auVar156._0_4_ = uVar4;
            auVar156._8_4_ = uVar4;
            auVar156._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar132 = vmaxps_avx(auVar156,*(undefined1 (*) [16])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar132;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar88 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar131 = vmaxps_avx(auVar132,*pauVar88);
                    *pauVar85 = auVar131;
                    pauVar88 = pauVar88 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar131 = vmaxps_avx(auVar132,*(undefined1 (*) [16])
                                                  ((long)pvVar12 +
                                                  lVar95 + sVar106 * sVar11 * uVar82));
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar122._4_4_ = uVar4;
                    auVar122._0_4_ = uVar4;
                    auVar122._8_4_ = uVar4;
                    auVar122._12_4_ = uVar4;
                    auVar132 = vmaxps_avx(auVar122,*(undefined1 (*) [16])
                                                    ((long)pvVar12 +
                                                    lVar95 * 4 + sVar106 * sVar11 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar132;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar174._4_4_ = uVar4;
                      auVar174._0_4_ = uVar4;
                      auVar174._8_4_ = uVar4;
                      auVar174._12_4_ = uVar4;
                      auVar132 = vmaxps_avx(auVar174,*(undefined1 (*) [16])
                                                      ((long)pvVar12 +
                                                      lVar95 * 4 + sVar106 * sVar11 * uVar82));
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar132;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00262079:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar131 = vmaxps_avx(auVar132,*pauVar90);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar98 + lVar95),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ));
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar131 = vmaxps_avx(auVar132,*pauVar90);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vmaxps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar95 + sVar106 * (long)local_130 *
                                                          (long)local_158),
                                                *(undefined1 (*) [16])((long)pvVar91 + lVar95));
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = vmaxps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * sVar11 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar91 +
                                           lVar95 + local_138 * local_110 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar132;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00262079;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar131 = vmaxps_avx(auVar132,*(undefined1 (*) [16])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar131;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar132 = vminps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                        *(undefined1 (*) [16])((long)pvVar98 + lVar95));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar150._4_4_ = uVar4;
              auVar150._0_4_ = uVar4;
              auVar150._8_4_ = uVar4;
              auVar150._12_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar132 = vminps_avx(auVar150,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar131 = vminps_avx(auVar132,*pauVar88);
                      *pauVar85 = auVar131;
                      pauVar88 = pauVar88 + 1;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar131 = vminps_avx(auVar132,*(undefined1 (*) [16])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar149._4_4_ = uVar4;
              auVar149._0_4_ = uVar4;
              auVar149._8_4_ = uVar4;
              auVar149._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vminps_avx(auVar149,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar146._4_4_ = uVar4;
              auVar146._0_4_ = uVar4;
              auVar146._8_4_ = uVar4;
              auVar146._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vminps_avx(auVar146,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar117._4_4_ = uVar4;
          auVar117._0_4_ = uVar4;
          auVar117._8_4_ = uVar4;
          auVar117._12_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar132 = vminps_avx(auVar117,*(undefined1 (*) [16])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar132;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar90 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar88 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar88;
                      uVar99 = uVar100;
                      do {
                        auVar131 = vminps_avx(auVar132,*pauVar90);
                        *pauVar85 = auVar131;
                        pauVar90 = pauVar90 + 1;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar88 = pauVar88 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar132 = vminps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                    *(undefined1 (*) [16])((long)pvVar98 + lVar95));
              *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar90 = (undefined1 (*) [16])pMVar9->data;
              pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar88;
                  uVar81 = uVar82;
                  do {
                    auVar131 = vminps_avx(auVar132,*pauVar90);
                    *pauVar85 = auVar131;
                    pauVar90 = pauVar90 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar88 = pauVar88 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar162._4_4_ = uVar4;
            auVar162._0_4_ = uVar4;
            auVar162._8_4_ = uVar4;
            auVar162._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar132 = vminps_avx(auVar162,*(undefined1 (*) [16])((long)pvVar12 + lVar95));
              *(undefined1 (*) [16])((long)*pauVar85 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar131 = vminps_avx(auVar132,*(undefined1 (*) [16])
                                                    ((long)pvVar91 +
                                                    lVar95 + sVar13 * sVar14 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar131;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar165._4_4_ = uVar4;
            auVar165._0_4_ = uVar4;
            auVar165._8_4_ = uVar4;
            auVar165._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar132 = vminps_avx(auVar165,*(undefined1 (*) [16])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar132;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar88 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar131 = vminps_avx(auVar132,*pauVar88);
                    *pauVar85 = auVar131;
                    pauVar88 = pauVar88 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar131 = vminps_avx(auVar132,*(undefined1 (*) [16])
                                                  ((long)pvVar12 +
                                                  lVar95 + sVar106 * sVar11 * uVar82));
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar126._4_4_ = uVar4;
                    auVar126._0_4_ = uVar4;
                    auVar126._8_4_ = uVar4;
                    auVar126._12_4_ = uVar4;
                    auVar132 = vminps_avx(auVar126,*(undefined1 (*) [16])
                                                    ((long)pvVar12 +
                                                    lVar95 * 4 + sVar106 * sVar11 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar132;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar181._4_4_ = uVar4;
                      auVar181._0_4_ = uVar4;
                      auVar181._8_4_ = uVar4;
                      auVar181._12_4_ = uVar4;
                      auVar132 = vminps_avx(auVar181,*(undefined1 (*) [16])
                                                      ((long)pvVar12 +
                                                      lVar95 * 4 + sVar106 * sVar11 * uVar82));
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar132;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_002638e9:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar131 = vminps_avx(auVar132,*pauVar90);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vminps_avx(*(undefined1 (*) [16])((long)pvVar98 + lVar95),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ));
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar131 = vminps_avx(auVar132,*pauVar90);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vminps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar95 + sVar106 * (long)local_130 *
                                                          (long)local_158),
                                                *(undefined1 (*) [16])((long)pvVar91 + lVar95));
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = vminps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * sVar11 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar91 +
                                           lVar95 + local_138 * local_110 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar132;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_002638e9;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar131 = vminps_avx(auVar132,*(undefined1 (*) [16])
                                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82))
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar131;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar99 = pMVar9->w;
      local_110 = (size_t)uVar99;
      local_60 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      uVar82 = (ulong)uVar6;
      sVar106 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar100);
      local_128 = uVar82;
      if (iVar94 == 1) {
        local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar100);
        iVar94 = pMVar9[1].dims;
        if (iVar80 == 1 && uVar99 == 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar100,sVar106,uVar101,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *pMVar9->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)local_130) {
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              iVar80 = (int)local_130;
              do {
                pauVar85 = (undefined1 (*) [16])((long)pvVar91 + lVar95);
                uVar269 = *(undefined8 *)(*pauVar85 + 8);
                local_80._0_16_ = *pauVar85;
                afVar428 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                      (__m128 *)local_80);
                puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
                *puVar103 = afVar428._0_8_;
                puVar103[1] = uVar269;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
          }
          else if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar106,uVar101,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *pMVar9->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)local_90) {
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              iVar80 = (int)local_90;
              do {
                pauVar85 = (undefined1 (*) [16])((long)pvVar91 + lVar95);
                uVar269 = *(undefined8 *)(*pauVar85 + 8);
                local_80._0_16_ = *pauVar85;
                afVar428 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                      (__m128 *)local_80);
                puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
                *puVar103 = afVar428._0_8_;
                puVar103[1] = uVar269;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
          }
          else if (iVar94 == 3) {
            Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep == 0) {
              return -100;
            }
            local_100._4_4_ = *pMVar9->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)uVar6) {
              local_150 = 0;
              do {
                if (0 < (int)local_90) {
                  sVar106 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0[1].cstep;
                  sVar14 = local_a0[1].elemsize;
                  pvVar91 = local_a0[1].data;
                  lVar95 = 0;
                  iVar80 = (int)local_90;
                  do {
                    pauVar85 = (undefined1 (*) [16])
                               ((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                    auVar270 = ZEXT856(*(ulong *)(*pauVar85 + 8));
                    local_80._0_16_ = *pauVar85;
                    afVar428 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                          (__m128 *)local_80);
                    auVar258._0_8_ = afVar428._0_8_;
                    auVar258._8_56_ = auVar270;
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150) =
                         auVar258._0_16_;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_128);
            }
          }
        }
        else if (iVar94 == 1) {
          Mat::create(this_00,uVar99,local_60,iVar80,opt->blob_allocator);
          afVar252 = _local_100;
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (uVar101 == 1 && pMVar9[1].w == 1) {
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            _uStack_f0 = afVar252._16_16_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < (int)local_110) {
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              sVar106 = local_110;
              do {
                pauVar85 = (undefined1 (*) [16])((long)pvVar91 + lVar95);
                uVar269 = *(undefined8 *)(*pauVar85 + 8);
                local_80._0_16_ = *pauVar85;
                afVar428 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                      (__m128 *)local_100);
                *(undefined8 *)((long)pvVar12 + lVar95) = afVar428._0_8_;
                ((undefined8 *)((long)pvVar12 + lVar95))[1] = uVar269;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)sVar106 - 1;
                sVar106 = (size_t)uVar101;
              } while (uVar101 != 0);
            }
          }
          else {
            if ((int)local_110 < 1) {
              return 0;
            }
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            sVar106 = local_110;
            do {
              _local_100 = (__m128)*(undefined1 (*) [16])((long)pvVar91 + lVar95);
              pauVar85 = (undefined1 (*) [16])((long)pvVar98 + lVar95);
              uVar269 = *(undefined8 *)(*pauVar85 + 8);
              local_80._0_16_ = *pauVar85;
              afVar428 = binary_op_pow_pack4::operator()
                                   ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                    (__m128 *)local_80);
              *(undefined8 *)((long)pvVar12 + lVar95) = afVar428._0_8_;
              ((undefined8 *)((long)pvVar12 + lVar95))[1] = uVar269;
              lVar95 = lVar95 + 0x10;
              uVar101 = (int)sVar106 - 1;
              sVar106 = (size_t)uVar101;
            } while (uVar101 != 0);
          }
        }
        else {
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar106,uVar101,opt->blob_allocator);
            puVar103 = (undefined8 *)this_00->data;
            if (puVar103 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                local_158 = (__m256 *)pMVar9->data;
                pauVar85 = (undefined1 (*) [16])pMVar9[1].data;
                uVar101 = 0;
                do {
                  _local_100 = (__m128)*(undefined1 (*) [16])local_158;
                  iVar80 = (int)local_130;
                  if (0 < (int)local_130) {
                    do {
                      uVar269 = *(undefined8 *)(*pauVar85 + 8);
                      local_80._0_16_ = *pauVar85;
                      afVar428 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                            (__m128 *)local_80);
                      *puVar103 = afVar428._0_8_;
                      puVar103[1] = uVar269;
                      pauVar85 = pauVar85 + 1;
                      puVar103 = puVar103 + 2;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  local_158 = (__m256 *)((long)local_158 + 0x10);
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 == 3) {
            Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_150 = 0;
                do {
                  _local_100 = (__m128)*(undefined1 (*) [16])
                                        ((long)local_a0->data + local_150 * 0x10);
                  if (0 < (int)local_90) {
                    sVar106 = local_120->cstep;
                    sVar11 = local_120->elemsize;
                    pvVar12 = local_120->data;
                    sVar13 = local_a0[1].cstep;
                    sVar14 = local_a0[1].elemsize;
                    pvVar91 = local_a0[1].data;
                    lVar95 = 0;
                    iVar80 = (int)local_90;
                    do {
                      pauVar85 = (undefined1 (*) [16])
                                 ((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                      uVar269 = *(undefined8 *)(*pauVar85 + 8);
                      local_80._0_16_ = *pauVar85;
                      afVar428 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                            (__m128 *)local_80);
                      puVar103 = (undefined8 *)
                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150);
                      *puVar103 = afVar428._0_8_;
                      puVar103[1] = uVar269;
                      lVar95 = lVar95 + 0x10;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
      }
      else {
        uVar7 = pMVar9->h;
        local_138 = (ulong)uVar7;
        local_104 = uVar7 * uVar99;
        if (iVar94 == 2) {
          if (pMVar9[1].dims == 3) {
            Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)uVar6) {
                local_138 = 0;
                do {
                  if (0 < (int)uVar5) {
                    pauVar88 = (undefined1 (*) [16])
                               (local_120->cstep * local_138 * local_120->elemsize +
                               (long)local_120->data);
                    pauVar90 = (undefined1 (*) [16])
                               (local_a0[1].cstep * local_138 * local_a0[1].elemsize +
                               (long)local_a0[1].data);
                    pauVar85 = (undefined1 (*) [16])
                               ((long)local_a0->w * local_138 * local_a0->elemsize +
                               (long)local_a0->data);
                    uVar101 = 0;
                    do {
                      _local_100 = (__m128)*pauVar85;
                      iVar80 = (int)local_130;
                      if (0 < (int)local_130) {
                        do {
                          auVar270 = ZEXT856(*(ulong *)(*pauVar90 + 8));
                          local_80._0_16_ = *pauVar90;
                          afVar428 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar257._0_8_ = afVar428._0_8_;
                          auVar257._8_56_ = auVar270;
                          *pauVar88 = auVar257._0_16_;
                          pauVar90 = pauVar90 + 1;
                          pauVar88 = pauVar88 + 1;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      pauVar85 = pauVar85 + 1;
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_138 = local_138 + 1;
                } while (local_138 != local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = CONCAT44(uVar4,uVar101);
          Mat::create(this_00,uVar99,uVar7,local_60,iVar80,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar9[1].dims == 1) {
            Mat::create(this_00,(int)local_110,(int)local_138,local_60,iVar80,opt->blob_allocator);
            afVar252 = _local_100;
            puVar103 = (undefined8 *)this_00->data;
            if (puVar103 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_128 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)local_138) {
                pauVar85 = (undefined1 (*) [16])pMVar9->data;
                local_158 = (__m256 *)pMVar9[1].data;
                iVar80 = 0;
                do {
                  _local_100 = (__m128)*(undefined1 (*) [16])local_158;
                  uVar82 = local_110 & 0xffffffff;
                  if (0 < (int)local_110) {
                    do {
                      uVar269 = *(undefined8 *)(*pauVar85 + 8);
                      local_80._0_16_ = *pauVar85;
                      afVar428 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                            (__m128 *)local_100);
                      *puVar103 = afVar428._0_8_;
                      puVar103[1] = uVar269;
                      pauVar85 = pauVar85 + 1;
                      puVar103 = puVar103 + 2;
                      uVar101 = (int)uVar82 - 1;
                      uVar82 = (ulong)uVar101;
                    } while (uVar101 != 0);
                  }
                  local_158 = (__m256 *)((long)local_158 + 0x10);
                  iVar80 = iVar80 + 1;
                } while (iVar80 != (int)local_138);
                return 0;
              }
              return 0;
            }
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            _uStack_f0 = afVar252._16_16_;
            fStack_f4 = (float)local_100._4_4_;
            if (0 < local_104) {
              pvVar12 = pMVar9->data;
              lVar95 = 0;
              iVar80 = local_104;
              do {
                pauVar85 = (undefined1 (*) [16])((long)pvVar12 + lVar95);
                uVar269 = *(undefined8 *)(*pauVar85 + 8);
                local_80._0_16_ = *pauVar85;
                afVar428 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                      (__m128 *)local_100);
                *(undefined8 *)((long)puVar103 + lVar95) = afVar428._0_8_;
                ((undefined8 *)((long)puVar103 + lVar95))[1] = uVar269;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
          }
          else if (pMVar9[1].dims == 2) {
            if (local_104 < 1) {
              return 0;
            }
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            iVar80 = local_104;
            do {
              _local_100 = (__m128)*(undefined1 (*) [16])((long)pvVar91 + lVar95);
              pauVar85 = (undefined1 (*) [16])((long)pvVar98 + lVar95);
              uVar269 = *(undefined8 *)(*pauVar85 + 8);
              local_80._0_16_ = *pauVar85;
              afVar428 = binary_op_pow_pack4::operator()
                                   ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_100,
                                    (__m128 *)local_80);
              puVar103 = (undefined8 *)((long)pvVar12 + lVar95);
              *puVar103 = afVar428._0_8_;
              puVar103[1] = uVar269;
              lVar95 = lVar95 + 0x10;
              iVar80 = iVar80 + -1;
            } while (iVar80 != 0);
          }
        }
        else if (iVar94 == 3) {
          uVar8 = pMVar9->c;
          local_98 = (ulong)uVar8;
          if (pMVar9[1].dims == 3) {
            local_90 = CONCAT44(local_90._4_4_,uVar5 * uVar100);
            if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
              Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)uVar8) {
                  local_150 = 0;
                  do {
                    pvVar12 = local_a0->data;
                    sVar106 = local_a0->elemsize;
                    sVar11 = local_a0->cstep;
                    pvVar91 = local_120->data;
                    sVar13 = local_120->elemsize;
                    sVar14 = local_120->cstep;
                    _local_100 = (__m128)*(undefined1 (*) [16])
                                          ((long)local_a0[1].data +
                                          local_a0[1].cstep * local_150 * local_a0[1].elemsize);
                    if (0 < local_104) {
                      lVar95 = 0;
                      iVar80 = local_104;
                      do {
                        pauVar85 = (undefined1 (*) [16])
                                   ((long)pvVar12 + lVar95 + sVar11 * sVar106 * local_150);
                        uVar269 = *(undefined8 *)(*pauVar85 + 8);
                        local_80._0_16_ = *pauVar85;
                        afVar428 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                              (__m128 *)local_100);
                        puVar103 = (undefined8 *)
                                   ((long)pvVar91 + lVar95 + sVar14 * sVar13 * local_150);
                        *puVar103 = afVar428._0_8_;
                        puVar103[1] = uVar269;
                        lVar95 = lVar95 + 0x10;
                        iVar80 = iVar80 + -1;
                      } while (iVar80 != 0);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (uVar100 == uVar99) {
              if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
                Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)uVar8) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < local_104) {
                        lVar95 = local_a0->cstep * local_a0->elemsize * (long)local_130;
                        pvVar12 = local_a0->data;
                        pvVar91 = local_a0[1].data;
                        lVar96 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar98 = local_120->data;
                        lVar108 = 0;
                        iVar80 = local_104;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])
                                                ((long)pvVar12 + lVar108 * 4 + lVar95);
                          uVar4 = *(undefined4 *)((long)pvVar91 + lVar108);
                          auVar127._4_4_ = uVar4;
                          auVar127._0_4_ = uVar4;
                          auVar127._8_4_ = uVar4;
                          auVar127._12_4_ = uVar4;
                          auVar270 = ZEXT856(auVar127._8_8_);
                          local_80[0] = (float)uVar4;
                          local_80[1] = (float)uVar4;
                          local_80[2] = (float)uVar4;
                          local_80[3] = (float)uVar4;
                          afVar428 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar260._0_8_ = afVar428._0_8_;
                          auVar260._8_56_ = auVar270;
                          *(undefined1 (*) [16])((long)pvVar98 + lVar108 * 4 + lVar96) =
                               auVar260._0_16_;
                          lVar108 = lVar108 + 4;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if ((uVar99 == 1 && uVar7 == 1) && uVar6 == uVar8) {
LAB_0026724c:
                Mat::create(this_00,uVar100,uVar5,uVar6,sVar106,uVar101,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_150 = 0;
                    do {
                      pvVar12 = local_120->data;
                      sVar106 = local_120->elemsize;
                      sVar11 = local_120->cstep;
                      pvVar91 = local_a0[1].data;
                      sVar13 = local_a0[1].cstep;
                      sVar14 = local_a0[1].elemsize;
                      _local_100 = (__m128)*(undefined1 (*) [16])
                                            ((long)local_a0->data +
                                            local_a0->cstep * local_150 * local_a0->elemsize);
                      if (0 < (int)local_90) {
                        lVar95 = 0;
                        iVar80 = (int)local_90;
                        do {
                          pauVar85 = (undefined1 (*) [16])
                                     ((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                          uVar269 = *(undefined8 *)(*pauVar85 + 8);
                          local_80._0_16_ = *pauVar85;
                          afVar428 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          puVar103 = (undefined8 *)
                                     ((long)pvVar12 + lVar95 + sVar11 * sVar106 * local_150);
                          *puVar103 = afVar428._0_8_;
                          puVar103[1] = uVar269;
                          lVar95 = lVar95 + 0x10;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if (iVar80 == 1 && (uVar8 == 1 && uVar5 == uVar7)) {
                Mat::create(this_00,uVar99,uVar7,uVar6,sVar106,uVar101,opt->blob_allocator);
                if (local_120->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_128) {
                    local_130 = (void *)0x0;
                    do {
                      if (0 < (int)local_90) {
                        lVar95 = local_a0[1].cstep * local_a0[1].elemsize * (long)local_130;
                        pvVar12 = local_a0[1].data;
                        pvVar91 = local_a0->data;
                        lVar96 = local_120->cstep * local_120->elemsize * (long)local_130;
                        pvVar98 = local_120->data;
                        lVar108 = 0;
                        iVar80 = (int)local_90;
                        do {
                          afVar252 = _local_100;
                          local_100._4_4_ = *(float *)((long)pvVar91 + lVar108);
                          local_100._0_4_ = local_100._4_4_;
                          fStack_f8 = (float)local_100._4_4_;
                          _uStack_f0 = afVar252._16_16_;
                          fStack_f4 = (float)local_100._4_4_;
                          pauVar85 = (undefined1 (*) [16])((long)pvVar12 + lVar108 * 4 + lVar95);
                          auVar270 = ZEXT856(*(ulong *)(*pauVar85 + 8));
                          local_80._0_16_ = *pauVar85;
                          afVar428 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar264._0_8_ = afVar428._0_8_;
                          auVar264._8_56_ = auVar270;
                          *(undefined1 (*) [16])((long)pvVar98 + lVar108 * 4 + lVar96) =
                               auVar264._0_16_;
                          lVar108 = lVar108 + 4;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_130 = (void *)((long)local_130 + 1);
                    } while (local_130 != (void *)local_128);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
            }
            else if ((uVar99 == 1 && uVar7 == 1) && uVar6 == uVar8) goto LAB_0026724c;
            local_90 = CONCAT71(local_90._1_7_,uVar7 == 1);
            local_128 = (ulong)uVar101;
            if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
              Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
              if (local_120->data == (void *)0x0) {
                return -100;
              }
              if ((long)local_120->c * local_120->cstep != 0) {
                if (0 < (int)local_98) {
                  local_150 = 0;
                  do {
                    if (0 < (int)local_138) {
                      sVar106 = local_a0[1].cstep;
                      sVar11 = local_a0[1].elemsize;
                      pvVar12 = local_a0[1].data;
                      pauVar85 = (undefined1 (*) [16])
                                 (local_120->cstep * local_150 * local_120->elemsize +
                                 (long)local_120->data);
                      pauVar90 = (undefined1 (*) [16])
                                 (local_a0->cstep * local_150 * local_a0->elemsize +
                                 (long)local_a0->data);
                      uVar82 = 0;
                      do {
                        _local_100 = (__m128)*(undefined1 (*) [16])
                                              ((long)pvVar12 +
                                              uVar82 * 0x10 + sVar106 * local_150 * sVar11);
                        uVar81 = local_110 & 0xffffffff;
                        if (0 < (int)local_110) {
                          do {
                            auVar270 = ZEXT856(*(ulong *)(*pauVar90 + 8));
                            local_80._0_16_ = *pauVar90;
                            afVar428 = binary_op_pow_pack4::operator()
                                                 ((binary_op_pow_pack4 *)&local_139,
                                                  (__m128 *)local_80,(__m128 *)local_100);
                            auVar261._0_8_ = afVar428._0_8_;
                            auVar261._8_56_ = auVar270;
                            *pauVar85 = auVar261._0_16_;
                            pauVar90 = pauVar90 + 1;
                            pauVar85 = pauVar85 + 1;
                            uVar101 = (int)uVar81 - 1;
                            uVar81 = (ulong)uVar101;
                          } while (uVar101 != 0);
                        }
                        uVar82 = uVar82 + 1;
                      } while (uVar82 != local_138);
                    }
                    local_150 = local_150 + 1;
                  } while (local_150 != local_98);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar100 != uVar99 || (uVar5 ^ 1) != 0) || uVar8 != uVar6) || uVar7 == 1) {
              if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
                Mat::create(this_00,uVar100,uVar7,uVar8,sVar106,uVar101,opt->blob_allocator);
                if (this_00->data == (void *)0x0) {
                  return -100;
                }
                if ((long)local_120->c * local_120->cstep != 0) {
                  if (0 < (int)local_98) {
                    local_150 = 0;
                    do {
                      if (0 < (int)local_138) {
                        sVar106 = local_a0->cstep;
                        sVar11 = local_a0->elemsize;
                        pvVar12 = local_a0->data;
                        pauVar85 = (undefined1 (*) [16])
                                   (local_120->cstep * local_150 * local_120->elemsize +
                                   (long)local_120->data);
                        pauVar90 = (undefined1 (*) [16])
                                   (local_a0[1].cstep * local_150 * local_a0[1].elemsize +
                                   (long)local_a0[1].data);
                        uVar82 = 0;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])
                                                ((long)pvVar12 +
                                                uVar82 * 0x10 + sVar106 * local_150 * sVar11);
                          iVar80 = (int)local_130;
                          if (0 < (int)local_130) {
                            do {
                              auVar270 = ZEXT856(*(ulong *)(*pauVar90 + 8));
                              local_80._0_16_ = *pauVar90;
                              afVar428 = binary_op_pow_pack4::operator()
                                                   ((binary_op_pow_pack4 *)&local_139,
                                                    (__m128 *)local_100,(__m128 *)local_80);
                              auVar265._0_8_ = afVar428._0_8_;
                              auVar265._8_56_ = auVar270;
                              *pauVar85 = auVar265._0_16_;
                              pauVar90 = pauVar90 + 1;
                              pauVar85 = pauVar85 + 1;
                              iVar80 = iVar80 + -1;
                            } while (iVar80 != 0);
                          }
                          uVar82 = uVar82 + 1;
                        } while (uVar82 != local_138);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_98);
                    return 0;
                  }
                  return 0;
                }
                return -100;
              }
              if ((uVar7 == 1 && uVar6 == uVar8) && (uVar5 != 1 && uVar100 == uVar99)) {
                Mat::create(this_00,uVar99,uVar5,uVar8,sVar106,uVar101,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    local_130 = (void *)(local_110 << 4);
                    local_138 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar252 = _local_100;
                      bVar109 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      sVar106 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      sVar11 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])(sVar106 * local_138 * sVar11 + (long)pvVar12);
                      uStack_f0 = sVar11;
                      fStack_e4 = afVar252[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      pvVar91 = (void *)(pMVar1[1].cstep * local_138 * pMVar1[1].elemsize +
                                        (long)pMVar1[1].data);
                      local_d8 = bVar109 ^ 3;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])pvVar91;
                      uStack_f0 = pMVar1[1].elemsize;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_120->d;
                      }
                      sVar13 = local_120->elemsize;
                      pvVar98 = (void *)(local_120->cstep * local_138 * sVar13 +
                                        (long)local_120->data);
                      local_d8 = bVar109 ^ 3;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])pvVar98;
                      uStack_f0._0_4_ = (float)(int)sVar13;
                      uStack_f0._4_4_ = (float)(int)(sVar13 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      if (0 < (int)uVar5) {
                        lVar95 = sVar106 * sVar11 * local_138;
                        uVar101 = 0;
                        uVar82 = local_110;
                        do {
                          pvVar79 = local_130;
                          if (0 < (int)uVar82) {
                            lVar96 = 0;
                            do {
                              _local_100 = (__m128)*(undefined1 (*) [16])
                                                    ((long)pvVar12 + lVar96 + lVar95);
                              auVar270 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])
                                                             ((long)pvVar91 + lVar96) + 8));
                              local_80._0_16_ = *(undefined1 (*) [16])((long)pvVar91 + lVar96);
                              afVar428 = binary_op_pow_pack4::operator()
                                                   ((binary_op_pow_pack4 *)&local_139,
                                                    (__m128 *)local_100,(__m128 *)local_80);
                              auVar266._0_8_ = afVar428._0_8_;
                              auVar266._8_56_ = auVar270;
                              *(undefined1 (*) [16])((long)pvVar98 + lVar96) = auVar266._0_16_;
                              lVar96 = lVar96 + 0x10;
                            } while (pvVar79 != (void *)lVar96);
                            pvVar98 = (void *)((long)pvVar98 + lVar96);
                            pvVar91 = (void *)((long)pvVar91 + lVar96);
                            uVar82 = local_110;
                          }
                          uVar101 = uVar101 + 1;
                        } while (uVar101 != uVar5);
                      }
                      local_138 = local_138 + 1;
                    } while (local_138 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              else {
                Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
                if (this_00->data != (void *)0x0) {
                  if ((long)local_120->c * local_120->cstep == 0) {
                    return -100;
                  }
                  if (0 < (int)local_98) {
                    local_150 = 0;
                    do {
                      pMVar1 = local_a0;
                      afVar252 = _local_100;
                      bVar109 = local_a0->dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_a0->d;
                      }
                      local_d4 = local_a0->w;
                      local_d0 = local_a0->h;
                      local_138 = local_a0->cstep;
                      pvVar12 = local_a0->data;
                      local_110 = local_a0->elemsize;
                      local_e0 = local_a0->allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_138 * local_150 * local_110 + (long)pvVar12);
                      uStack_f0 = local_110;
                      fStack_e4 = afVar252[7];
                      fStack_e8 = (float)local_a0->elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = pMVar1[1].dims == 3;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = pMVar1[1].d;
                      }
                      local_d4 = pMVar1[1].w;
                      local_d0 = pMVar1[1].h;
                      local_128 = pMVar1[1].cstep;
                      local_130 = pMVar1[1].data;
                      local_90 = pMVar1[1].elemsize;
                      local_e0 = pMVar1[1].allocator;
                      _fStack_f8 = 0;
                      local_100 = (undefined1  [8])
                                  (local_128 * local_150 * local_90 + (long)local_130);
                      uStack_f0 = local_90;
                      fStack_e8 = (float)pMVar1[1].elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      bVar109 = local_120->dims == 3;
                      local_d4 = local_120->w;
                      local_d0 = local_120->h;
                      local_c8 = 1;
                      if (!bVar109) {
                        local_c8 = local_120->d;
                      }
                      sVar106 = local_120->cstep;
                      pvVar91 = local_120->data;
                      sVar11 = local_120->elemsize;
                      local_e0 = local_120->allocator;
                      fStack_f8 = 0.0;
                      fStack_f4 = 0.0;
                      local_100 = (undefined1  [8])(sVar106 * local_150 * sVar11 + (long)pvVar91);
                      uStack_f0._0_4_ = (float)(int)sVar11;
                      uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                      fStack_e8 = (float)local_120->elempack;
                      local_d8 = bVar109 ^ 3;
                      local_c0 = (long)local_d0 * (long)local_d4;
                      local_cc = 1;
                      Mat::~Mat((Mat *)local_100);
                      pvVar98 = local_130;
                      if (0 < local_104) {
                        lVar95 = local_128 * local_90;
                        lVar96 = local_138 * local_110;
                        lVar108 = 0;
                        iVar80 = local_104;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])
                                                ((long)pvVar12 + lVar108 + lVar96 * local_150);
                          pauVar85 = (undefined1 (*) [16])
                                     ((long)pvVar98 + lVar108 + lVar95 * local_150);
                          auVar270 = ZEXT856(*(ulong *)(*pauVar85 + 8));
                          local_80._0_16_ = *pauVar85;
                          afVar428 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar267._0_8_ = afVar428._0_8_;
                          auVar267._8_56_ = auVar270;
                          *(undefined1 (*) [16])
                           ((long)pvVar91 + lVar108 + sVar106 * sVar11 * local_150) =
                               auVar267._0_16_;
                          lVar108 = lVar108 + 0x10;
                          iVar80 = iVar80 + -1;
                        } while (iVar80 != 0);
                      }
                      local_150 = local_150 + 1;
                    } while (local_150 != local_98);
                    return 0;
                  }
                  return 0;
                }
              }
              return -100;
            }
            Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
            if (local_120->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_98) {
                lVar95 = local_110 << 4;
                local_150 = 0;
                do {
                  if (0 < (int)local_138) {
                    sVar106 = local_a0[1].elemsize;
                    pvVar98 = (void *)(local_120->cstep * local_150 * local_120->elemsize +
                                      (long)local_120->data);
                    pvVar91 = (void *)(local_a0->cstep * local_150 * local_a0->elemsize +
                                      (long)local_a0->data);
                    sVar11 = local_a0[1].cstep;
                    pvVar12 = local_a0[1].data;
                    iVar80 = 0;
                    uVar82 = local_110;
                    do {
                      if (0 < (int)uVar82) {
                        lVar96 = 0;
                        do {
                          _local_100 = (__m128)*(undefined1 (*) [16])((long)pvVar91 + lVar96);
                          pauVar85 = (undefined1 (*) [16])
                                     ((long)pvVar12 + lVar96 + sVar106 * sVar11 * local_150);
                          auVar270 = ZEXT856(*(ulong *)(*pauVar85 + 8));
                          local_80._0_16_ = *pauVar85;
                          afVar428 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_139,
                                                (__m128 *)local_100,(__m128 *)local_80);
                          auVar263._0_8_ = afVar428._0_8_;
                          auVar263._8_56_ = auVar270;
                          *(undefined1 (*) [16])((long)pvVar98 + lVar96) = auVar263._0_16_;
                          lVar96 = lVar96 + 0x10;
                        } while (lVar95 != lVar96);
                        pvVar98 = (void *)((long)pvVar98 + lVar96);
                        pvVar91 = (void *)((long)pvVar91 + lVar96);
                        uVar82 = local_110;
                      }
                      iVar80 = iVar80 + 1;
                    } while (iVar80 != (int)local_138);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar99,uVar7,uVar8,local_60,iVar80,opt->blob_allocator);
          afVar252 = _local_100;
          if (local_120->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep == 0) {
            return -100;
          }
          if (pMVar9[1].dims == 1) {
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar8) {
                local_150 = 0;
                do {
                  pvVar12 = local_a0->data;
                  sVar106 = local_a0->elemsize;
                  sVar11 = local_a0->cstep;
                  _local_100 = (__m128)*(undefined1 (*) [16])
                                        ((long)local_a0[1].data + local_150 * 0x10);
                  if (0 < local_104) {
                    sVar13 = local_120->cstep;
                    sVar14 = local_120->elemsize;
                    pvVar91 = local_120->data;
                    lVar95 = 0;
                    iVar80 = local_104;
                    do {
                      pauVar85 = (undefined1 (*) [16])
                                 ((long)pvVar12 + lVar95 + sVar11 * sVar106 * local_150);
                      uVar269 = *(undefined8 *)(*pauVar85 + 8);
                      local_80._0_16_ = *pauVar85;
                      afVar428 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                            (__m128 *)local_100);
                      puVar103 = (undefined8 *)
                                 ((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                      *puVar103 = afVar428._0_8_;
                      puVar103[1] = uVar269;
                      lVar95 = lVar95 + 0x10;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  local_150 = local_150 + 1;
                } while (local_150 != local_98);
                return 0;
              }
              return 0;
            }
            local_100._4_4_ = *pMVar1->data;
            local_100._0_4_ = local_100._4_4_;
            fStack_f8 = (float)local_100._4_4_;
            fStack_f4 = (float)local_100._4_4_;
            _uStack_f0 = afVar252._16_16_;
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < local_104) {
                  sVar106 = local_120->cstep;
                  sVar11 = local_120->elemsize;
                  pvVar12 = local_120->data;
                  sVar13 = local_a0->cstep;
                  sVar14 = local_a0->elemsize;
                  pvVar91 = local_a0->data;
                  lVar95 = 0;
                  iVar80 = local_104;
                  do {
                    pauVar85 = (undefined1 (*) [16])
                               ((long)pvVar91 + lVar95 + sVar13 * sVar14 * local_150);
                    auVar270 = ZEXT856(*(ulong *)(*pauVar85 + 8));
                    local_80._0_16_ = *pauVar85;
                    afVar428 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                          (__m128 *)local_100);
                    auVar262._0_8_ = afVar428._0_8_;
                    auVar262._8_56_ = auVar270;
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * local_150) =
                         auVar262._0_16_;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
            }
          }
          else if (pMVar9[1].dims == 2) {
            if (0 < (int)uVar8) {
              local_150 = 0;
              do {
                if (0 < (int)local_138) {
                  pauVar88 = (undefined1 (*) [16])
                             (local_120->cstep * local_150 * local_120->elemsize +
                             (long)local_120->data);
                  pauVar85 = (undefined1 (*) [16])
                             ((long)local_a0[1].w * local_150 * local_a0[1].elemsize +
                             (long)local_a0[1].data);
                  pauVar90 = (undefined1 (*) [16])
                             (local_a0->cstep * local_150 * local_a0->elemsize +
                             (long)local_a0->data);
                  iVar80 = 0;
                  do {
                    _local_100 = (__m128)*pauVar85;
                    uVar82 = local_110 & 0xffffffff;
                    if (0 < (int)local_110) {
                      do {
                        auVar270 = ZEXT856(*(ulong *)(*pauVar90 + 8));
                        local_80._0_16_ = *pauVar90;
                        afVar428 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_139,(__m128 *)local_80,
                                              (__m128 *)local_100);
                        auVar259._0_8_ = afVar428._0_8_;
                        auVar259._8_56_ = auVar270;
                        *pauVar88 = auVar259._0_16_;
                        pauVar90 = pauVar90 + 1;
                        pauVar88 = pauVar88 + 1;
                        uVar101 = (int)uVar82 - 1;
                        uVar82 = (ulong)uVar101;
                      } while (uVar101 != 0);
                    }
                    pauVar85 = pauVar85 + 1;
                    iVar80 = iVar80 + 1;
                  } while (iVar80 != (int)local_138);
                }
                local_150 = local_150 + 1;
              } while (local_150 != local_98);
              return 0;
            }
            return 0;
          }
        }
      }
      return 0;
    case 7:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar98 + lVar95),
                                        *(undefined1 (*) [16])((long)pvVar91 + lVar95));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              uVar4 = *pMVar1->data;
              auVar142._4_4_ = uVar4;
              auVar142._0_4_ = uVar4;
              auVar142._8_4_ = uVar4;
              auVar142._12_4_ = uVar4;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar132 = vsubps_avx(auVar142,*(undefined1 (*) [16])((long)pvVar91 + lVar95));
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pauVar85 = (undefined1 (*) [16])this_00->data;
            if (pauVar85 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar90 = (undefined1 (*) [16])pMVar9->data;
                pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
                uVar101 = 0;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar90;
                    uVar99 = uVar100;
                    do {
                      auVar131 = vsubps_avx(*pauVar88,auVar132);
                      *pauVar85 = auVar131;
                      pauVar88 = pauVar88 + 1;
                      pauVar85 = pauVar85 + 1;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar90 = pauVar90 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            do {
              if (0 < iVar107) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                pvVar12 = this_00->data;
                sVar13 = pMVar9[1].cstep;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  auVar131 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),
                                        auVar132);
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              uVar4 = *pMVar9->data;
              auVar141._4_4_ = uVar4;
              auVar141._0_4_ = uVar4;
              auVar141._8_4_ = uVar4;
              auVar141._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),auVar141);
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              uVar4 = *pMVar9->data;
              auVar137._4_4_ = uVar4;
              auVar137._0_4_ = uVar4;
              auVar137._8_4_ = uVar4;
              auVar137._12_4_ = uVar4;
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),auVar137);
                *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          uVar4 = *pMVar9->data;
          auVar114._4_4_ = uVar4;
          auVar114._0_4_ = uVar4;
          auVar114._8_4_ = uVar4;
          auVar114._12_4_ = uVar4;
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                       ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),auVar114)
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar132;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              do {
                if (0 < (int)uVar5) {
                  pauVar85 = (undefined1 (*) [16])
                             (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                  pauVar90 = (undefined1 (*) [16])
                             (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data);
                  pauVar88 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar88;
                      uVar99 = uVar100;
                      do {
                        auVar131 = vsubps_avx(*pauVar90,auVar132);
                        *pauVar85 = auVar131;
                        pauVar90 = pauVar90 + 1;
                        pauVar85 = pauVar85 + 1;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar88 = pauVar88 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar98 + lVar95),
                                    *(undefined1 (*) [16])((long)pvVar91 + lVar95));
              *(undefined1 (*) [16])((long)pvVar12 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar90 = (undefined1 (*) [16])pMVar9->data;
              pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar88;
                  uVar81 = uVar82;
                  do {
                    auVar131 = vsubps_avx(auVar132,*pauVar90);
                    *pauVar85 = auVar131;
                    pauVar90 = pauVar90 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar88 = pauVar88 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *pMVar1->data;
            auVar158._4_4_ = uVar4;
            auVar158._0_4_ = uVar4;
            auVar158._8_4_ = uVar4;
            auVar158._12_4_ = uVar4;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar132 = vsubps_avx(auVar158,*(undefined1 (*) [16])((long)pvVar12 + lVar95));
              *(undefined1 (*) [16])((long)*pauVar85 + lVar95) = auVar132;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar131 = vsubps_avx(auVar132,*(undefined1 (*) [16])
                                                    ((long)pvVar91 +
                                                    lVar95 + sVar13 * sVar14 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar131;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            uVar4 = *pMVar1->data;
            auVar161._4_4_ = uVar4;
            auVar161._0_4_ = uVar4;
            auVar161._8_4_ = uVar4;
            auVar161._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar132 = vsubps_avx(auVar161,*(undefined1 (*) [16])
                                                  ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar132;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar88 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar131 = vsubps_avx(auVar132,*pauVar88);
                    *pauVar85 = auVar131;
                    pauVar88 = pauVar88 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar131 = vsubps_avx(auVar132,*(undefined1 (*) [16])
                                                  ((long)pvVar12 +
                                                  lVar95 + sVar106 * sVar11 * uVar82));
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar131;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                    auVar124._4_4_ = uVar4;
                    auVar124._0_4_ = uVar4;
                    auVar124._8_4_ = uVar4;
                    auVar124._12_4_ = uVar4;
                    auVar132 = vsubps_avx(auVar124,*(undefined1 (*) [16])
                                                    ((long)pvVar12 +
                                                    lVar95 * 4 + sVar106 * sVar11 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar132;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      uVar4 = *(undefined4 *)((long)pvVar91 + lVar95);
                      auVar178._4_4_ = uVar4;
                      auVar178._0_4_ = uVar4;
                      auVar178._8_4_ = uVar4;
                      auVar178._12_4_ = uVar4;
                      auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                             ((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82
                                             ),auVar178);
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar132;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00262e9e:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar131 = vsubps_avx(auVar132,*pauVar90);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                                 ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83
                                                 ),*(undefined1 (*) [16])((long)pvVar98 + lVar95));
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar82 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize + (long)pMVar9[1].data
                               );
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        uVar101 = uVar100;
                        do {
                          auVar131 = vsubps_avx(*pauVar90,auVar132);
                          *pauVar85 = auVar131;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar91 + lVar95),
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar12 +
                                                 lVar95 + sVar106 * (long)local_130 *
                                                          (long)local_158));
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar132;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar91 +
                                           lVar95 + local_138 * local_110 * (long)local_158),
                                          *(undefined1 (*) [16])
                                           ((long)pvVar12 +
                                           lVar95 + sVar106 * sVar11 * (long)local_158));
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar132;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00262e9e;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                auVar131 = vsubps_avx(*(undefined1 (*) [16])
                                       ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82),auVar132)
                ;
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar131;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      uVar99 = pMVar9->w;
      uVar82 = (ulong)uVar99;
      sVar106 = pMVar9->elemsize;
      uVar100 = pMVar9[1].w;
      uVar5 = pMVar9[1].h;
      uVar6 = pMVar9[1].c;
      local_138 = (ulong)uVar6;
      iVar107 = uVar5 * uVar100;
      sVar11 = pMVar9[1].elemsize;
      iVar94 = pMVar9->dims;
      if (iVar94 == 1) {
        iVar94 = pMVar9[1].dims;
        if (iVar80 != 1 || uVar99 != 1) {
          if (iVar94 == 1) {
            Mat::create(this_00,uVar99,sVar106,iVar80,opt->blob_allocator);
            pvVar12 = this_00->data;
            if (pvVar12 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar101 != 1 || pMVar9[1].w != 1) {
              if (0 < (int)uVar99) {
                pvVar91 = pMVar9->data;
                pvVar98 = pMVar9[1].data;
                lVar95 = 0;
                do {
                  auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                  auVar111 = vrcpps_avx(auVar132);
                  auVar131 = *(undefined1 (*) [16])((long)pvVar98 + lVar95);
                  fVar395 = auVar131._0_4_ * auVar111._0_4_;
                  fVar424 = auVar131._4_4_ * auVar111._4_4_;
                  fVar425 = auVar131._8_4_ * auVar111._8_4_;
                  fVar426 = auVar131._12_4_ * auVar111._12_4_;
                  auVar182._0_4_ = auVar132._0_4_ * fVar395;
                  auVar182._4_4_ = auVar132._4_4_ * fVar424;
                  auVar182._8_4_ = auVar132._8_4_ * fVar425;
                  auVar182._12_4_ = auVar132._12_4_ * fVar426;
                  auVar132 = vsubps_avx(auVar131,auVar182);
                  pfVar92 = (float *)((long)pvVar12 + lVar95);
                  *pfVar92 = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                  pfVar92[1] = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                  pfVar92[2] = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                  pfVar92[3] = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                  lVar95 = lVar95 + 0x10;
                  uVar101 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar101;
                } while (uVar101 != 0);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar99) {
              fVar395 = *pMVar1->data;
              auVar152._4_4_ = fVar395;
              auVar152._0_4_ = fVar395;
              auVar152._8_4_ = fVar395;
              auVar152._12_4_ = fVar395;
              pvVar91 = pMVar9->data;
              lVar95 = 0;
              do {
                auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                auVar131 = vrcpps_avx(auVar132);
                fVar424 = fVar395 * auVar131._0_4_;
                fVar425 = fVar395 * auVar131._4_4_;
                fVar426 = fVar395 * auVar131._8_4_;
                fVar427 = fVar395 * auVar131._12_4_;
                auVar311._0_4_ = auVar132._0_4_ * fVar424;
                auVar311._4_4_ = auVar132._4_4_ * fVar425;
                auVar311._8_4_ = auVar132._8_4_ * fVar426;
                auVar311._12_4_ = auVar132._12_4_ * fVar427;
                auVar132 = vsubps_avx(auVar152,auVar311);
                pfVar92 = (float *)((long)pvVar12 + lVar95);
                *pfVar92 = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                pfVar92[1] = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                pfVar92[2] = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                pfVar92[3] = fVar427 + auVar131._12_4_ * auVar132._12_4_;
                lVar95 = lVar95 + 0x10;
                uVar101 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar101;
              } while (uVar101 != 0);
              return 0;
            }
            return 0;
          }
          if (iVar94 == 2) {
            Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
            pfVar92 = (float *)this_00->data;
            if (pfVar92 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar5) {
                pauVar85 = (undefined1 (*) [16])pMVar9->data;
                pfVar93 = (float *)pMVar9[1].data;
                uVar101 = 0;
                auVar148._8_4_ = 0x3f800000;
                auVar148._0_8_ = 0x3f8000003f800000;
                auVar148._12_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar100) {
                    auVar132 = *pauVar85;
                    auVar131 = vrcpps_avx(auVar132);
                    fVar395 = auVar131._0_4_;
                    auVar310._0_4_ = auVar132._0_4_ * fVar395;
                    fVar424 = auVar131._4_4_;
                    auVar310._4_4_ = auVar132._4_4_ * fVar424;
                    fVar425 = auVar131._8_4_;
                    auVar310._8_4_ = auVar132._8_4_ * fVar425;
                    fVar426 = auVar131._12_4_;
                    auVar310._12_4_ = auVar132._12_4_ * fVar426;
                    auVar132 = vsubps_avx(auVar148,auVar310);
                    uVar99 = uVar100;
                    do {
                      fVar427 = pfVar93[1];
                      fVar15 = pfVar93[2];
                      fVar16 = pfVar93[3];
                      *pfVar92 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar93;
                      pfVar92[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                      pfVar92[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                      pfVar92[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                      pfVar93 = pfVar93 + 4;
                      pfVar92 = pfVar92 + 4;
                      uVar99 = uVar99 - 1;
                    } while (uVar99 != 0);
                  }
                  pauVar85 = pauVar85 + 1;
                  uVar101 = uVar101 + 1;
                } while (uVar101 != uVar5);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar94 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)local_138) {
            uVar82 = 0;
            auVar121._8_4_ = 0x3f800000;
            auVar121._0_8_ = 0x3f8000003f800000;
            auVar121._12_4_ = 0x3f800000;
            do {
              if (0 < iVar107) {
                sVar106 = pMVar9[1].cstep;
                auVar132 = *(undefined1 (*) [16])((long)pMVar9->data + uVar82 * 0x10);
                auVar131 = vrcpps_avx(auVar132);
                fVar395 = auVar131._0_4_;
                auVar296._0_4_ = auVar132._0_4_ * fVar395;
                fVar424 = auVar131._4_4_;
                auVar296._4_4_ = auVar132._4_4_ * fVar424;
                fVar425 = auVar131._8_4_;
                auVar296._8_4_ = auVar132._8_4_ * fVar425;
                fVar426 = auVar131._12_4_;
                auVar296._12_4_ = auVar132._12_4_ * fVar426;
                auVar132 = vsubps_avx(auVar121,auVar296);
                sVar11 = this_00->cstep;
                sVar13 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar14 = pMVar9[1].elemsize;
                pvVar91 = pMVar9[1].data;
                lVar95 = 0;
                iVar80 = iVar107;
                do {
                  pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar106 * sVar14 * uVar82);
                  fVar427 = pfVar92[1];
                  fVar15 = pfVar92[2];
                  fVar16 = pfVar92[3];
                  pfVar93 = (float *)((long)pvVar12 + lVar95 + sVar11 * sVar13 * uVar82);
                  *pfVar93 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar92;
                  pfVar93[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                  pfVar93[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                  pfVar93[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_138);
            return 0;
          }
          return 0;
        }
        if (iVar94 == 1) {
          Mat::create(this_00,uVar100,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar100) {
              auVar151._0_4_ = 1.0 / *pMVar9->data;
              auVar151._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar132 = vshufps_avx(auVar151,auVar151,0);
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar395 = pfVar92[1];
                fVar424 = pfVar92[2];
                fVar425 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = auVar132._0_4_ * *pfVar92;
                pfVar93[1] = auVar132._4_4_ * fVar395;
                pfVar93[2] = auVar132._8_4_ * fVar424;
                pfVar93[3] = auVar132._12_4_ * fVar425;
                lVar95 = lVar95 + 0x10;
                uVar100 = uVar100 - 1;
              } while (uVar100 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 == 2) {
          Mat::create(this_00,uVar100,uVar5,sVar11,uVar101,opt->blob_allocator);
          pvVar12 = this_00->data;
          if (pvVar12 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < iVar107) {
              auVar147._0_4_ = 1.0 / *pMVar9->data;
              auVar147._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar132 = vshufps_avx(auVar147,auVar147,0);
              pvVar91 = pMVar1->data;
              lVar95 = 0;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95);
                fVar395 = pfVar92[1];
                fVar424 = pfVar92[2];
                fVar425 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95);
                *pfVar93 = auVar132._0_4_ * *pfVar92;
                pfVar93[1] = auVar132._4_4_ * fVar395;
                pfVar93[2] = auVar132._8_4_ * fVar424;
                pfVar93[3] = auVar132._12_4_ * fVar425;
                lVar95 = lVar95 + 0x10;
                iVar107 = iVar107 + -1;
              } while (iVar107 != 0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar94 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)local_138) {
          auVar118._0_4_ = 1.0 / *pMVar9->data;
          auVar118._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar132 = vshufps_avx(auVar118,auVar118,0);
          uVar82 = 0;
          do {
            if (0 < iVar107) {
              sVar106 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar13 = pMVar9[1].cstep;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                auVar287._0_4_ = auVar132._0_4_ * *pfVar92;
                auVar287._4_4_ = auVar132._4_4_ * pfVar92[1];
                auVar287._8_4_ = auVar132._8_4_ * pfVar92[2];
                auVar287._12_4_ = auVar132._12_4_ * pfVar92[3];
                *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                     auVar287;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      uVar7 = pMVar9->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar7 * uVar99);
      if (iVar94 == 2) {
        if (pMVar9[1].dims == 3) {
          Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_138) {
              uVar82 = 0;
              auVar116._8_4_ = 0x3f800000;
              auVar116._0_8_ = 0x3f8000003f800000;
              auVar116._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar5) {
                  pfVar92 = (float *)(this_00->cstep * uVar82 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar93 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                     (long)pMVar9[1].data);
                  pauVar85 = (undefined1 (*) [16])
                             ((long)pMVar9->w * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                  uVar101 = 0;
                  do {
                    if (0 < (int)uVar100) {
                      auVar132 = *pauVar85;
                      auVar131 = vrcpps_avx(auVar132);
                      fVar395 = auVar131._0_4_;
                      auVar286._0_4_ = auVar132._0_4_ * fVar395;
                      fVar424 = auVar131._4_4_;
                      auVar286._4_4_ = auVar132._4_4_ * fVar424;
                      fVar425 = auVar131._8_4_;
                      auVar286._8_4_ = auVar132._8_4_ * fVar425;
                      fVar426 = auVar131._12_4_;
                      auVar286._12_4_ = auVar132._12_4_ * fVar426;
                      auVar132 = vsubps_avx(auVar116,auVar286);
                      uVar99 = uVar100;
                      do {
                        fVar427 = pfVar93[1];
                        fVar15 = pfVar93[2];
                        fVar16 = pfVar93[3];
                        *pfVar92 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar93;
                        pfVar92[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                        pfVar92[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                        pfVar92[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                        pfVar93 = pfVar93 + 4;
                        pfVar92 = pfVar92 + 4;
                        uVar99 = uVar99 - 1;
                      } while (uVar99 != 0);
                    }
                    pauVar85 = pauVar85 + 1;
                    uVar101 = uVar101 + 1;
                  } while (uVar101 != uVar5);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_138);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_128 = CONCAT44(uVar4,uVar101);
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pvVar12 = this_00->data;
        if (pvVar12 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims != 1) {
          if (pMVar9[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar91 = pMVar9->data;
            pvVar98 = pMVar9[1].data;
            lVar95 = 0;
            do {
              auVar132 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
              auVar111 = vrcpps_avx(auVar132);
              auVar131 = *(undefined1 (*) [16])((long)pvVar98 + lVar95);
              fVar395 = auVar131._0_4_ * auVar111._0_4_;
              fVar424 = auVar131._4_4_ * auVar111._4_4_;
              fVar425 = auVar131._8_4_ * auVar111._8_4_;
              fVar426 = auVar131._12_4_ * auVar111._12_4_;
              auVar120._0_4_ = auVar132._0_4_ * fVar395;
              auVar120._4_4_ = auVar132._4_4_ * fVar424;
              auVar120._8_4_ = auVar132._8_4_ * fVar425;
              auVar120._12_4_ = auVar132._12_4_ * fVar426;
              auVar132 = vsubps_avx(auVar131,auVar120);
              pfVar92 = (float *)((long)pvVar12 + lVar95);
              *pfVar92 = fVar395 + auVar111._0_4_ * auVar132._0_4_;
              pfVar92[1] = fVar424 + auVar111._4_4_ * auVar132._4_4_;
              pfVar92[2] = fVar425 + auVar111._8_4_ * auVar132._8_4_;
              pfVar92[3] = fVar426 + auVar111._12_4_ * auVar132._12_4_;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar99,uVar7,sVar106,iVar80,opt->blob_allocator);
        pauVar85 = (undefined1 (*) [16])this_00->data;
        if (pauVar85 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_128 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar7) {
              pauVar90 = (undefined1 (*) [16])pMVar9->data;
              pauVar88 = (undefined1 (*) [16])pMVar9[1].data;
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar88;
                  uVar81 = uVar82;
                  do {
                    auVar131 = *pauVar90;
                    auVar111 = vrcpps_avx(auVar131);
                    fVar395 = auVar132._0_4_ * auVar111._0_4_;
                    fVar424 = auVar132._4_4_ * auVar111._4_4_;
                    fVar425 = auVar132._8_4_ * auVar111._8_4_;
                    fVar426 = auVar132._12_4_ * auVar111._12_4_;
                    auVar342._0_4_ = auVar131._0_4_ * fVar395;
                    auVar342._4_4_ = auVar131._4_4_ * fVar424;
                    auVar342._8_4_ = auVar131._8_4_ * fVar425;
                    auVar342._12_4_ = auVar131._12_4_ * fVar426;
                    auVar131 = vsubps_avx(auVar132,auVar342);
                    auVar343._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                    auVar343._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                    auVar343._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                    auVar343._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                    *pauVar85 = auVar343;
                    pauVar90 = pauVar90 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar81 - 1;
                    uVar81 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar88 = pauVar88 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar395 = *pMVar1->data;
            auVar164._4_4_ = fVar395;
            auVar164._0_4_ = fVar395;
            auVar164._8_4_ = fVar395;
            auVar164._12_4_ = fVar395;
            pvVar12 = pMVar9->data;
            lVar95 = 0;
            do {
              auVar132 = *(undefined1 (*) [16])((long)pvVar12 + lVar95);
              auVar131 = vrcpps_avx(auVar132);
              fVar424 = fVar395 * auVar131._0_4_;
              fVar425 = fVar395 * auVar131._4_4_;
              fVar426 = fVar395 * auVar131._8_4_;
              fVar427 = fVar395 * auVar131._12_4_;
              auVar317._0_4_ = auVar132._0_4_ * fVar424;
              auVar317._4_4_ = auVar132._4_4_ * fVar425;
              auVar317._8_4_ = auVar132._8_4_ * fVar426;
              auVar317._12_4_ = auVar132._12_4_ * fVar427;
              auVar132 = vsubps_avx(auVar164,auVar317);
              pfVar92 = (float *)((long)*pauVar85 + lVar95);
              *pfVar92 = fVar424 + auVar131._0_4_ * auVar132._0_4_;
              pfVar92[1] = fVar425 + auVar131._4_4_ * auVar132._4_4_;
              pfVar92[2] = fVar426 + auVar131._8_4_ * auVar132._8_4_;
              pfVar92[3] = fVar427 + auVar131._12_4_ * auVar132._12_4_;
              lVar95 = lVar95 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar94 != 3) {
        return 0;
      }
      uVar8 = pMVar9->c;
      uVar81 = (ulong)uVar8;
      local_110 = sVar106;
      if (pMVar9[1].dims != 3) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar9[1].dims == 1) {
          if (uVar101 != 1 || pMVar9[1].w != 1) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  auVar132 = *(undefined1 (*) [16])((long)pMVar1->data + uVar82 * 0x10);
                  pvVar12 = this_00->data;
                  sVar13 = pMVar9->cstep;
                  sVar14 = pMVar9->elemsize;
                  pvVar91 = pMVar9->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar131 = *(undefined1 (*) [16])
                                ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                    auVar111 = vrcpps_avx(auVar131);
                    fVar395 = auVar132._0_4_ * auVar111._0_4_;
                    fVar424 = auVar132._4_4_ * auVar111._4_4_;
                    fVar425 = auVar132._8_4_ * auVar111._8_4_;
                    fVar426 = auVar132._12_4_ * auVar111._12_4_;
                    auVar329._0_4_ = auVar131._0_4_ * fVar395;
                    auVar329._4_4_ = auVar131._4_4_ * fVar424;
                    auVar329._8_4_ = auVar131._8_4_ * fVar425;
                    auVar329._12_4_ = auVar131._12_4_ * fVar426;
                    auVar131 = vsubps_avx(auVar132,auVar329);
                    auVar330._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                    auVar330._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                    auVar330._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                    auVar330._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                    *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                         auVar330;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar8) {
            fVar395 = *pMVar1->data;
            auVar166._4_4_ = fVar395;
            auVar166._0_4_ = fVar395;
            auVar166._8_4_ = fVar395;
            auVar166._12_4_ = fVar395;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = this_00->cstep;
                sVar11 = this_00->elemsize;
                pvVar12 = this_00->data;
                sVar13 = pMVar9->cstep;
                sVar14 = pMVar9->elemsize;
                pvVar91 = pMVar9->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar132 = *(undefined1 (*) [16])
                              ((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82);
                  auVar131 = vrcpps_avx(auVar132);
                  fVar424 = fVar395 * auVar131._0_4_;
                  fVar425 = fVar395 * auVar131._4_4_;
                  fVar426 = fVar395 * auVar131._8_4_;
                  fVar427 = fVar395 * auVar131._12_4_;
                  auVar318._0_4_ = auVar132._0_4_ * fVar424;
                  auVar318._4_4_ = auVar132._4_4_ * fVar425;
                  auVar318._8_4_ = auVar132._8_4_ * fVar426;
                  auVar318._12_4_ = auVar132._12_4_ * fVar427;
                  auVar132 = vsubps_avx(auVar166,auVar318);
                  auVar319._0_4_ = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                  auVar319._4_4_ = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                  auVar319._8_4_ = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                  auVar319._12_4_ = fVar427 + auVar131._12_4_ * auVar132._12_4_;
                  *(undefined1 (*) [16])((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82) =
                       auVar319;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        if (pMVar9[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar8) {
          uVar83 = 0;
          do {
            if (0 < (int)uVar7) {
              pauVar85 = (undefined1 (*) [16])
                         (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
              pauVar90 = (undefined1 (*) [16])
                         ((long)pMVar9[1].w * uVar83 * pMVar9[1].elemsize + (long)pMVar9[1].data);
              pauVar88 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
              uVar101 = 0;
              do {
                if (0 < (int)uVar99) {
                  auVar132 = *pauVar90;
                  uVar97 = uVar82;
                  do {
                    auVar131 = *pauVar88;
                    auVar111 = vrcpps_avx(auVar131);
                    fVar395 = auVar132._0_4_ * auVar111._0_4_;
                    fVar424 = auVar132._4_4_ * auVar111._4_4_;
                    fVar425 = auVar132._8_4_ * auVar111._8_4_;
                    fVar426 = auVar132._12_4_ * auVar111._12_4_;
                    auVar297._0_4_ = auVar131._0_4_ * fVar395;
                    auVar297._4_4_ = auVar131._4_4_ * fVar424;
                    auVar297._8_4_ = auVar131._8_4_ * fVar425;
                    auVar297._12_4_ = auVar131._12_4_ * fVar426;
                    auVar131 = vsubps_avx(auVar132,auVar297);
                    auVar298._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                    auVar298._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                    auVar298._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                    auVar298._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                    *pauVar85 = auVar298;
                    pauVar88 = pauVar88 + 1;
                    pauVar85 = pauVar85 + 1;
                    uVar100 = (int)uVar97 - 1;
                    uVar97 = (ulong)uVar100;
                  } while (uVar100 != 0);
                }
                pauVar90 = pauVar90 + 1;
                uVar101 = uVar101 + 1;
              } while (uVar101 != uVar7);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar81);
          return 0;
        }
        return 0;
      }
      if (uVar8 == uVar6 && ((uVar100 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar8) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar106 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar132 = *(undefined1 (*) [16])
                            ((long)pMVar9[1].data + pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize);
                pvVar12 = pMVar9->data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar91 = this_00->data;
                lVar95 = 0;
                iVar80 = (int)local_130;
                do {
                  auVar131 = *(undefined1 (*) [16])
                              ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar82);
                  auVar111 = vrcpps_avx(auVar131);
                  fVar395 = auVar132._0_4_ * auVar111._0_4_;
                  fVar424 = auVar132._4_4_ * auVar111._4_4_;
                  fVar425 = auVar132._8_4_ * auVar111._8_4_;
                  fVar426 = auVar132._12_4_ * auVar111._12_4_;
                  auVar276._0_4_ = auVar131._0_4_ * fVar395;
                  auVar276._4_4_ = auVar131._4_4_ * fVar424;
                  auVar276._8_4_ = auVar131._8_4_ * fVar425;
                  auVar276._12_4_ = auVar131._12_4_ * fVar426;
                  auVar131 = vsubps_avx(auVar132,auVar276);
                  auVar277._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                  auVar277._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                  auVar277._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                  auVar277._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                  *(undefined1 (*) [16])((long)pvVar91 + lVar95 + sVar13 * sVar14 * uVar82) =
                       auVar277;
                  lVar95 = lVar95 + 0x10;
                  iVar80 = iVar80 + -1;
                } while (iVar80 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar81);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar100 == uVar99) {
        if (uVar101 == 1 && (uVar6 == 1 && uVar5 == uVar7)) {
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar8) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar106 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  sVar13 = this_00->cstep;
                  pvVar12 = pMVar9->data;
                  pvVar91 = pMVar9[1].data;
                  sVar14 = this_00->elemsize;
                  pvVar98 = this_00->data;
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = *(undefined1 (*) [16])
                                ((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                    auVar131 = vrcpps_avx(auVar132);
                    fVar395 = *(float *)((long)pvVar91 + lVar95);
                    auVar393._4_4_ = fVar395;
                    auVar393._0_4_ = fVar395;
                    auVar393._8_4_ = fVar395;
                    auVar393._12_4_ = fVar395;
                    fVar424 = fVar395 * auVar131._0_4_;
                    fVar425 = fVar395 * auVar131._4_4_;
                    fVar426 = fVar395 * auVar131._8_4_;
                    fVar395 = fVar395 * auVar131._12_4_;
                    auVar128._0_4_ = auVar132._0_4_ * fVar424;
                    auVar128._4_4_ = auVar132._4_4_ * fVar425;
                    auVar128._8_4_ = auVar132._8_4_ * fVar426;
                    auVar128._12_4_ = auVar132._12_4_ * fVar395;
                    auVar132 = vsubps_avx(auVar393,auVar128);
                    auVar129._0_4_ = fVar424 + auVar131._0_4_ * auVar132._0_4_;
                    auVar129._4_4_ = fVar425 + auVar131._4_4_ * auVar132._4_4_;
                    auVar129._8_4_ = fVar426 + auVar131._8_4_ * auVar132._8_4_;
                    auVar129._12_4_ = fVar395 + auVar131._12_4_ * auVar132._12_4_;
                    *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82) =
                         auVar129;
                    lVar95 = lVar95 + 4;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar81);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) {
          if (((iVar80 == 1) && (uVar5 == uVar7)) && (uVar8 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar6,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_138) {
                uVar82 = 0;
                do {
                  if (0 < iVar107) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    sVar13 = this_00->cstep;
                    pvVar12 = pMVar9[1].data;
                    pvVar91 = pMVar9->data;
                    sVar14 = this_00->elemsize;
                    pvVar98 = this_00->data;
                    lVar95 = 0;
                    iVar80 = iVar107;
                    do {
                      auVar132 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar91 + lVar95)));
                      auVar132 = vshufps_avx(auVar132,auVar132,0);
                      pfVar92 = (float *)((long)pvVar12 + lVar95 * 4 + sVar106 * sVar11 * uVar82);
                      auVar332._0_4_ = auVar132._0_4_ * *pfVar92;
                      auVar332._4_4_ = auVar132._4_4_ * pfVar92[1];
                      auVar332._8_4_ = auVar132._8_4_ * pfVar92[2];
                      auVar332._12_4_ = auVar132._12_4_ * pfVar92[3];
                      *(undefined1 (*) [16])((long)pvVar98 + lVar95 * 4 + sVar13 * sVar14 * uVar82)
                           = auVar332;
                      lVar95 = lVar95 + 4;
                      iVar80 = iVar80 + -1;
                    } while (iVar80 != 0);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != local_138);
                return 0;
              }
              return 0;
            }
            return -100;
          }
LAB_00263d3e:
          if ((((uVar100 ^ 1) == 0 && uVar5 == uVar7) && uVar8 == uVar6) && uVar99 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].cstep;
                    sVar11 = pMVar9[1].elemsize;
                    pvVar12 = pMVar9[1].data;
                    pauVar85 = (undefined1 (*) [16])
                               (this_00->cstep * uVar83 * this_00->elemsize + (long)this_00->data);
                    pauVar90 = (undefined1 (*) [16])
                               (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                    uVar97 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar97 * 0x10 + sVar106 * uVar83 * sVar11);
                        uVar102 = uVar82;
                        do {
                          auVar131 = *pauVar90;
                          auVar111 = vrcpps_avx(auVar131);
                          fVar395 = auVar132._0_4_ * auVar111._0_4_;
                          fVar424 = auVar132._4_4_ * auVar111._4_4_;
                          fVar425 = auVar132._8_4_ * auVar111._8_4_;
                          fVar426 = auVar132._12_4_ * auVar111._12_4_;
                          auVar312._0_4_ = auVar131._0_4_ * fVar395;
                          auVar312._4_4_ = auVar131._4_4_ * fVar424;
                          auVar312._8_4_ = auVar131._8_4_ * fVar425;
                          auVar312._12_4_ = auVar131._12_4_ * fVar426;
                          auVar131 = vsubps_avx(auVar132,auVar312);
                          auVar313._0_4_ = fVar395 + auVar111._0_4_ * auVar131._0_4_;
                          auVar313._4_4_ = fVar424 + auVar111._4_4_ * auVar131._4_4_;
                          auVar313._8_4_ = fVar425 + auVar111._8_4_ * auVar131._8_4_;
                          auVar313._12_4_ = fVar426 + auVar111._12_4_ * auVar131._12_4_;
                          *pauVar85 = auVar313;
                          pauVar90 = pauVar90 + 1;
                          pauVar85 = pauVar85 + 1;
                          uVar101 = (int)uVar102 - 1;
                          uVar102 = (ulong)uVar101;
                        } while (uVar101 != 0);
                      }
                      uVar97 = uVar97 + 1;
                    } while (uVar97 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar100 == uVar99 && (uVar5 ^ 1) == 0) && uVar8 == uVar6) && uVar7 != 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar83 = 0;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9[1].elemsize;
                    pvVar91 = (void *)(this_00->cstep * uVar83 * this_00->elemsize +
                                      (long)this_00->data);
                    pvVar98 = (void *)(pMVar9->cstep * uVar83 * pMVar9->elemsize +
                                      (long)pMVar9->data);
                    sVar11 = pMVar9[1].cstep;
                    pvVar12 = pMVar9[1].data;
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = *(undefined1 (*) [16])((long)pvVar98 + lVar95);
                          auVar111 = vrcpps_avx(auVar132);
                          auVar131 = *(undefined1 (*) [16])
                                      ((long)pvVar12 + lVar95 + sVar106 * sVar11 * uVar83);
                          fVar395 = auVar131._0_4_ * auVar111._0_4_;
                          fVar424 = auVar131._4_4_ * auVar111._4_4_;
                          fVar425 = auVar131._8_4_ * auVar111._8_4_;
                          fVar426 = auVar131._12_4_ * auVar111._12_4_;
                          auVar171._0_4_ = auVar132._0_4_ * fVar395;
                          auVar171._4_4_ = auVar132._4_4_ * fVar424;
                          auVar171._8_4_ = auVar132._8_4_ * fVar425;
                          auVar171._12_4_ = auVar132._12_4_ * fVar426;
                          auVar132 = vsubps_avx(auVar131,auVar171);
                          auVar172._0_4_ = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                          auVar172._4_4_ = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                          auVar172._8_4_ = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                          auVar172._12_4_ = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                          *(undefined1 (*) [16])((long)pvVar91 + lVar95) = auVar172;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar7);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if ((uVar6 == uVar8 && uVar5 == uVar7) && (uVar100 != 1 && uVar99 == 1)) {
            local_128 = uVar81;
            Mat::create(this_00,uVar100,uVar7,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar8) {
                uVar82 = 0;
                auVar183._8_4_ = 0x3f800000;
                auVar183._0_8_ = 0x3f8000003f800000;
                auVar183._12_4_ = 0x3f800000;
                do {
                  if (0 < (int)uVar7) {
                    sVar106 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar12 = pMVar9->data;
                    pfVar92 = (float *)(this_00->cstep * uVar82 * this_00->elemsize +
                                       (long)this_00->data);
                    pfVar93 = (float *)(pMVar9[1].cstep * uVar82 * pMVar9[1].elemsize +
                                       (long)pMVar9[1].data);
                    uVar83 = 0;
                    do {
                      if (0 < (int)uVar100) {
                        auVar132 = *(undefined1 (*) [16])
                                    ((long)pvVar12 + uVar83 * 0x10 + sVar106 * uVar82 * sVar11);
                        auVar131 = vrcpps_avx(auVar132);
                        fVar395 = auVar131._0_4_;
                        auVar338._0_4_ = auVar132._0_4_ * fVar395;
                        fVar424 = auVar131._4_4_;
                        auVar338._4_4_ = auVar132._4_4_ * fVar424;
                        fVar425 = auVar131._8_4_;
                        auVar338._8_4_ = auVar132._8_4_ * fVar425;
                        fVar426 = auVar131._12_4_;
                        auVar338._12_4_ = auVar132._12_4_ * fVar426;
                        auVar132 = vsubps_avx(auVar183,auVar338);
                        uVar101 = uVar100;
                        do {
                          fVar427 = pfVar93[1];
                          fVar15 = pfVar93[2];
                          fVar16 = pfVar93[3];
                          *pfVar92 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar93;
                          pfVar92[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                          pfVar92[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                          pfVar92[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                          pfVar93 = pfVar93 + 4;
                          pfVar92 = pfVar92 + 4;
                          uVar101 = uVar101 - 1;
                        } while (uVar101 != 0);
                      }
                      uVar83 = uVar83 + 1;
                    } while (uVar83 != uVar7);
                  }
                  uVar82 = uVar82 + 1;
                } while (uVar82 != uVar81);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((byte)local_104 & uVar6 == uVar8 & (uVar5 != 1 && uVar100 == uVar99)) == 1) {
            local_128 = uVar81;
            Mat::create(this_00,uVar99,uVar5,uVar8,sVar11,uVar101,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_120->c * local_120->cstep != 0) {
              if (0 < (int)local_128) {
                local_158 = (__m256 *)0x0;
                do {
                  pMVar1 = local_a0;
                  afVar252 = _local_100;
                  bVar109 = local_a0->dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_a0->d;
                  }
                  local_d4 = local_a0->w;
                  local_d0 = local_a0->h;
                  sVar106 = local_a0->cstep;
                  pvVar12 = local_a0->data;
                  local_130 = (void *)local_a0->elemsize;
                  local_e0 = local_a0->allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])
                              (sVar106 * (long)local_158 * (long)local_130 + (long)pvVar12);
                  uStack_f0 = local_130;
                  fStack_e4 = afVar252[7];
                  fStack_e8 = (float)local_a0->elempack;
                  local_d8 = bVar109 ^ 3;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = pMVar1[1].dims == 3;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = pMVar1[1].d;
                  }
                  local_d4 = pMVar1[1].w;
                  local_d0 = pMVar1[1].h;
                  pvVar91 = (void *)(pMVar1[1].cstep * (long)local_158 * pMVar1[1].elemsize +
                                    (long)pMVar1[1].data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = pMVar1[1].allocator;
                  _fStack_f8 = 0;
                  local_100 = (undefined1  [8])pvVar91;
                  uStack_f0 = pMVar1[1].elemsize;
                  fStack_e8 = (float)pMVar1[1].elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  bVar109 = local_120->dims == 3;
                  local_d4 = local_120->w;
                  local_d0 = local_120->h;
                  local_c8 = 1;
                  if (!bVar109) {
                    local_c8 = local_120->d;
                  }
                  sVar11 = local_120->elemsize;
                  pvVar98 = (void *)(local_120->cstep * (long)local_158 * sVar11 +
                                    (long)local_120->data);
                  local_d8 = bVar109 ^ 3;
                  local_e0 = local_120->allocator;
                  fStack_f8 = 0.0;
                  fStack_f4 = 0.0;
                  local_100 = (undefined1  [8])pvVar98;
                  uStack_f0._0_4_ = (float)(int)sVar11;
                  uStack_f0._4_4_ = (float)(int)(sVar11 >> 0x20);
                  fStack_e8 = (float)local_120->elempack;
                  local_c0 = (long)local_d0 * (long)local_d4;
                  local_cc = 1;
                  Mat::~Mat((Mat *)local_100);
                  if (0 < (int)uVar5) {
                    uVar101 = 0;
                    do {
                      if (0 < (int)uVar99) {
                        lVar95 = 0;
                        do {
                          auVar132 = *(undefined1 (*) [16])
                                      ((long)pvVar12 +
                                      lVar95 + sVar106 * (long)local_130 * (long)local_158);
                          auVar111 = vrcpps_avx(auVar132);
                          auVar131 = *(undefined1 (*) [16])((long)pvVar91 + lVar95);
                          fVar395 = auVar131._0_4_ * auVar111._0_4_;
                          fVar424 = auVar131._4_4_ * auVar111._4_4_;
                          fVar425 = auVar131._8_4_ * auVar111._8_4_;
                          fVar426 = auVar131._12_4_ * auVar111._12_4_;
                          auVar188._0_4_ = auVar132._0_4_ * fVar395;
                          auVar188._4_4_ = auVar132._4_4_ * fVar424;
                          auVar188._8_4_ = auVar132._8_4_ * fVar425;
                          auVar188._12_4_ = auVar132._12_4_ * fVar426;
                          auVar132 = vsubps_avx(auVar131,auVar188);
                          auVar189._0_4_ = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                          auVar189._4_4_ = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                          auVar189._8_4_ = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                          auVar189._12_4_ = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                          *(undefined1 (*) [16])((long)pvVar98 + lVar95) = auVar189;
                          lVar95 = lVar95 + 0x10;
                        } while (uVar82 << 4 != lVar95);
                        pvVar98 = (void *)((long)pvVar98 + lVar95);
                        pvVar91 = (void *)((long)pvVar91 + lVar95);
                      }
                      uVar101 = uVar101 + 1;
                    } while (uVar101 != uVar5);
                  }
                  local_158 = (__m256 *)((long)local_158 + 1);
                } while (local_158 != (__m256 *)local_128);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_128 = uVar81;
          Mat::create(this_00,uVar99,uVar7,uVar8,sVar106,iVar80,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_120->c * local_120->cstep != 0) {
            if (0 < (int)local_128) {
              local_158 = (__m256 *)0x0;
              do {
                pMVar1 = local_a0;
                afVar252 = _local_100;
                bVar109 = local_a0->dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_a0->d;
                }
                local_d4 = local_a0->w;
                local_d0 = local_a0->h;
                sVar106 = local_a0->cstep;
                pvVar12 = local_a0->data;
                sVar11 = local_a0->elemsize;
                local_e0 = local_a0->allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])(sVar106 * (long)local_158 * sVar11 + (long)pvVar12);
                uStack_f0 = sVar11;
                fStack_e4 = afVar252[7];
                fStack_e8 = (float)local_a0->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = pMVar1[1].dims == 3;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = pMVar1[1].d;
                }
                local_d4 = pMVar1[1].w;
                local_d0 = pMVar1[1].h;
                local_138 = pMVar1[1].cstep;
                pvVar91 = pMVar1[1].data;
                local_110 = pMVar1[1].elemsize;
                local_e0 = pMVar1[1].allocator;
                _fStack_f8 = 0;
                local_100 = (undefined1  [8])
                            (local_138 * (long)local_158 * local_110 + (long)pvVar91);
                uStack_f0 = local_110;
                fStack_e8 = (float)pMVar1[1].elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                bVar109 = local_120->dims == 3;
                local_d4 = local_120->w;
                local_d0 = local_120->h;
                local_c8 = 1;
                if (!bVar109) {
                  local_c8 = local_120->d;
                }
                sVar13 = local_120->cstep;
                pvVar98 = local_120->data;
                sVar14 = local_120->elemsize;
                local_e0 = local_120->allocator;
                fStack_f8 = 0.0;
                fStack_f4 = 0.0;
                local_100 = (undefined1  [8])(sVar13 * (long)local_158 * sVar14 + (long)pvVar98);
                uStack_f0._0_4_ = (float)(int)sVar14;
                uStack_f0._4_4_ = (float)(int)(sVar14 >> 0x20);
                fStack_e8 = (float)local_120->elempack;
                local_d8 = bVar109 ^ 3;
                local_c0 = (long)local_d0 * (long)local_d4;
                local_cc = 1;
                Mat::~Mat((Mat *)local_100);
                if (0 < (int)local_130) {
                  lVar95 = 0;
                  iVar80 = (int)local_130;
                  do {
                    auVar132 = *(undefined1 (*) [16])
                                ((long)pvVar12 + lVar95 + sVar106 * sVar11 * (long)local_158);
                    auVar111 = vrcpps_avx(auVar132);
                    auVar131 = *(undefined1 (*) [16])
                                ((long)pvVar91 + lVar95 + local_138 * local_110 * (long)local_158);
                    fVar395 = auVar131._0_4_ * auVar111._0_4_;
                    fVar424 = auVar131._4_4_ * auVar111._4_4_;
                    fVar425 = auVar131._8_4_ * auVar111._8_4_;
                    fVar426 = auVar131._12_4_ * auVar111._12_4_;
                    auVar193._0_4_ = auVar132._0_4_ * fVar395;
                    auVar193._4_4_ = auVar132._4_4_ * fVar424;
                    auVar193._8_4_ = auVar132._8_4_ * fVar425;
                    auVar193._12_4_ = auVar132._12_4_ * fVar426;
                    auVar132 = vsubps_avx(auVar131,auVar193);
                    auVar194._0_4_ = fVar395 + auVar111._0_4_ * auVar132._0_4_;
                    auVar194._4_4_ = fVar424 + auVar111._4_4_ * auVar132._4_4_;
                    auVar194._8_4_ = fVar425 + auVar111._8_4_ * auVar132._8_4_;
                    auVar194._12_4_ = fVar426 + auVar111._12_4_ * auVar132._12_4_;
                    *(undefined1 (*) [16])
                     ((long)pvVar98 + lVar95 + sVar13 * sVar14 * (long)local_158) = auVar194;
                    lVar95 = lVar95 + 0x10;
                    iVar80 = iVar80 + -1;
                  } while (iVar80 != 0);
                }
                local_158 = (__m256 *)((long)local_158 + 1);
              } while (local_158 != (__m256 *)local_128);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        local_104 = CONCAT31(local_104._1_3_,uVar7 == 1);
        local_128 = uVar81;
        if ((uVar99 != 1 || uVar7 != 1) || uVar6 != uVar8) goto LAB_00263d3e;
      }
      Mat::create(this_00,uVar100,uVar5,uVar6,sVar11,uVar101,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_138) {
          uVar82 = 0;
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          do {
            if (0 < iVar107) {
              sVar106 = pMVar9[1].cstep;
              auVar132 = *(undefined1 (*) [16])
                          ((long)pMVar9->data + pMVar9->cstep * uVar82 * pMVar9->elemsize);
              auVar131 = vrcpps_avx(auVar132);
              fVar395 = auVar131._0_4_;
              auVar324._0_4_ = auVar132._0_4_ * fVar395;
              fVar424 = auVar131._4_4_;
              auVar324._4_4_ = auVar132._4_4_ * fVar424;
              fVar425 = auVar131._8_4_;
              auVar324._8_4_ = auVar132._8_4_ * fVar425;
              fVar426 = auVar131._12_4_;
              auVar324._12_4_ = auVar132._12_4_ * fVar426;
              auVar132 = vsubps_avx(auVar167,auVar324);
              sVar11 = this_00->cstep;
              sVar13 = this_00->elemsize;
              pvVar12 = this_00->data;
              sVar14 = pMVar9[1].elemsize;
              pvVar91 = pMVar9[1].data;
              lVar95 = 0;
              iVar80 = iVar107;
              do {
                pfVar92 = (float *)((long)pvVar91 + lVar95 + sVar106 * sVar14 * uVar82);
                fVar427 = pfVar92[1];
                fVar15 = pfVar92[2];
                fVar16 = pfVar92[3];
                pfVar93 = (float *)((long)pvVar12 + lVar95 + sVar11 * sVar13 * uVar82);
                *pfVar93 = (fVar395 + fVar395 * auVar132._0_4_) * *pfVar92;
                pfVar93[1] = (fVar424 + fVar424 * auVar132._4_4_) * fVar427;
                pfVar93[2] = (fVar425 + fVar425 * auVar132._8_4_) * fVar15;
                pfVar93[3] = (fVar426 + fVar426 * auVar132._12_4_) * fVar16;
                lVar95 = lVar95 + 0x10;
                iVar80 = iVar80 + -1;
              } while (iVar80 != 0);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_138);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  iVar80 = BinaryOp::forward((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_avx + (long)p_Var10),
                             bottom_blobs,top_blobs,opt);
  return iVar80;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}